

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softmax_x86.cpp
# Opt level: O3

void ncnn::softmax(float *_ptr,int elemcount,int elempack,int stride,int size1,float *_maxptr,
                  float *_sumptr)

{
  uint *puVar1;
  int *piVar2;
  undefined4 uVar3;
  float fVar4;
  float fVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  ulong uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [64];
  byte bVar61;
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  byte bVar64;
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  float afVar75 [16];
  undefined1 (*pauVar76) [64];
  uint uVar77;
  ulong uVar78;
  int iVar79;
  undefined1 (*pauVar80) [64];
  uint uVar81;
  ulong uVar82;
  float *pfVar83;
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  long lVar84;
  undefined1 (*pauVar85) [64];
  long lVar86;
  ushort uVar87;
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar141 [64];
  undefined1 auVar142 [64];
  undefined1 auVar143 [64];
  undefined1 auVar144 [64];
  undefined1 auVar145 [64];
  undefined1 auVar146 [64];
  undefined1 auVar88 [16];
  undefined1 auVar104 [32];
  undefined1 auVar147 [64];
  undefined1 auVar148 [64];
  undefined1 auVar149 [64];
  undefined1 auVar150 [64];
  undefined1 auVar151 [64];
  undefined1 auVar152 [64];
  undefined1 auVar153 [64];
  undefined1 auVar154 [64];
  undefined1 auVar155 [64];
  undefined1 auVar156 [64];
  undefined1 auVar121 [32];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar157 [64];
  undefined1 auVar158 [64];
  undefined1 auVar159 [64];
  undefined1 auVar160 [64];
  undefined1 auVar161 [64];
  undefined1 auVar162 [64];
  undefined1 auVar163 [64];
  undefined1 auVar164 [64];
  undefined1 auVar165 [64];
  undefined1 auVar167 [64];
  undefined1 auVar168 [64];
  undefined1 auVar169 [64];
  undefined1 auVar170 [64];
  undefined1 auVar171 [64];
  undefined1 auVar172 [64];
  undefined1 auVar173 [64];
  undefined1 auVar174 [64];
  undefined1 auVar175 [64];
  undefined1 auVar176 [64];
  undefined1 auVar177 [64];
  undefined1 auVar178 [64];
  undefined1 auVar179 [64];
  undefined1 auVar180 [64];
  undefined1 auVar103 [16];
  undefined1 auVar181 [64];
  undefined1 auVar182 [64];
  undefined1 auVar183 [64];
  undefined1 auVar184 [64];
  undefined1 auVar185 [64];
  undefined1 auVar186 [64];
  undefined1 auVar187 [64];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar188 [64];
  undefined1 auVar189 [64];
  undefined1 auVar190 [64];
  undefined1 auVar191 [64];
  undefined1 auVar192 [64];
  undefined1 auVar194 [16];
  float fVar193;
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  undefined1 auVar214 [32];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  undefined1 auVar219 [32];
  undefined1 auVar220 [16];
  undefined1 auVar221 [32];
  undefined1 auVar222 [32];
  undefined1 auVar223 [32];
  undefined1 auVar224 [32];
  undefined1 auVar225 [32];
  undefined1 auVar226 [32];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [32];
  float afVar231 [16];
  float afVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar236 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar237 [32];
  undefined1 auVar238 [32];
  undefined1 auVar239 [32];
  undefined1 auVar240 [32];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [32];
  undefined1 auVar244 [32];
  float afVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [32];
  float afVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  float afVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [32];
  float afVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [32];
  undefined1 in_ZMM12 [64];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [32];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [32];
  undefined1 auVar267 [16];
  undefined1 auVar268 [32];
  undefined1 auVar269 [32];
  float afVar270 [16];
  float afVar271 [16];
  float afVar272 [16];
  undefined1 auVar273 [32];
  undefined1 auVar166 [64];
  undefined1 auVar125 [32];
  
  uVar77 = 0;
  pauVar76 = (undefined1 (*) [64])_maxptr;
  if (0xf < size1) {
    uVar77 = size1 & 0x7ffffff0;
    iVar79 = 0xf;
    auVar141 = vpbroadcastd_avx512f(ZEXT416(0xff7fffff));
    do {
      auVar142 = vmovdqu64_avx512f(auVar141);
      *pauVar76 = auVar142;
      pauVar76 = pauVar76 + 1;
      iVar79 = iVar79 + 0x10;
    } while (iVar79 < size1);
  }
  if ((int)(uVar77 | 7) < size1) {
    auVar104._8_4_ = 0xff7fffff;
    auVar104._0_8_ = 0xff7fffffff7fffff;
    auVar104._12_4_ = 0xff7fffff;
    auVar104._16_4_ = 0xff7fffff;
    auVar104._20_4_ = 0xff7fffff;
    auVar104._24_4_ = 0xff7fffff;
    auVar104._28_4_ = 0xff7fffff;
    uVar81 = uVar77;
    do {
      *(undefined1 (*) [32])*pauVar76 = auVar104;
      pauVar76 = (undefined1 (*) [64])(*pauVar76 + 0x20);
      uVar77 = uVar81 + 8;
      iVar79 = uVar81 + 0xf;
      uVar81 = uVar77;
    } while (iVar79 < size1);
  }
  if ((int)(uVar77 | 3) < size1) {
    auVar88._8_4_ = 0xff7fffff;
    auVar88._0_8_ = 0xff7fffffff7fffff;
    auVar88._12_4_ = 0xff7fffff;
    uVar81 = uVar77;
    do {
      *(undefined1 (*) [16])*pauVar76 = auVar88;
      pauVar76 = (undefined1 (*) [64])(*pauVar76 + 0x10);
      uVar77 = uVar81 + 4;
      iVar79 = uVar81 + 7;
      uVar81 = uVar77;
    } while (iVar79 < size1);
  }
  if ((int)uVar77 < size1) {
    auVar141 = vpbroadcastq_avx512f();
    uVar78 = 0;
    auVar142 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar143 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar144 = vbroadcastss_avx512f(ZEXT416(0xff7fffff));
    do {
      auVar145 = vpbroadcastq_avx512f();
      auVar146 = vporq_avx512f(auVar145,auVar142);
      auVar145 = vporq_avx512f(auVar145,auVar143);
      uVar21 = vpcmpuq_avx512f(auVar145,auVar141,2);
      uVar22 = vpcmpuq_avx512f(auVar146,auVar141,2);
      bVar61 = (byte)uVar22;
      uVar87 = CONCAT11(bVar61,(byte)uVar21);
      puVar1 = (uint *)(*pauVar76 + uVar78 * 4);
      bVar6 = (bool)((byte)uVar21 & 1);
      bVar7 = (bool)((byte)(uVar87 >> 1) & 1);
      bVar8 = (bool)((byte)(uVar87 >> 2) & 1);
      bVar9 = (bool)((byte)(uVar87 >> 3) & 1);
      bVar10 = (bool)((byte)(uVar87 >> 4) & 1);
      bVar11 = (bool)((byte)(uVar87 >> 5) & 1);
      bVar12 = (bool)((byte)(uVar87 >> 6) & 1);
      bVar13 = (bool)((byte)(uVar87 >> 7) & 1);
      bVar14 = (bool)(bVar61 >> 1 & 1);
      bVar15 = (bool)(bVar61 >> 2 & 1);
      bVar16 = (bool)(bVar61 >> 3 & 1);
      bVar17 = (bool)(bVar61 >> 4 & 1);
      bVar18 = (bool)(bVar61 >> 5 & 1);
      bVar19 = (bool)(bVar61 >> 6 & 1);
      *puVar1 = (uint)bVar6 * auVar144._0_4_ | (uint)!bVar6 * *puVar1;
      puVar1[1] = (uint)bVar7 * auVar144._4_4_ | (uint)!bVar7 * puVar1[1];
      puVar1[2] = (uint)bVar8 * auVar144._8_4_ | (uint)!bVar8 * puVar1[2];
      puVar1[3] = (uint)bVar9 * auVar144._12_4_ | (uint)!bVar9 * puVar1[3];
      puVar1[4] = (uint)bVar10 * auVar144._16_4_ | (uint)!bVar10 * puVar1[4];
      puVar1[5] = (uint)bVar11 * auVar144._20_4_ | (uint)!bVar11 * puVar1[5];
      puVar1[6] = (uint)bVar12 * auVar144._24_4_ | (uint)!bVar12 * puVar1[6];
      puVar1[7] = (uint)bVar13 * auVar144._28_4_ | (uint)!bVar13 * puVar1[7];
      puVar1[8] = (uint)(bVar61 & 1) * auVar144._32_4_ | (uint)!(bool)(bVar61 & 1) * puVar1[8];
      puVar1[9] = (uint)bVar14 * auVar144._36_4_ | (uint)!bVar14 * puVar1[9];
      puVar1[10] = (uint)bVar15 * auVar144._40_4_ | (uint)!bVar15 * puVar1[10];
      puVar1[0xb] = (uint)bVar16 * auVar144._44_4_ | (uint)!bVar16 * puVar1[0xb];
      puVar1[0xc] = (uint)bVar17 * auVar144._48_4_ | (uint)!bVar17 * puVar1[0xc];
      puVar1[0xd] = (uint)bVar18 * auVar144._52_4_ | (uint)!bVar18 * puVar1[0xd];
      puVar1[0xe] = (uint)bVar19 * auVar144._56_4_ | (uint)!bVar19 * puVar1[0xe];
      puVar1[0xf] = (uint)(bVar61 >> 7) * auVar144._60_4_ | (uint)!(bool)(bVar61 >> 7) * puVar1[0xf]
      ;
      uVar78 = uVar78 + 0x10;
    } while (((ulong)(~uVar77 + size1) + 0x10 & 0xfffffffffffffff0) != uVar78);
  }
  uVar77 = 0;
  pfVar83 = _sumptr;
  if (0xf < size1) {
    uVar78 = (ulong)(size1 - 0x10U >> 4);
    in_ZMM12 = ZEXT1664(in_ZMM12._0_16_);
    memset(_sumptr,0,uVar78 * 0x40 + 0x40);
    pfVar83 = _sumptr + uVar78 * 0x10 + 0x10;
    uVar77 = (size1 - 0x10U & 0xfffffff0) + 0x10;
  }
  if ((int)(uVar77 | 7) < size1) {
    uVar81 = (size1 - uVar77) - 8;
    uVar78 = (ulong)(uVar81 >> 3);
    in_ZMM12 = ZEXT1664(in_ZMM12._0_16_);
    memset(pfVar83,0,uVar78 * 0x20 + 0x20);
    pfVar83 = pfVar83 + uVar78 * 8 + 8;
    uVar77 = uVar77 + (uVar81 & 0xfffffff8) + 8;
  }
  if ((int)(uVar77 | 3) < size1) {
    iVar79 = uVar77 + 7;
    if ((int)(uVar77 + 7) < size1) {
      iVar79 = size1;
    }
    uVar81 = (iVar79 - uVar77) - 4;
    uVar78 = (ulong)(uVar81 >> 2);
    in_ZMM12 = ZEXT1664(in_ZMM12._0_16_);
    memset(pfVar83,0,uVar78 * 0x10 + 0x10);
    pfVar83 = pfVar83 + uVar78 * 4 + 4;
    uVar77 = uVar77 + (uVar81 & 0xfffffffc) + 4;
  }
  if ((int)uVar77 < size1) {
    in_ZMM12 = ZEXT1664(in_ZMM12._0_16_);
    memset(pfVar83,0,(ulong)(~uVar77 + size1) * 4 + 4);
  }
  auVar142 = _DAT_005ab700;
  auVar141 = _DAT_005ab540;
  if (elempack < 8) {
    if (elempack == 1) {
      if (0 < elemcount) {
        uVar78 = 0;
        do {
          pauVar76 = (undefined1 (*) [64])(_ptr + uVar78 * (long)stride);
          pauVar80 = (undefined1 (*) [64])_maxptr;
          if (size1 < 0x10) {
            uVar77 = 0;
          }
          else {
            iVar79 = 0xf;
            do {
              auVar141 = vmaxps_avx512f(*pauVar80,*pauVar76);
              *pauVar80 = auVar141;
              pauVar76 = pauVar76 + 1;
              pauVar80 = pauVar80 + 1;
              iVar79 = iVar79 + 0x10;
              uVar77 = size1 & 0xfffffff0U;
            } while (iVar79 < size1);
          }
          uVar81 = uVar77 | 7;
          while ((int)uVar81 < size1) {
            auVar104 = vmaxps_avx(*(undefined1 (*) [32])*pauVar80,*(undefined1 (*) [32])*pauVar76);
            *(undefined1 (*) [32])*pauVar80 = auVar104;
            pauVar76 = (undefined1 (*) [64])(*pauVar76 + 0x20);
            pauVar80 = (undefined1 (*) [64])(*pauVar80 + 0x20);
            uVar81 = uVar77 + 0xf;
            uVar77 = uVar77 + 8;
          }
          uVar81 = uVar77 | 3;
          while ((int)uVar81 < size1) {
            auVar88 = vmaxps_avx(*(undefined1 (*) [16])*pauVar80,*(undefined1 (*) [16])*pauVar76);
            *(undefined1 (*) [16])*pauVar80 = auVar88;
            pauVar76 = (undefined1 (*) [64])(*pauVar76 + 0x10);
            pauVar80 = (undefined1 (*) [64])(*pauVar80 + 0x10);
            uVar81 = uVar77 + 7;
            uVar77 = uVar77 + 4;
          }
          if ((int)uVar77 < size1) {
            lVar84 = 0;
            do {
              auVar88 = vmaxss_avx(ZEXT416(*(uint *)(*pauVar76 + lVar84 * 4)),
                                   ZEXT416(*(uint *)(*pauVar80 + lVar84 * 4)));
              *(int *)(*pauVar80 + lVar84 * 4) = auVar88._0_4_;
              lVar84 = lVar84 + 1;
            } while (size1 - uVar77 != (int)lVar84);
          }
          uVar78 = uVar78 + 1;
        } while (uVar78 != (uint)elemcount);
        auVar141 = vbroadcastss_avx512f(ZEXT416(0x80000000));
        auVar142 = vxorps_avx512dq(auVar141,(undefined1  [64])::_ps512_cephes_exp_C1);
        auVar141 = vxorps_avx512dq(auVar141,(undefined1  [64])::_ps512_cephes_exp_C2);
        auVar143 = vmovdqa64_avx512f((undefined1  [64])::_pi32_512_0x7f);
        uVar78 = 0;
        auVar105 = vbroadcastss_avx512vl(ZEXT416(0x42b0c0a5));
        auVar106 = vbroadcastss_avx512vl(ZEXT416(0xc2b0c0a5));
        auVar107 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
        auVar108 = vbroadcastss_avx512vl(ZEXT416(0x3fb8aa3b));
        auVar109 = vbroadcastss_avx512vl(ZEXT416(0xbf800000));
        auVar110 = vbroadcastss_avx512vl(ZEXT416(0x3f318000));
        auVar111 = vbroadcastss_avx512vl(ZEXT416(0x395e8083));
        auVar112 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
        auVar113 = vbroadcastss_avx512vl(ZEXT416(0x3ab743ce));
        auVar114 = vbroadcastss_avx512vl(ZEXT416(0x3c088908));
        auVar116 = vbroadcastss_avx512vl(ZEXT416(0x3d2aa9c1));
        auVar104 = vbroadcastss_avx512vl(ZEXT416(0x3e2aaaaa));
        auVar118 = vpbroadcastd_avx512vl(ZEXT416(0x3f800000));
        auVar89 = vbroadcastss_avx512vl(ZEXT416(0x42b0c0a5));
        auVar88 = vbroadcastss_avx512vl(ZEXT416(0xc2b0c0a5));
        do {
          afVar257 = ::_ps512_cephes_exp_p5;
          afVar252 = ::_ps512_cephes_exp_p4;
          afVar249 = ::_ps512_cephes_exp_p3;
          afVar245 = ::_ps512_cephes_exp_p2;
          afVar231 = ::_ps512_cephes_exp_p1;
          afVar272 = ::_ps512_cephes_exp_p0;
          afVar232 = ::_ps512_cephes_LOG2EF;
          afVar270 = ::_ps512_exp_lo;
          afVar271 = ::_ps512_exp_hi;
          afVar75 = ::_ps512_1;
          pauVar76 = (undefined1 (*) [64])(_ptr + uVar78 * (long)stride);
          pauVar80 = (undefined1 (*) [64])_maxptr;
          pauVar85 = (undefined1 (*) [64])_sumptr;
          if (size1 < 0x10) {
            uVar77 = 0;
          }
          else {
            iVar79 = 0xf;
            do {
              auVar144 = vsubps_avx512f(*pauVar76,*pauVar80);
              auVar144 = vminps_avx512f(auVar144,(undefined1  [64])afVar271);
              auVar144 = vmaxps_avx512f(auVar144,(undefined1  [64])afVar270);
              auVar145 = vfmadd213ps_avx512f((undefined1  [64])afVar232,auVar144,
                                             (undefined1  [64])afVar257);
              auVar146 = vrndscaleps_avx512f(auVar145,1);
              uVar82 = vcmpps_avx512f(auVar145,auVar146,1);
              auVar145 = vsubps_avx512f(auVar146,(undefined1  [64])afVar75);
              bVar6 = (bool)((byte)uVar82 & 1);
              auVar180._0_4_ = (uint)bVar6 * auVar145._0_4_ | (uint)!bVar6 * auVar146._0_4_;
              bVar6 = (bool)((byte)(uVar82 >> 1) & 1);
              auVar180._4_4_ = (uint)bVar6 * auVar145._4_4_ | (uint)!bVar6 * auVar146._4_4_;
              bVar6 = (bool)((byte)(uVar82 >> 2) & 1);
              auVar180._8_4_ = (uint)bVar6 * auVar145._8_4_ | (uint)!bVar6 * auVar146._8_4_;
              bVar6 = (bool)((byte)(uVar82 >> 3) & 1);
              auVar180._12_4_ = (uint)bVar6 * auVar145._12_4_ | (uint)!bVar6 * auVar146._12_4_;
              bVar6 = (bool)((byte)(uVar82 >> 4) & 1);
              auVar180._16_4_ = (uint)bVar6 * auVar145._16_4_ | (uint)!bVar6 * auVar146._16_4_;
              bVar6 = (bool)((byte)(uVar82 >> 5) & 1);
              auVar180._20_4_ = (uint)bVar6 * auVar145._20_4_ | (uint)!bVar6 * auVar146._20_4_;
              bVar6 = (bool)((byte)(uVar82 >> 6) & 1);
              auVar180._24_4_ = (uint)bVar6 * auVar145._24_4_ | (uint)!bVar6 * auVar146._24_4_;
              bVar6 = (bool)((byte)(uVar82 >> 7) & 1);
              auVar180._28_4_ = (uint)bVar6 * auVar145._28_4_ | (uint)!bVar6 * auVar146._28_4_;
              bVar6 = (bool)((byte)(uVar82 >> 8) & 1);
              auVar180._32_4_ = (uint)bVar6 * auVar145._32_4_ | (uint)!bVar6 * auVar146._32_4_;
              bVar6 = (bool)((byte)(uVar82 >> 9) & 1);
              auVar180._36_4_ = (uint)bVar6 * auVar145._36_4_ | (uint)!bVar6 * auVar146._36_4_;
              bVar6 = (bool)((byte)(uVar82 >> 10) & 1);
              auVar180._40_4_ = (uint)bVar6 * auVar145._40_4_ | (uint)!bVar6 * auVar146._40_4_;
              bVar6 = (bool)((byte)(uVar82 >> 0xb) & 1);
              auVar180._44_4_ = (uint)bVar6 * auVar145._44_4_ | (uint)!bVar6 * auVar146._44_4_;
              bVar6 = (bool)((byte)(uVar82 >> 0xc) & 1);
              auVar180._48_4_ = (uint)bVar6 * auVar145._48_4_ | (uint)!bVar6 * auVar146._48_4_;
              bVar6 = (bool)((byte)(uVar82 >> 0xd) & 1);
              auVar180._52_4_ = (uint)bVar6 * auVar145._52_4_ | (uint)!bVar6 * auVar146._52_4_;
              bVar6 = (bool)((byte)(uVar82 >> 0xe) & 1);
              auVar180._56_4_ = (uint)bVar6 * auVar145._56_4_ | (uint)!bVar6 * auVar146._56_4_;
              bVar6 = SUB81(uVar82 >> 0xf,0);
              auVar180._60_4_ = (uint)bVar6 * auVar145._60_4_ | (uint)!bVar6 * auVar146._60_4_;
              auVar144 = vfmadd231ps_avx512f(auVar144,auVar180,auVar142);
              auVar144 = vfmadd231ps_avx512f(auVar144,auVar180,auVar141);
              auVar145 = vmulps_avx512f(auVar144,auVar144);
              auVar146 = vfmadd213ps_avx512f(auVar144,(undefined1  [64])afVar272,
                                             (undefined1  [64])afVar231);
              auVar146 = vfmadd213ps_avx512f(auVar146,auVar144,(undefined1  [64])afVar245);
              auVar146 = vfmadd213ps_avx512f(auVar146,auVar144,(undefined1  [64])afVar249);
              auVar146 = vfmadd213ps_avx512f(auVar146,auVar144,(undefined1  [64])afVar252);
              auVar146 = vfmadd213ps_avx512f(auVar146,auVar144,(undefined1  [64])afVar257);
              auVar144 = vfmadd213ps_avx512f(auVar146,auVar145,auVar144);
              auVar144 = vaddps_avx512f(auVar144,(undefined1  [64])afVar75);
              auVar145 = vcvttps2dq_avx512f(auVar180);
              auVar145 = vpaddd_avx512f(auVar145,auVar143);
              auVar145 = vpslld_avx512f(auVar145,0x17);
              auVar144 = vmulps_avx512f(auVar144,auVar145);
              auVar145 = vaddps_avx512f(auVar144,*pauVar85);
              *pauVar76 = auVar144;
              *pauVar85 = auVar145;
              pauVar76 = pauVar76 + 1;
              pauVar80 = pauVar80 + 1;
              pauVar85 = pauVar85 + 1;
              iVar79 = iVar79 + 0x10;
              uVar77 = size1 & 0xfffffff0U;
            } while (iVar79 < size1);
          }
          auVar97._8_4_ = 0x3f000000;
          auVar97._0_8_ = 0x3f0000003f000000;
          auVar97._12_4_ = 0x3f000000;
          auVar99._8_4_ = 0x3fb8aa3b;
          auVar99._0_8_ = 0x3fb8aa3b3fb8aa3b;
          auVar99._12_4_ = 0x3fb8aa3b;
          auVar101._8_4_ = 0xbf800000;
          auVar101._0_8_ = 0xbf800000bf800000;
          auVar101._12_4_ = 0xbf800000;
          auVar235._8_4_ = 0x3f318000;
          auVar235._0_8_ = 0x3f3180003f318000;
          auVar235._12_4_ = 0x3f318000;
          auVar251._8_4_ = 0x3ab743ce;
          auVar251._0_8_ = 0x3ab743ce3ab743ce;
          auVar251._12_4_ = 0x3ab743ce;
          auVar255._8_4_ = 0x3c088908;
          auVar255._0_8_ = 0x3c0889083c088908;
          auVar255._12_4_ = 0x3c088908;
          auVar259._8_4_ = 0x3d2aa9c1;
          auVar259._0_8_ = 0x3d2aa9c13d2aa9c1;
          auVar259._12_4_ = 0x3d2aa9c1;
          auVar262._8_4_ = 0x3e2aaaaa;
          auVar262._0_8_ = 0x3e2aaaaa3e2aaaaa;
          auVar262._12_4_ = 0x3e2aaaaa;
          auVar265._8_4_ = 0x3f800000;
          auVar265._0_8_ = 0x3f8000003f800000;
          auVar265._12_4_ = 0x3f800000;
          uVar81 = uVar77 | 7;
          while ((int)uVar81 < size1) {
            auVar120 = vsubps_avx(*(undefined1 (*) [32])*pauVar76,*(undefined1 (*) [32])*pauVar80);
            auVar120 = vminps_avx512vl(auVar120,auVar105);
            auVar122 = vmaxps_avx512vl(auVar120,auVar106);
            auVar123 = vfmadd231ps_avx512vl(auVar107,auVar122,auVar108);
            auVar120 = vroundps_avx(auVar123,1);
            uVar82 = vcmpps_avx512vl(auVar123,auVar120,1);
            auVar124 = vaddps_avx512vl(auVar120,auVar109);
            bVar6 = (bool)((byte)uVar82 & 1);
            auVar125._0_4_ = (float)((uint)bVar6 * auVar124._0_4_ | (uint)!bVar6 * auVar120._0_4_);
            bVar6 = (bool)((byte)(uVar82 >> 1) & 1);
            auVar125._4_4_ = (float)((uint)bVar6 * auVar124._4_4_ | (uint)!bVar6 * auVar120._4_4_);
            bVar6 = (bool)((byte)(uVar82 >> 2) & 1);
            auVar125._8_4_ = (float)((uint)bVar6 * auVar124._8_4_ | (uint)!bVar6 * auVar120._8_4_);
            bVar6 = (bool)((byte)(uVar82 >> 3) & 1);
            auVar125._12_4_ =
                 (float)((uint)bVar6 * auVar124._12_4_ | (uint)!bVar6 * auVar120._12_4_);
            bVar6 = (bool)((byte)(uVar82 >> 4) & 1);
            auVar125._16_4_ =
                 (float)((uint)bVar6 * auVar124._16_4_ | (uint)!bVar6 * auVar120._16_4_);
            bVar6 = (bool)((byte)(uVar82 >> 5) & 1);
            auVar125._20_4_ =
                 (float)((uint)bVar6 * auVar124._20_4_ | (uint)!bVar6 * auVar120._20_4_);
            bVar6 = (bool)((byte)(uVar82 >> 6) & 1);
            auVar125._24_4_ =
                 (float)((uint)bVar6 * auVar124._24_4_ | (uint)!bVar6 * auVar120._24_4_);
            bVar6 = SUB81(uVar82 >> 7,0);
            auVar125._28_4_ =
                 (float)((uint)bVar6 * auVar124._28_4_ | (uint)!bVar6 * auVar120._28_4_);
            auVar120 = vfmsub231ps_avx512vl(auVar122,auVar125,auVar110);
            auVar120 = vfmsub231ps_avx512vl(auVar120,auVar125,auVar111);
            auVar62._4_4_ = auVar120._4_4_ * auVar120._4_4_;
            auVar62._0_4_ = auVar120._0_4_ * auVar120._0_4_;
            auVar62._8_4_ = auVar120._8_4_ * auVar120._8_4_;
            auVar62._12_4_ = auVar120._12_4_ * auVar120._12_4_;
            auVar62._16_4_ = auVar120._16_4_ * auVar120._16_4_;
            auVar62._20_4_ = auVar120._20_4_ * auVar120._20_4_;
            auVar62._24_4_ = auVar120._24_4_ * auVar120._24_4_;
            auVar62._28_4_ = auVar123._28_4_;
            auVar122 = vfmadd213ps_avx512vl(auVar112,auVar120,auVar113);
            auVar122 = vfmadd213ps_avx512vl(auVar122,auVar120,auVar114);
            auVar122 = vfmadd213ps_avx512vl(auVar122,auVar120,auVar116);
            auVar122 = vfmadd213ps_avx512vl(auVar122,auVar120,auVar104);
            auVar122 = vfmadd213ps_avx512vl(auVar122,auVar120,auVar107);
            auVar90 = vfmadd213ps_fma(auVar122,auVar62,auVar120);
            auVar200._0_4_ = (int)auVar125._0_4_;
            auVar200._4_4_ = (int)auVar125._4_4_;
            auVar200._8_4_ = (int)auVar125._8_4_;
            auVar200._12_4_ = (int)auVar125._12_4_;
            auVar200._16_4_ = (int)auVar125._16_4_;
            auVar200._20_4_ = (int)auVar125._20_4_;
            auVar200._24_4_ = (int)auVar125._24_4_;
            auVar200._28_4_ = (int)auVar125._28_4_;
            auVar120 = vpslld_avx2(auVar200,0x17);
            auVar120 = vpaddd_avx512vl(auVar120,auVar118);
            auVar90 = vfmadd213ps_fma(auVar120,ZEXT1632(auVar90),auVar120);
            auVar210._0_4_ = auVar90._0_4_ + *(float *)*pauVar85;
            auVar210._4_4_ = auVar90._4_4_ + *(float *)(*pauVar85 + 4);
            auVar210._8_4_ = auVar90._8_4_ + *(float *)(*pauVar85 + 8);
            auVar210._12_4_ = auVar90._12_4_ + *(float *)(*pauVar85 + 0xc);
            auVar210._16_4_ = *(float *)(*pauVar85 + 0x10) + 0.0;
            auVar210._20_4_ = *(float *)(*pauVar85 + 0x14) + 0.0;
            auVar210._24_4_ = *(float *)(*pauVar85 + 0x18) + 0.0;
            auVar210._28_4_ = *(float *)(*pauVar85 + 0x1c) + 0.0;
            *(undefined1 (*) [32])*pauVar76 = ZEXT1632(auVar90);
            *(undefined1 (*) [32])*pauVar85 = auVar210;
            pauVar76 = (undefined1 (*) [64])(*pauVar76 + 0x20);
            pauVar80 = (undefined1 (*) [64])(*pauVar80 + 0x20);
            pauVar85 = (undefined1 (*) [64])(*pauVar85 + 0x20);
            uVar81 = uVar77 + 0xf;
            uVar77 = uVar77 + 8;
          }
          auVar242._8_4_ = 0x395e8083;
          auVar242._0_8_ = 0x395e8083395e8083;
          auVar242._12_4_ = 0x395e8083;
          auVar247._8_4_ = 0x39506967;
          auVar247._0_8_ = 0x3950696739506967;
          auVar247._12_4_ = 0x39506967;
          uVar81 = uVar77 | 3;
          while ((int)uVar81 < size1) {
            auVar90 = vsubps_avx(*(undefined1 (*) [16])*pauVar76,*(undefined1 (*) [16])*pauVar80);
            auVar90 = vminps_avx512vl(auVar90,auVar89);
            auVar92 = vmaxps_avx512vl(auVar90,auVar88);
            auVar91 = vfmadd231ps_fma(auVar97,auVar92,auVar99);
            auVar216._0_4_ = (int)auVar91._0_4_;
            auVar216._4_4_ = (int)auVar91._4_4_;
            auVar216._8_4_ = (int)auVar91._8_4_;
            auVar216._12_4_ = (int)auVar91._12_4_;
            auVar90 = vcvtdq2ps_avx(auVar216);
            uVar82 = vcmpps_avx512vl(auVar91,auVar90,1);
            auVar91 = vaddps_avx512vl(auVar90,auVar101);
            bVar6 = (bool)((byte)uVar82 & 1);
            auVar103._0_4_ = (float)((uint)bVar6 * auVar91._0_4_ | (uint)!bVar6 * auVar90._0_4_);
            bVar6 = (bool)((byte)(uVar82 >> 1) & 1);
            auVar103._4_4_ = (float)((uint)bVar6 * auVar91._4_4_ | (uint)!bVar6 * auVar90._4_4_);
            bVar6 = (bool)((byte)(uVar82 >> 2) & 1);
            auVar103._8_4_ = (float)((uint)bVar6 * auVar91._8_4_ | (uint)!bVar6 * auVar90._8_4_);
            bVar6 = (bool)((byte)(uVar82 >> 3) & 1);
            auVar103._12_4_ = (float)((uint)bVar6 * auVar91._12_4_ | (uint)!bVar6 * auVar90._12_4_);
            auVar90 = vfmsub231ps_fma(auVar92,auVar103,auVar235);
            auVar91 = vfmsub231ps_fma(auVar90,auVar103,auVar242);
            auVar208._0_4_ = auVar91._0_4_ * auVar91._0_4_;
            auVar208._4_4_ = auVar91._4_4_ * auVar91._4_4_;
            auVar208._8_4_ = auVar91._8_4_ * auVar91._8_4_;
            auVar208._12_4_ = auVar91._12_4_ * auVar91._12_4_;
            auVar90 = vfmadd213ps_fma(auVar247,auVar91,auVar251);
            auVar90 = vfmadd213ps_fma(auVar90,auVar91,auVar255);
            auVar90 = vfmadd213ps_fma(auVar90,auVar91,auVar259);
            auVar90 = vfmadd213ps_fma(auVar90,auVar91,auVar262);
            auVar90 = vfmadd213ps_fma(auVar90,auVar91,auVar97);
            auVar91 = vfmadd213ps_fma(auVar90,auVar208,auVar91);
            auVar194._0_4_ = (int)auVar103._0_4_;
            auVar194._4_4_ = (int)auVar103._4_4_;
            auVar194._8_4_ = (int)auVar103._8_4_;
            auVar194._12_4_ = (int)auVar103._12_4_;
            auVar90 = vpslld_avx(auVar194,0x17);
            auVar90 = vpaddd_avx(auVar265,auVar90);
            auVar90 = vfmadd213ps_fma(auVar90,auVar91,auVar90);
            auVar209._0_4_ = auVar90._0_4_ + *(float *)*pauVar85;
            auVar209._4_4_ = auVar90._4_4_ + *(float *)(*pauVar85 + 4);
            auVar209._8_4_ = auVar90._8_4_ + *(float *)(*pauVar85 + 8);
            auVar209._12_4_ = auVar90._12_4_ + *(float *)(*pauVar85 + 0xc);
            *(undefined1 (*) [16])*pauVar76 = auVar90;
            *(undefined1 (*) [16])*pauVar85 = auVar209;
            pauVar76 = (undefined1 (*) [64])(*pauVar76 + 0x10);
            pauVar80 = (undefined1 (*) [64])(*pauVar80 + 0x10);
            pauVar85 = (undefined1 (*) [64])(*pauVar85 + 0x10);
            uVar81 = uVar77 + 7;
            uVar77 = uVar77 + 4;
          }
          if ((int)uVar77 < size1) {
            lVar84 = 0;
            do {
              fVar193 = expf(*(float *)(*pauVar76 + lVar84 * 4) - *(float *)(*pauVar80 + lVar84 * 4)
                            );
              *(float *)(*pauVar76 + lVar84 * 4) = fVar193;
              *(float *)(*pauVar85 + lVar84 * 4) = fVar193 + *(float *)(*pauVar85 + lVar84 * 4);
              lVar84 = lVar84 + 1;
            } while (size1 - uVar77 != (int)lVar84);
          }
          uVar78 = uVar78 + 1;
          auVar143 = vmovdqa64_avx512f((undefined1  [64])::_pi32_512_0x7f);
          auVar105 = vbroadcastss_avx512vl(ZEXT416(0x42b0c0a5));
          auVar106 = vbroadcastss_avx512vl(ZEXT416(0xc2b0c0a5));
          auVar107 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
          auVar108 = vbroadcastss_avx512vl(ZEXT416(0x3fb8aa3b));
          auVar109 = vbroadcastss_avx512vl(ZEXT416(0xbf800000));
          auVar110 = vbroadcastss_avx512vl(ZEXT416(0x3f318000));
          auVar111 = vbroadcastss_avx512vl(ZEXT416(0x395e8083));
          auVar112 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
          auVar113 = vbroadcastss_avx512vl(ZEXT416(0x3ab743ce));
          auVar114 = vbroadcastss_avx512vl(ZEXT416(0x3c088908));
          auVar116 = vbroadcastss_avx512vl(ZEXT416(0x3d2aa9c1));
          auVar104 = vbroadcastss_avx512vl(ZEXT416(0x3e2aaaaa));
          auVar118 = vpbroadcastd_avx512vl(ZEXT416(0x3f800000));
          auVar89 = vbroadcastss_avx512vl(ZEXT416(0x42b0c0a5));
          auVar88 = vbroadcastss_avx512vl(ZEXT416(0xc2b0c0a5));
        } while (uVar78 != (uint)elemcount);
      }
      uVar77 = 0;
      pauVar76 = (undefined1 (*) [64])_sumptr;
      if (0xf < size1) {
        iVar79 = 0xf;
        auVar141 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
        do {
          auVar142 = vdivps_avx512f(auVar141,*pauVar76);
          *pauVar76 = auVar142;
          pauVar76 = pauVar76 + 1;
          iVar79 = iVar79 + 0x10;
        } while (iVar79 < size1);
        uVar77 = size1 & 0x7ffffff0;
      }
      if ((int)(uVar77 | 7) < size1) {
        auVar201._8_4_ = 0x3f800000;
        auVar201._0_8_ = 0x3f8000003f800000;
        auVar201._12_4_ = 0x3f800000;
        auVar201._16_4_ = 0x3f800000;
        auVar201._20_4_ = 0x3f800000;
        auVar201._24_4_ = 0x3f800000;
        auVar201._28_4_ = 0x3f800000;
        uVar81 = uVar77;
        do {
          auVar104 = vdivps_avx(auVar201,*(undefined1 (*) [32])*pauVar76);
          *(undefined1 (*) [32])*pauVar76 = auVar104;
          pauVar76 = (undefined1 (*) [64])(*pauVar76 + 0x20);
          uVar77 = uVar81 + 8;
          iVar79 = uVar81 + 0xf;
          uVar81 = uVar77;
        } while (iVar79 < size1);
      }
      if ((int)(uVar77 | 3) < size1) {
        auVar196._8_4_ = 0x3f800000;
        auVar196._0_8_ = 0x3f8000003f800000;
        auVar196._12_4_ = 0x3f800000;
        uVar81 = uVar77;
        do {
          auVar88 = vdivps_avx(auVar196,*(undefined1 (*) [16])*pauVar76);
          *(undefined1 (*) [16])*pauVar76 = auVar88;
          pauVar76 = (undefined1 (*) [64])(*pauVar76 + 0x10);
          uVar77 = uVar81 + 4;
          iVar79 = uVar81 + 7;
          uVar81 = uVar77;
        } while (iVar79 < size1);
      }
      if ((int)uVar77 < size1) {
        auVar141 = vpbroadcastq_avx512f();
        uVar78 = 0;
        auVar142 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
        auVar143 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
        auVar144 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
        do {
          auVar145 = vpbroadcastq_avx512f();
          auVar146 = vporq_avx512f(auVar145,auVar142);
          auVar145 = vporq_avx512f(auVar145,auVar143);
          uVar21 = vpcmpuq_avx512f(auVar145,auVar141,2);
          bVar61 = (byte)uVar21;
          uVar21 = vpcmpuq_avx512f(auVar146,auVar141,2);
          bVar64 = (byte)uVar21;
          uVar87 = CONCAT11(bVar64,bVar61);
          piVar2 = (int *)(*pauVar76 + uVar78 * 4);
          auVar192._4_4_ = (uint)((byte)(uVar87 >> 1) & 1) * piVar2[1];
          auVar192._0_4_ = (uint)(bVar61 & 1) * *piVar2;
          auVar192._8_4_ = (uint)((byte)(uVar87 >> 2) & 1) * piVar2[2];
          auVar192._12_4_ = (uint)((byte)(uVar87 >> 3) & 1) * piVar2[3];
          auVar192._16_4_ = (uint)((byte)(uVar87 >> 4) & 1) * piVar2[4];
          auVar192._20_4_ = (uint)((byte)(uVar87 >> 5) & 1) * piVar2[5];
          auVar192._24_4_ = (uint)((byte)(uVar87 >> 6) & 1) * piVar2[6];
          auVar192._28_4_ = (uint)((byte)(uVar87 >> 7) & 1) * piVar2[7];
          auVar192._32_4_ = (uint)(bVar64 & 1) * piVar2[8];
          auVar192._36_4_ = (uint)(bVar64 >> 1 & 1) * piVar2[9];
          auVar192._40_4_ = (uint)(bVar64 >> 2 & 1) * piVar2[10];
          auVar192._44_4_ = (uint)(bVar64 >> 3 & 1) * piVar2[0xb];
          auVar192._48_4_ = (uint)(bVar64 >> 4 & 1) * piVar2[0xc];
          auVar192._52_4_ = (uint)(bVar64 >> 5 & 1) * piVar2[0xd];
          auVar192._56_4_ = (uint)(bVar64 >> 6 & 1) * piVar2[0xe];
          auVar192._60_4_ = (uint)(bVar64 >> 7) * piVar2[0xf];
          auVar145 = vdivps_avx512f(auVar144,auVar192);
          puVar1 = (uint *)(*pauVar76 + uVar78 * 4);
          bVar6 = (bool)((byte)(uVar87 >> 1) & 1);
          bVar7 = (bool)((byte)(uVar87 >> 2) & 1);
          bVar8 = (bool)((byte)(uVar87 >> 3) & 1);
          bVar9 = (bool)((byte)(uVar87 >> 4) & 1);
          bVar10 = (bool)((byte)(uVar87 >> 5) & 1);
          bVar11 = (bool)((byte)(uVar87 >> 6) & 1);
          bVar12 = (bool)((byte)(uVar87 >> 7) & 1);
          bVar13 = (bool)(bVar64 >> 1 & 1);
          bVar14 = (bool)(bVar64 >> 2 & 1);
          bVar15 = (bool)(bVar64 >> 3 & 1);
          bVar16 = (bool)(bVar64 >> 4 & 1);
          bVar17 = (bool)(bVar64 >> 5 & 1);
          bVar18 = (bool)(bVar64 >> 6 & 1);
          *puVar1 = (uint)(bVar61 & 1) * auVar145._0_4_ | (uint)!(bool)(bVar61 & 1) * *puVar1;
          puVar1[1] = (uint)bVar6 * auVar145._4_4_ | (uint)!bVar6 * puVar1[1];
          puVar1[2] = (uint)bVar7 * auVar145._8_4_ | (uint)!bVar7 * puVar1[2];
          puVar1[3] = (uint)bVar8 * auVar145._12_4_ | (uint)!bVar8 * puVar1[3];
          puVar1[4] = (uint)bVar9 * auVar145._16_4_ | (uint)!bVar9 * puVar1[4];
          puVar1[5] = (uint)bVar10 * auVar145._20_4_ | (uint)!bVar10 * puVar1[5];
          puVar1[6] = (uint)bVar11 * auVar145._24_4_ | (uint)!bVar11 * puVar1[6];
          puVar1[7] = (uint)bVar12 * auVar145._28_4_ | (uint)!bVar12 * puVar1[7];
          puVar1[8] = (uint)(bVar64 & 1) * auVar145._32_4_ | (uint)!(bool)(bVar64 & 1) * puVar1[8];
          puVar1[9] = (uint)bVar13 * auVar145._36_4_ | (uint)!bVar13 * puVar1[9];
          puVar1[10] = (uint)bVar14 * auVar145._40_4_ | (uint)!bVar14 * puVar1[10];
          puVar1[0xb] = (uint)bVar15 * auVar145._44_4_ | (uint)!bVar15 * puVar1[0xb];
          puVar1[0xc] = (uint)bVar16 * auVar145._48_4_ | (uint)!bVar16 * puVar1[0xc];
          puVar1[0xd] = (uint)bVar17 * auVar145._52_4_ | (uint)!bVar17 * puVar1[0xd];
          puVar1[0xe] = (uint)bVar18 * auVar145._56_4_ | (uint)!bVar18 * puVar1[0xe];
          puVar1[0xf] = (uint)(bVar64 >> 7) * auVar145._60_4_ |
                        (uint)!(bool)(bVar64 >> 7) * puVar1[0xf];
          uVar78 = uVar78 + 0x10;
        } while (((ulong)(~uVar77 + size1) + 0x10 & 0xfffffffffffffff0) != uVar78);
      }
      if (0 < elemcount) {
        uVar78 = 0;
        do {
          pauVar76 = (undefined1 (*) [64])(_ptr + uVar78 * (long)stride);
          pauVar80 = (undefined1 (*) [64])_sumptr;
          if (size1 < 0x10) {
            uVar77 = 0;
          }
          else {
            iVar79 = 0xf;
            do {
              auVar141 = vmulps_avx512f(*pauVar80,*pauVar76);
              *pauVar76 = auVar141;
              pauVar76 = pauVar76 + 1;
              pauVar80 = pauVar80 + 1;
              iVar79 = iVar79 + 0x10;
              uVar77 = size1 & 0xfffffff0;
            } while (iVar79 < size1);
          }
          uVar81 = uVar77 | 7;
          while ((int)uVar81 < size1) {
            auVar69._4_4_ = *(float *)(*pauVar80 + 4) * *(float *)(*pauVar76 + 4);
            auVar69._0_4_ = *(float *)*pauVar80 * *(float *)*pauVar76;
            auVar69._8_4_ = *(float *)(*pauVar80 + 8) * *(float *)(*pauVar76 + 8);
            auVar69._12_4_ = *(float *)(*pauVar80 + 0xc) * *(float *)(*pauVar76 + 0xc);
            auVar69._16_4_ = *(float *)(*pauVar80 + 0x10) * *(float *)(*pauVar76 + 0x10);
            auVar69._20_4_ = *(float *)(*pauVar80 + 0x14) * *(float *)(*pauVar76 + 0x14);
            auVar69._24_4_ = *(float *)(*pauVar80 + 0x18) * *(float *)(*pauVar76 + 0x18);
            auVar69._28_4_ = *(undefined4 *)(*pauVar80 + 0x1c);
            *(undefined1 (*) [32])*pauVar76 = auVar69;
            pauVar76 = (undefined1 (*) [64])(*pauVar76 + 0x20);
            pauVar80 = (undefined1 (*) [64])(*pauVar80 + 0x20);
            uVar81 = uVar77 + 0xf;
            uVar77 = uVar77 + 8;
          }
          uVar81 = uVar77 | 3;
          while ((int)uVar81 < size1) {
            auVar197._0_4_ = *(float *)*pauVar80 * *(float *)*pauVar76;
            auVar197._4_4_ = *(float *)(*pauVar80 + 4) * *(float *)(*pauVar76 + 4);
            auVar197._8_4_ = *(float *)(*pauVar80 + 8) * *(float *)(*pauVar76 + 8);
            auVar197._12_4_ = *(float *)(*pauVar80 + 0xc) * *(float *)(*pauVar76 + 0xc);
            *(undefined1 (*) [16])*pauVar76 = auVar197;
            pauVar76 = (undefined1 (*) [64])(*pauVar76 + 0x10);
            pauVar80 = (undefined1 (*) [64])(*pauVar80 + 0x10);
            uVar81 = uVar77 + 7;
            uVar77 = uVar77 + 4;
          }
          if ((int)uVar77 < size1) {
            lVar84 = 0;
            do {
              *(float *)(*pauVar76 + lVar84 * 4) =
                   *(float *)(*pauVar76 + lVar84 * 4) * *(float *)(*pauVar80 + lVar84 * 4);
              lVar84 = lVar84 + 1;
            } while (size1 - uVar77 != (int)lVar84);
          }
          uVar78 = uVar78 + 1;
        } while (uVar78 != (uint)elemcount);
      }
    }
    else if (elempack == 4) {
      if (0 < elemcount) {
        uVar78 = 0;
        do {
          pauVar76 = (undefined1 (*) [64])(_ptr + uVar78 * (long)stride);
          pauVar80 = (undefined1 (*) [64])_maxptr;
          if (size1 < 0x10) {
            uVar77 = 0;
          }
          else {
            iVar79 = 0xf;
            do {
              auVar142 = vunpcklps_avx512f(*pauVar76,pauVar76[1]);
              auVar143 = vunpckhps_avx512f(*pauVar76,pauVar76[1]);
              auVar142 = vmaxps_avx512f(auVar142,auVar143);
              auVar143 = vunpcklps_avx512f(pauVar76[2],pauVar76[3]);
              auVar144 = vunpckhps_avx512f(pauVar76[2],pauVar76[3]);
              auVar143 = vmaxps_avx512f(auVar143,auVar144);
              auVar144 = vunpcklps_avx512f(auVar142,auVar143);
              auVar142 = vunpckhps_avx512f(auVar142,auVar143);
              auVar142 = vmaxps_avx512f(auVar144,auVar142);
              auVar142 = vpermps_avx512f(auVar141,auVar142);
              auVar142 = vmaxps_avx512f(auVar142,*pauVar80);
              *pauVar80 = auVar142;
              pauVar76 = pauVar76 + 4;
              pauVar80 = pauVar80 + 1;
              iVar79 = iVar79 + 0x10;
              uVar77 = size1 & 0xfffffff0U;
            } while (iVar79 < size1);
          }
          uVar81 = uVar77 | 7;
          while ((int)uVar81 < size1) {
            auVar105 = vunpcklps_avx(*(undefined1 (*) [32])*pauVar76,
                                     *(undefined1 (*) [32])(*pauVar76 + 0x20));
            auVar104 = vunpckhps_avx(*(undefined1 (*) [32])*pauVar76,
                                     *(undefined1 (*) [32])(*pauVar76 + 0x20));
            auVar104 = vmaxps_avx(auVar105,auVar104);
            auVar106 = vunpcklps_avx(*(undefined1 (*) [32])pauVar76[1],
                                     *(undefined1 (*) [32])(pauVar76[1] + 0x20));
            auVar105 = vunpckhps_avx(*(undefined1 (*) [32])pauVar76[1],
                                     *(undefined1 (*) [32])(pauVar76[1] + 0x20));
            auVar105 = vmaxps_avx(auVar106,auVar105);
            auVar221._16_16_ = auVar105._0_16_;
            auVar221._0_16_ = auVar104._0_16_;
            auVar104 = vperm2f128_avx(auVar104,auVar105,0x31);
            auVar105 = vunpcklps_avx(auVar221,auVar104);
            auVar104 = vunpckhps_avx(auVar221,auVar104);
            auVar104 = vmaxps_avx(auVar105,auVar104);
            auVar104 = vmaxps_avx(auVar104,*(undefined1 (*) [32])*pauVar80);
            *(undefined1 (*) [32])*pauVar80 = auVar104;
            pauVar76 = pauVar76 + 2;
            pauVar80 = (undefined1 (*) [64])(*pauVar80 + 0x20);
            uVar81 = uVar77 + 0xf;
            uVar77 = uVar77 + 8;
          }
          uVar81 = uVar77 | 3;
          while ((int)uVar81 < size1) {
            auVar89 = vunpcklps_avx(*(undefined1 (*) [16])*pauVar76,
                                    *(undefined1 (*) [16])(*pauVar76 + 0x10));
            auVar92 = vunpcklps_avx(*(undefined1 (*) [16])(*pauVar76 + 0x20),
                                    *(undefined1 (*) [16])(*pauVar76 + 0x30));
            auVar90 = vunpckhps_avx(*(undefined1 (*) [16])*pauVar76,
                                    *(undefined1 (*) [16])(*pauVar76 + 0x10));
            auVar91 = vunpckhps_avx(*(undefined1 (*) [16])(*pauVar76 + 0x20),
                                    *(undefined1 (*) [16])(*pauVar76 + 0x30));
            auVar88 = vmovlhps_avx(auVar89,auVar92);
            auVar89 = vunpckhpd_avx(auVar89,auVar92);
            auVar88 = vmaxps_avx(auVar88,auVar89);
            auVar89 = vmovlhps_avx(auVar90,auVar91);
            auVar90 = vunpckhpd_avx(auVar90,auVar91);
            auVar89 = vmaxps_avx(auVar89,auVar90);
            auVar88 = vmaxps_avx(auVar88,auVar89);
            auVar88 = vmaxps_avx(auVar88,*(undefined1 (*) [16])*pauVar80);
            *(undefined1 (*) [16])*pauVar80 = auVar88;
            pauVar76 = pauVar76 + 1;
            pauVar80 = (undefined1 (*) [64])(*pauVar80 + 0x10);
            uVar81 = uVar77 + 7;
            uVar77 = uVar77 + 4;
          }
          if ((int)uVar77 < size1) {
            lVar84 = 0;
            do {
              auVar206._8_8_ = *(undefined8 *)(*pauVar76 + 8);
              auVar206._0_8_ = *(undefined8 *)(*pauVar76 + 8);
              auVar88 = vmaxps_avx(auVar206,*(undefined1 (*) [16])*pauVar76);
              auVar89 = vmovshdup_avx(auVar88);
              auVar88 = vmaxss_avx(auVar88,auVar89);
              auVar88 = vmaxss_avx(auVar88,ZEXT416(*(uint *)(*pauVar80 + lVar84 * 4)));
              *(int *)(*pauVar80 + lVar84 * 4) = auVar88._0_4_;
              pauVar76 = (undefined1 (*) [64])(*pauVar76 + 0x10);
              lVar84 = lVar84 + 1;
            } while (size1 - uVar77 != (int)lVar84);
          }
          afVar271 = ::_ps512_cephes_exp_p5;
          afVar75 = ::_ps512_1;
          uVar78 = uVar78 + 1;
        } while (uVar78 != (uint)elemcount);
        auVar141 = vbroadcastss_avx512f(ZEXT416(0x80000000));
        auVar142 = vxorps_avx512dq(auVar141,(undefined1  [64])::_ps512_cephes_exp_C1);
        auVar141 = vxorps_avx512dq(auVar141,(undefined1  [64])::_ps512_cephes_exp_C2);
        auVar143 = vmovdqa64_avx512f((undefined1  [64])::_pi32_512_0x7f);
        uVar78 = 0;
        auVar104 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
        auVar88 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
        auVar234._8_4_ = 0x39506967;
        auVar234._0_8_ = 0x3950696739506967;
        auVar234._12_4_ = 0x39506967;
        auVar220._8_4_ = 0x3d2aa9c1;
        auVar220._0_8_ = 0x3d2aa9c13d2aa9c1;
        auVar220._12_4_ = 0x3d2aa9c1;
        auVar246._8_4_ = 0x3e2aaaaa;
        auVar246._0_8_ = 0x3e2aaaaa3e2aaaaa;
        auVar246._12_4_ = 0x3e2aaaaa;
        auVar250._8_4_ = 0x3f800000;
        auVar250._0_8_ = 0x3f8000003f800000;
        auVar250._12_4_ = 0x3f800000;
        do {
          afVar257 = ::_ps512_cephes_exp_p4;
          afVar252 = ::_ps512_cephes_exp_p3;
          afVar249 = ::_ps512_cephes_exp_p2;
          afVar245 = ::_ps512_cephes_exp_p1;
          afVar231 = ::_ps512_cephes_exp_p0;
          afVar272 = ::_ps512_cephes_LOG2EF;
          afVar232 = ::_ps512_exp_lo;
          afVar270 = ::_ps512_exp_hi;
          auVar157 = _DAT_005ab6c0;
          auVar190 = _DAT_005ab680;
          auVar189 = _DAT_005ab640;
          auVar146 = _DAT_005ab600;
          auVar145 = _DAT_005ab5c0;
          auVar144 = _DAT_005ab580;
          pauVar76 = (undefined1 (*) [64])(_ptr + uVar78 * (long)stride);
          pauVar80 = (undefined1 (*) [64])_sumptr;
          pauVar85 = (undefined1 (*) [64])_maxptr;
          if (size1 < 0x10) {
            uVar77 = 0;
          }
          else {
            iVar79 = 0xf;
            do {
              auVar150 = *pauVar85;
              auVar147 = vpermps_avx512f(auVar144,auVar150);
              auVar147 = vsubps_avx512f(*pauVar76,auVar147);
              auVar148 = vpermps_avx512f(auVar145,auVar150);
              auVar148 = vsubps_avx512f(pauVar76[1],auVar148);
              auVar149 = vpermps_avx512f(auVar146,auVar150);
              auVar149 = vsubps_avx512f(pauVar76[2],auVar149);
              auVar150 = vpermps_avx512f(auVar189,auVar150);
              auVar150 = vsubps_avx512f(pauVar76[3],auVar150);
              auVar147 = vminps_avx512f(auVar147,(undefined1  [64])afVar270);
              auVar147 = vmaxps_avx512f(auVar147,(undefined1  [64])afVar232);
              auVar151 = vfmadd213ps_avx512f((undefined1  [64])afVar272,auVar147,
                                             (undefined1  [64])afVar271);
              auVar152 = vrndscaleps_avx512f(auVar151,1);
              uVar82 = vcmpps_avx512f(auVar151,auVar152,1);
              auVar151 = vsubps_avx512f(auVar152,(undefined1  [64])afVar75);
              bVar6 = (bool)((byte)uVar82 & 1);
              auVar153._0_4_ = (uint)bVar6 * auVar151._0_4_ | (uint)!bVar6 * auVar152._0_4_;
              bVar6 = (bool)((byte)(uVar82 >> 1) & 1);
              auVar153._4_4_ = (uint)bVar6 * auVar151._4_4_ | (uint)!bVar6 * auVar152._4_4_;
              bVar6 = (bool)((byte)(uVar82 >> 2) & 1);
              auVar153._8_4_ = (uint)bVar6 * auVar151._8_4_ | (uint)!bVar6 * auVar152._8_4_;
              bVar6 = (bool)((byte)(uVar82 >> 3) & 1);
              auVar153._12_4_ = (uint)bVar6 * auVar151._12_4_ | (uint)!bVar6 * auVar152._12_4_;
              bVar6 = (bool)((byte)(uVar82 >> 4) & 1);
              auVar153._16_4_ = (uint)bVar6 * auVar151._16_4_ | (uint)!bVar6 * auVar152._16_4_;
              bVar6 = (bool)((byte)(uVar82 >> 5) & 1);
              auVar153._20_4_ = (uint)bVar6 * auVar151._20_4_ | (uint)!bVar6 * auVar152._20_4_;
              bVar6 = (bool)((byte)(uVar82 >> 6) & 1);
              auVar153._24_4_ = (uint)bVar6 * auVar151._24_4_ | (uint)!bVar6 * auVar152._24_4_;
              bVar6 = (bool)((byte)(uVar82 >> 7) & 1);
              auVar153._28_4_ = (uint)bVar6 * auVar151._28_4_ | (uint)!bVar6 * auVar152._28_4_;
              bVar6 = (bool)((byte)(uVar82 >> 8) & 1);
              auVar153._32_4_ = (uint)bVar6 * auVar151._32_4_ | (uint)!bVar6 * auVar152._32_4_;
              bVar6 = (bool)((byte)(uVar82 >> 9) & 1);
              auVar153._36_4_ = (uint)bVar6 * auVar151._36_4_ | (uint)!bVar6 * auVar152._36_4_;
              bVar6 = (bool)((byte)(uVar82 >> 10) & 1);
              auVar153._40_4_ = (uint)bVar6 * auVar151._40_4_ | (uint)!bVar6 * auVar152._40_4_;
              bVar6 = (bool)((byte)(uVar82 >> 0xb) & 1);
              auVar153._44_4_ = (uint)bVar6 * auVar151._44_4_ | (uint)!bVar6 * auVar152._44_4_;
              bVar6 = (bool)((byte)(uVar82 >> 0xc) & 1);
              auVar153._48_4_ = (uint)bVar6 * auVar151._48_4_ | (uint)!bVar6 * auVar152._48_4_;
              bVar6 = (bool)((byte)(uVar82 >> 0xd) & 1);
              auVar153._52_4_ = (uint)bVar6 * auVar151._52_4_ | (uint)!bVar6 * auVar152._52_4_;
              bVar6 = (bool)((byte)(uVar82 >> 0xe) & 1);
              auVar153._56_4_ = (uint)bVar6 * auVar151._56_4_ | (uint)!bVar6 * auVar152._56_4_;
              bVar6 = SUB81(uVar82 >> 0xf,0);
              auVar153._60_4_ = (uint)bVar6 * auVar151._60_4_ | (uint)!bVar6 * auVar152._60_4_;
              auVar147 = vfmadd231ps_avx512f(auVar147,auVar153,auVar142);
              auVar147 = vfmadd231ps_avx512f(auVar147,auVar153,auVar141);
              auVar151 = vmulps_avx512f(auVar147,auVar147);
              auVar152 = vfmadd213ps_avx512f(auVar147,(undefined1  [64])afVar231,
                                             (undefined1  [64])afVar245);
              auVar152 = vfmadd213ps_avx512f(auVar152,auVar147,(undefined1  [64])afVar249);
              auVar152 = vfmadd213ps_avx512f(auVar152,auVar147,(undefined1  [64])afVar252);
              auVar152 = vfmadd213ps_avx512f(auVar152,auVar147,(undefined1  [64])afVar257);
              auVar152 = vfmadd213ps_avx512f(auVar152,auVar147,(undefined1  [64])afVar271);
              auVar147 = vfmadd213ps_avx512f(auVar152,auVar151,auVar147);
              auVar147 = vaddps_avx512f(auVar147,(undefined1  [64])afVar75);
              auVar151 = vcvttps2dq_avx512f(auVar153);
              auVar151 = vpaddd_avx512f(auVar151,auVar143);
              auVar151 = vpslld_avx512f(auVar151,0x17);
              auVar147 = vmulps_avx512f(auVar147,auVar151);
              auVar148 = vminps_avx512f(auVar148,(undefined1  [64])afVar270);
              auVar148 = vmaxps_avx512f(auVar148,(undefined1  [64])afVar232);
              auVar151 = vfmadd213ps_avx512f((undefined1  [64])afVar272,auVar148,
                                             (undefined1  [64])afVar271);
              auVar152 = vrndscaleps_avx512f(auVar151,1);
              uVar82 = vcmpps_avx512f(auVar151,auVar152,1);
              auVar151 = vsubps_avx512f(auVar152,(undefined1  [64])afVar75);
              bVar6 = (bool)((byte)uVar82 & 1);
              auVar154._0_4_ = (uint)bVar6 * auVar151._0_4_ | (uint)!bVar6 * auVar152._0_4_;
              bVar6 = (bool)((byte)(uVar82 >> 1) & 1);
              auVar154._4_4_ = (uint)bVar6 * auVar151._4_4_ | (uint)!bVar6 * auVar152._4_4_;
              bVar6 = (bool)((byte)(uVar82 >> 2) & 1);
              auVar154._8_4_ = (uint)bVar6 * auVar151._8_4_ | (uint)!bVar6 * auVar152._8_4_;
              bVar6 = (bool)((byte)(uVar82 >> 3) & 1);
              auVar154._12_4_ = (uint)bVar6 * auVar151._12_4_ | (uint)!bVar6 * auVar152._12_4_;
              bVar6 = (bool)((byte)(uVar82 >> 4) & 1);
              auVar154._16_4_ = (uint)bVar6 * auVar151._16_4_ | (uint)!bVar6 * auVar152._16_4_;
              bVar6 = (bool)((byte)(uVar82 >> 5) & 1);
              auVar154._20_4_ = (uint)bVar6 * auVar151._20_4_ | (uint)!bVar6 * auVar152._20_4_;
              bVar6 = (bool)((byte)(uVar82 >> 6) & 1);
              auVar154._24_4_ = (uint)bVar6 * auVar151._24_4_ | (uint)!bVar6 * auVar152._24_4_;
              bVar6 = (bool)((byte)(uVar82 >> 7) & 1);
              auVar154._28_4_ = (uint)bVar6 * auVar151._28_4_ | (uint)!bVar6 * auVar152._28_4_;
              bVar6 = (bool)((byte)(uVar82 >> 8) & 1);
              auVar154._32_4_ = (uint)bVar6 * auVar151._32_4_ | (uint)!bVar6 * auVar152._32_4_;
              bVar6 = (bool)((byte)(uVar82 >> 9) & 1);
              auVar154._36_4_ = (uint)bVar6 * auVar151._36_4_ | (uint)!bVar6 * auVar152._36_4_;
              bVar6 = (bool)((byte)(uVar82 >> 10) & 1);
              auVar154._40_4_ = (uint)bVar6 * auVar151._40_4_ | (uint)!bVar6 * auVar152._40_4_;
              bVar6 = (bool)((byte)(uVar82 >> 0xb) & 1);
              auVar154._44_4_ = (uint)bVar6 * auVar151._44_4_ | (uint)!bVar6 * auVar152._44_4_;
              bVar6 = (bool)((byte)(uVar82 >> 0xc) & 1);
              auVar154._48_4_ = (uint)bVar6 * auVar151._48_4_ | (uint)!bVar6 * auVar152._48_4_;
              bVar6 = (bool)((byte)(uVar82 >> 0xd) & 1);
              auVar154._52_4_ = (uint)bVar6 * auVar151._52_4_ | (uint)!bVar6 * auVar152._52_4_;
              bVar6 = (bool)((byte)(uVar82 >> 0xe) & 1);
              auVar154._56_4_ = (uint)bVar6 * auVar151._56_4_ | (uint)!bVar6 * auVar152._56_4_;
              bVar6 = SUB81(uVar82 >> 0xf,0);
              auVar154._60_4_ = (uint)bVar6 * auVar151._60_4_ | (uint)!bVar6 * auVar152._60_4_;
              auVar148 = vfmadd231ps_avx512f(auVar148,auVar154,auVar142);
              auVar148 = vfmadd231ps_avx512f(auVar148,auVar154,auVar141);
              auVar151 = vmulps_avx512f(auVar148,auVar148);
              auVar152 = vfmadd213ps_avx512f(auVar148,(undefined1  [64])afVar231,
                                             (undefined1  [64])afVar245);
              auVar152 = vfmadd213ps_avx512f(auVar152,auVar148,(undefined1  [64])afVar249);
              auVar152 = vfmadd213ps_avx512f(auVar152,auVar148,(undefined1  [64])afVar252);
              auVar152 = vfmadd213ps_avx512f(auVar152,auVar148,(undefined1  [64])afVar257);
              auVar152 = vfmadd213ps_avx512f(auVar152,auVar148,(undefined1  [64])afVar271);
              auVar148 = vfmadd213ps_avx512f(auVar152,auVar151,auVar148);
              auVar148 = vaddps_avx512f(auVar148,(undefined1  [64])afVar75);
              auVar151 = vcvttps2dq_avx512f(auVar154);
              auVar151 = vpaddd_avx512f(auVar151,auVar143);
              auVar151 = vpslld_avx512f(auVar151,0x17);
              auVar148 = vmulps_avx512f(auVar148,auVar151);
              auVar149 = vminps_avx512f(auVar149,(undefined1  [64])afVar270);
              auVar149 = vmaxps_avx512f(auVar149,(undefined1  [64])afVar232);
              auVar151 = vfmadd213ps_avx512f((undefined1  [64])afVar272,auVar149,
                                             (undefined1  [64])afVar271);
              auVar152 = vrndscaleps_avx512f(auVar151,1);
              uVar82 = vcmpps_avx512f(auVar151,auVar152,1);
              auVar151 = vsubps_avx512f(auVar152,(undefined1  [64])afVar75);
              bVar6 = (bool)((byte)uVar82 & 1);
              auVar155._0_4_ = (uint)bVar6 * auVar151._0_4_ | (uint)!bVar6 * auVar152._0_4_;
              bVar6 = (bool)((byte)(uVar82 >> 1) & 1);
              auVar155._4_4_ = (uint)bVar6 * auVar151._4_4_ | (uint)!bVar6 * auVar152._4_4_;
              bVar6 = (bool)((byte)(uVar82 >> 2) & 1);
              auVar155._8_4_ = (uint)bVar6 * auVar151._8_4_ | (uint)!bVar6 * auVar152._8_4_;
              bVar6 = (bool)((byte)(uVar82 >> 3) & 1);
              auVar155._12_4_ = (uint)bVar6 * auVar151._12_4_ | (uint)!bVar6 * auVar152._12_4_;
              bVar6 = (bool)((byte)(uVar82 >> 4) & 1);
              auVar155._16_4_ = (uint)bVar6 * auVar151._16_4_ | (uint)!bVar6 * auVar152._16_4_;
              bVar6 = (bool)((byte)(uVar82 >> 5) & 1);
              auVar155._20_4_ = (uint)bVar6 * auVar151._20_4_ | (uint)!bVar6 * auVar152._20_4_;
              bVar6 = (bool)((byte)(uVar82 >> 6) & 1);
              auVar155._24_4_ = (uint)bVar6 * auVar151._24_4_ | (uint)!bVar6 * auVar152._24_4_;
              bVar6 = (bool)((byte)(uVar82 >> 7) & 1);
              auVar155._28_4_ = (uint)bVar6 * auVar151._28_4_ | (uint)!bVar6 * auVar152._28_4_;
              bVar6 = (bool)((byte)(uVar82 >> 8) & 1);
              auVar155._32_4_ = (uint)bVar6 * auVar151._32_4_ | (uint)!bVar6 * auVar152._32_4_;
              bVar6 = (bool)((byte)(uVar82 >> 9) & 1);
              auVar155._36_4_ = (uint)bVar6 * auVar151._36_4_ | (uint)!bVar6 * auVar152._36_4_;
              bVar6 = (bool)((byte)(uVar82 >> 10) & 1);
              auVar155._40_4_ = (uint)bVar6 * auVar151._40_4_ | (uint)!bVar6 * auVar152._40_4_;
              bVar6 = (bool)((byte)(uVar82 >> 0xb) & 1);
              auVar155._44_4_ = (uint)bVar6 * auVar151._44_4_ | (uint)!bVar6 * auVar152._44_4_;
              bVar6 = (bool)((byte)(uVar82 >> 0xc) & 1);
              auVar155._48_4_ = (uint)bVar6 * auVar151._48_4_ | (uint)!bVar6 * auVar152._48_4_;
              bVar6 = (bool)((byte)(uVar82 >> 0xd) & 1);
              auVar155._52_4_ = (uint)bVar6 * auVar151._52_4_ | (uint)!bVar6 * auVar152._52_4_;
              bVar6 = (bool)((byte)(uVar82 >> 0xe) & 1);
              auVar155._56_4_ = (uint)bVar6 * auVar151._56_4_ | (uint)!bVar6 * auVar152._56_4_;
              bVar6 = SUB81(uVar82 >> 0xf,0);
              auVar155._60_4_ = (uint)bVar6 * auVar151._60_4_ | (uint)!bVar6 * auVar152._60_4_;
              auVar149 = vfmadd231ps_avx512f(auVar149,auVar155,auVar142);
              auVar149 = vfmadd231ps_avx512f(auVar149,auVar155,auVar141);
              auVar151 = vmulps_avx512f(auVar149,auVar149);
              auVar152 = vfmadd213ps_avx512f(auVar149,(undefined1  [64])afVar231,
                                             (undefined1  [64])afVar245);
              auVar152 = vfmadd213ps_avx512f(auVar152,auVar149,(undefined1  [64])afVar249);
              auVar152 = vfmadd213ps_avx512f(auVar152,auVar149,(undefined1  [64])afVar252);
              auVar152 = vfmadd213ps_avx512f(auVar152,auVar149,(undefined1  [64])afVar257);
              auVar152 = vfmadd213ps_avx512f(auVar152,auVar149,(undefined1  [64])afVar271);
              auVar149 = vfmadd213ps_avx512f(auVar152,auVar151,auVar149);
              auVar149 = vaddps_avx512f(auVar149,(undefined1  [64])afVar75);
              auVar151 = vcvttps2dq_avx512f(auVar155);
              auVar151 = vpaddd_avx512f(auVar151,auVar143);
              auVar151 = vpslld_avx512f(auVar151,0x17);
              auVar149 = vmulps_avx512f(auVar149,auVar151);
              auVar150 = vminps_avx512f(auVar150,(undefined1  [64])afVar270);
              auVar150 = vmaxps_avx512f(auVar150,(undefined1  [64])afVar232);
              auVar151 = vfmadd213ps_avx512f((undefined1  [64])afVar272,auVar150,
                                             (undefined1  [64])afVar271);
              auVar152 = vrndscaleps_avx512f(auVar151,1);
              uVar82 = vcmpps_avx512f(auVar151,auVar152,1);
              auVar151 = vsubps_avx512f(auVar152,(undefined1  [64])afVar75);
              bVar6 = (bool)((byte)uVar82 & 1);
              auVar156._0_4_ = (uint)bVar6 * auVar151._0_4_ | (uint)!bVar6 * auVar152._0_4_;
              bVar6 = (bool)((byte)(uVar82 >> 1) & 1);
              auVar156._4_4_ = (uint)bVar6 * auVar151._4_4_ | (uint)!bVar6 * auVar152._4_4_;
              bVar6 = (bool)((byte)(uVar82 >> 2) & 1);
              auVar156._8_4_ = (uint)bVar6 * auVar151._8_4_ | (uint)!bVar6 * auVar152._8_4_;
              bVar6 = (bool)((byte)(uVar82 >> 3) & 1);
              auVar156._12_4_ = (uint)bVar6 * auVar151._12_4_ | (uint)!bVar6 * auVar152._12_4_;
              bVar6 = (bool)((byte)(uVar82 >> 4) & 1);
              auVar156._16_4_ = (uint)bVar6 * auVar151._16_4_ | (uint)!bVar6 * auVar152._16_4_;
              bVar6 = (bool)((byte)(uVar82 >> 5) & 1);
              auVar156._20_4_ = (uint)bVar6 * auVar151._20_4_ | (uint)!bVar6 * auVar152._20_4_;
              bVar6 = (bool)((byte)(uVar82 >> 6) & 1);
              auVar156._24_4_ = (uint)bVar6 * auVar151._24_4_ | (uint)!bVar6 * auVar152._24_4_;
              bVar6 = (bool)((byte)(uVar82 >> 7) & 1);
              auVar156._28_4_ = (uint)bVar6 * auVar151._28_4_ | (uint)!bVar6 * auVar152._28_4_;
              bVar6 = (bool)((byte)(uVar82 >> 8) & 1);
              auVar156._32_4_ = (uint)bVar6 * auVar151._32_4_ | (uint)!bVar6 * auVar152._32_4_;
              bVar6 = (bool)((byte)(uVar82 >> 9) & 1);
              auVar156._36_4_ = (uint)bVar6 * auVar151._36_4_ | (uint)!bVar6 * auVar152._36_4_;
              bVar6 = (bool)((byte)(uVar82 >> 10) & 1);
              auVar156._40_4_ = (uint)bVar6 * auVar151._40_4_ | (uint)!bVar6 * auVar152._40_4_;
              bVar6 = (bool)((byte)(uVar82 >> 0xb) & 1);
              auVar156._44_4_ = (uint)bVar6 * auVar151._44_4_ | (uint)!bVar6 * auVar152._44_4_;
              bVar6 = (bool)((byte)(uVar82 >> 0xc) & 1);
              auVar156._48_4_ = (uint)bVar6 * auVar151._48_4_ | (uint)!bVar6 * auVar152._48_4_;
              bVar6 = (bool)((byte)(uVar82 >> 0xd) & 1);
              auVar156._52_4_ = (uint)bVar6 * auVar151._52_4_ | (uint)!bVar6 * auVar152._52_4_;
              bVar6 = (bool)((byte)(uVar82 >> 0xe) & 1);
              auVar156._56_4_ = (uint)bVar6 * auVar151._56_4_ | (uint)!bVar6 * auVar152._56_4_;
              bVar6 = SUB81(uVar82 >> 0xf,0);
              auVar156._60_4_ = (uint)bVar6 * auVar151._60_4_ | (uint)!bVar6 * auVar152._60_4_;
              auVar150 = vfmadd231ps_avx512f(auVar150,auVar156,auVar142);
              auVar150 = vfmadd231ps_avx512f(auVar150,auVar156,auVar141);
              auVar151 = vmulps_avx512f(auVar150,auVar150);
              auVar152 = vfmadd213ps_avx512f(auVar150,(undefined1  [64])afVar231,
                                             (undefined1  [64])afVar245);
              auVar152 = vfmadd213ps_avx512f(auVar152,auVar150,(undefined1  [64])afVar249);
              auVar152 = vfmadd213ps_avx512f(auVar152,auVar150,(undefined1  [64])afVar252);
              auVar152 = vfmadd213ps_avx512f(auVar152,auVar150,(undefined1  [64])afVar257);
              auVar152 = vfmadd213ps_avx512f(auVar152,auVar150,(undefined1  [64])afVar271);
              auVar150 = vfmadd213ps_avx512f(auVar152,auVar151,auVar150);
              auVar150 = vaddps_avx512f(auVar150,(undefined1  [64])afVar75);
              auVar151 = vcvttps2dq_avx512f(auVar156);
              auVar151 = vpaddd_avx512f(auVar151,auVar143);
              auVar151 = vpslld_avx512f(auVar151,0x17);
              auVar150 = vmulps_avx512f(auVar150,auVar151);
              *pauVar76 = auVar147;
              pauVar76[1] = auVar148;
              pauVar76[2] = auVar149;
              pauVar76[3] = auVar150;
              auVar151 = vunpcklps_avx512f(auVar147,auVar148);
              auVar147 = vunpckhps_avx512f(auVar147,auVar148);
              auVar147 = vaddps_avx512f(auVar151,auVar147);
              auVar148 = vunpcklps_avx512f(auVar149,auVar150);
              auVar150 = vunpckhps_avx512f(auVar149,auVar150);
              auVar150 = vaddps_avx512f(auVar148,auVar150);
              auVar148 = vpermt2ps_avx512f(auVar147,auVar190,auVar150);
              auVar150 = vpermt2ps_avx512f(auVar147,auVar157,auVar150);
              auVar150 = vaddps_avx512f(auVar150,auVar148);
              auVar150 = vaddps_avx512f(auVar150,*pauVar80);
              *pauVar80 = auVar150;
              pauVar76 = pauVar76 + 4;
              pauVar85 = pauVar85 + 1;
              pauVar80 = pauVar80 + 1;
              iVar79 = iVar79 + 0x10;
              uVar77 = size1 & 0xfffffff0U;
            } while (iVar79 < size1);
          }
          uVar81 = uVar77 | 7;
          auVar207._8_4_ = 0x3fb8aa3b;
          auVar207._0_8_ = 0x3fb8aa3b3fb8aa3b;
          auVar207._12_4_ = 0x3fb8aa3b;
          auVar217._8_4_ = 0x42b0c0a5;
          auVar217._0_8_ = 0x42b0c0a542b0c0a5;
          auVar217._12_4_ = 0x42b0c0a5;
          auVar217._16_4_ = 0x42b0c0a5;
          auVar217._20_4_ = 0x42b0c0a5;
          auVar217._24_4_ = 0x42b0c0a5;
          auVar217._28_4_ = 0x42b0c0a5;
          auVar243._8_4_ = 0xc2b0c0a5;
          auVar243._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar243._12_4_ = 0xc2b0c0a5;
          auVar243._16_4_ = 0xc2b0c0a5;
          auVar243._20_4_ = 0xc2b0c0a5;
          auVar243._24_4_ = 0xc2b0c0a5;
          auVar243._28_4_ = 0xc2b0c0a5;
          auVar263._8_4_ = 0x3fb8aa3b;
          auVar263._0_8_ = 0x3fb8aa3b3fb8aa3b;
          auVar263._12_4_ = 0x3fb8aa3b;
          auVar263._16_4_ = 0x3fb8aa3b;
          auVar263._20_4_ = 0x3fb8aa3b;
          auVar263._24_4_ = 0x3fb8aa3b;
          auVar263._28_4_ = 0x3fb8aa3b;
          auVar266._8_4_ = 0x39506967;
          auVar266._0_8_ = 0x3950696739506967;
          auVar266._12_4_ = 0x39506967;
          auVar266._16_4_ = 0x39506967;
          auVar266._20_4_ = 0x39506967;
          auVar266._24_4_ = 0x39506967;
          auVar266._28_4_ = 0x39506967;
          auVar268._8_4_ = 0x3f800000;
          auVar268._0_8_ = 0x3f8000003f800000;
          auVar268._12_4_ = 0x3f800000;
          auVar268._16_4_ = 0x3f800000;
          auVar268._20_4_ = 0x3f800000;
          auVar268._24_4_ = 0x3f800000;
          auVar268._28_4_ = 0x3f800000;
          auVar105 = vbroadcastss_avx512vl(ZEXT416(0x3f318000));
          auVar106 = vbroadcastss_avx512vl(ZEXT416(0xb95e8083));
          auVar107 = vbroadcastss_avx512vl(ZEXT416(0x3ab743ce));
          auVar108 = vbroadcastss_avx512vl(ZEXT416(0x3e2aaaaa));
          auVar109 = vpbroadcastd_avx512vl(ZEXT416(0x3f800000));
          auVar110 = vbroadcastss_avx512vl(ZEXT416(0x3c088908));
          auVar111 = vbroadcastss_avx512vl(ZEXT416(0x3d2aa9c1));
          while ((int)uVar81 < size1) {
            auVar89 = vbroadcastss_avx512vl(ZEXT416(*(uint *)*pauVar85));
            auVar90 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*pauVar85 + 4)));
            auVar112 = vinsertf32x4_avx512vl(ZEXT1632(auVar89),auVar90,1);
            auVar112 = vsubps_avx512vl(*(undefined1 (*) [32])*pauVar76,auVar112);
            auVar112 = vminps_avx(auVar112,auVar217);
            auVar112 = vmaxps_avx(auVar112,auVar243);
            auVar113 = vfmadd213ps_avx512vl(auVar263,auVar112,auVar104);
            auVar114 = vrndscaleps_avx512vl(auVar113,1);
            uVar82 = vcmpps_avx512vl(auVar113,auVar114,1);
            auVar113 = vsubps_avx512vl(auVar114,auVar268);
            bVar6 = (bool)((byte)uVar82 & 1);
            auVar115._0_4_ = (uint)bVar6 * auVar113._0_4_ | (uint)!bVar6 * auVar114._0_4_;
            bVar6 = (bool)((byte)(uVar82 >> 1) & 1);
            auVar115._4_4_ = (uint)bVar6 * auVar113._4_4_ | (uint)!bVar6 * auVar114._4_4_;
            bVar6 = (bool)((byte)(uVar82 >> 2) & 1);
            auVar115._8_4_ = (uint)bVar6 * auVar113._8_4_ | (uint)!bVar6 * auVar114._8_4_;
            bVar6 = (bool)((byte)(uVar82 >> 3) & 1);
            auVar115._12_4_ = (uint)bVar6 * auVar113._12_4_ | (uint)!bVar6 * auVar114._12_4_;
            bVar6 = (bool)((byte)(uVar82 >> 4) & 1);
            auVar115._16_4_ = (uint)bVar6 * auVar113._16_4_ | (uint)!bVar6 * auVar114._16_4_;
            bVar6 = (bool)((byte)(uVar82 >> 5) & 1);
            auVar115._20_4_ = (uint)bVar6 * auVar113._20_4_ | (uint)!bVar6 * auVar114._20_4_;
            bVar6 = (bool)((byte)(uVar82 >> 6) & 1);
            auVar115._24_4_ = (uint)bVar6 * auVar113._24_4_ | (uint)!bVar6 * auVar114._24_4_;
            bVar6 = SUB81(uVar82 >> 7,0);
            auVar115._28_4_ = (uint)bVar6 * auVar113._28_4_ | (uint)!bVar6 * auVar114._28_4_;
            auVar112 = vfmsub231ps_avx512vl(auVar112,auVar115,auVar105);
            auVar112 = vfnmsub231ps_avx512vl(auVar112,auVar115,auVar106);
            auVar113 = vmulps_avx512vl(auVar112,auVar112);
            auVar114 = vfmadd213ps_avx512vl(auVar266,auVar112,auVar107);
            auVar114 = vfmadd213ps_avx512vl(auVar114,auVar112,auVar110);
            auVar114 = vfmadd213ps_avx512vl(auVar114,auVar112,auVar111);
            auVar114 = vfmadd213ps_avx512vl(auVar114,auVar112,auVar108);
            auVar114 = vfmadd213ps_avx512vl(auVar114,auVar112,auVar104);
            auVar112 = vfmadd213ps_avx512vl(auVar114,auVar113,auVar112);
            auVar113 = vcvttps2dq_avx512vl(auVar115);
            auVar113 = vpslld_avx2(auVar113,0x17);
            auVar113 = vpaddd_avx512vl(auVar113,auVar109);
            auVar89 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*pauVar85 + 8)));
            auVar113 = vfmadd213ps_avx512vl(auVar113,auVar112,auVar113);
            auVar90 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*pauVar85 + 0xc)));
            auVar112 = vinsertf32x4_avx512vl(ZEXT1632(auVar89),auVar90,1);
            auVar112 = vsubps_avx512vl(*(undefined1 (*) [32])(*pauVar76 + 0x20),auVar112);
            auVar112 = vminps_avx512vl(auVar112,auVar217);
            auVar112 = vmaxps_avx512vl(auVar112,auVar243);
            auVar114 = vfmadd213ps_avx512vl(auVar263,auVar112,auVar104);
            auVar116 = vrndscaleps_avx512vl(auVar114,1);
            uVar82 = vcmpps_avx512vl(auVar114,auVar116,1);
            auVar114 = vsubps_avx512vl(auVar116,auVar268);
            bVar6 = (bool)((byte)uVar82 & 1);
            auVar117._0_4_ = (uint)bVar6 * auVar114._0_4_ | (uint)!bVar6 * auVar116._0_4_;
            bVar6 = (bool)((byte)(uVar82 >> 1) & 1);
            auVar117._4_4_ = (uint)bVar6 * auVar114._4_4_ | (uint)!bVar6 * auVar116._4_4_;
            bVar6 = (bool)((byte)(uVar82 >> 2) & 1);
            auVar117._8_4_ = (uint)bVar6 * auVar114._8_4_ | (uint)!bVar6 * auVar116._8_4_;
            bVar6 = (bool)((byte)(uVar82 >> 3) & 1);
            auVar117._12_4_ = (uint)bVar6 * auVar114._12_4_ | (uint)!bVar6 * auVar116._12_4_;
            bVar6 = (bool)((byte)(uVar82 >> 4) & 1);
            auVar117._16_4_ = (uint)bVar6 * auVar114._16_4_ | (uint)!bVar6 * auVar116._16_4_;
            bVar6 = (bool)((byte)(uVar82 >> 5) & 1);
            auVar117._20_4_ = (uint)bVar6 * auVar114._20_4_ | (uint)!bVar6 * auVar116._20_4_;
            bVar6 = (bool)((byte)(uVar82 >> 6) & 1);
            auVar117._24_4_ = (uint)bVar6 * auVar114._24_4_ | (uint)!bVar6 * auVar116._24_4_;
            bVar6 = SUB81(uVar82 >> 7,0);
            auVar117._28_4_ = (uint)bVar6 * auVar114._28_4_ | (uint)!bVar6 * auVar116._28_4_;
            auVar112 = vfmsub231ps_avx512vl(auVar112,auVar117,auVar105);
            auVar112 = vfnmsub231ps_avx512vl(auVar112,auVar117,auVar106);
            auVar114 = vmulps_avx512vl(auVar112,auVar112);
            auVar116 = vfmadd213ps_avx512vl(auVar266,auVar112,auVar107);
            auVar116 = vfmadd213ps_avx512vl(auVar116,auVar112,auVar110);
            auVar116 = vfmadd213ps_avx512vl(auVar116,auVar112,auVar111);
            auVar116 = vfmadd213ps_avx512vl(auVar116,auVar112,auVar108);
            auVar116 = vfmadd213ps_avx512vl(auVar116,auVar112,auVar104);
            auVar112 = vfmadd213ps_avx512vl(auVar116,auVar114,auVar112);
            auVar114 = vcvttps2dq_avx512vl(auVar117);
            auVar114 = vpslld_avx512vl(auVar114,0x17);
            auVar114 = vpaddd_avx512vl(auVar114,auVar109);
            auVar114 = vfmadd213ps_avx512vl(auVar114,auVar112,auVar114);
            auVar89 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*pauVar85 + 0x10)));
            auVar90 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*pauVar85 + 0x14)));
            auVar112 = vinsertf32x4_avx512vl(ZEXT1632(auVar89),auVar90,1);
            auVar112 = vsubps_avx512vl(*(undefined1 (*) [32])pauVar76[1],auVar112);
            auVar112 = vminps_avx512vl(auVar112,auVar217);
            auVar112 = vmaxps_avx512vl(auVar112,auVar243);
            auVar116 = vfmadd213ps_avx512vl(auVar263,auVar112,auVar104);
            auVar118 = vrndscaleps_avx512vl(auVar116,1);
            uVar82 = vcmpps_avx512vl(auVar116,auVar118,1);
            auVar116 = vsubps_avx512vl(auVar118,auVar268);
            bVar6 = (bool)((byte)uVar82 & 1);
            auVar119._0_4_ = (uint)bVar6 * auVar116._0_4_ | (uint)!bVar6 * auVar118._0_4_;
            bVar6 = (bool)((byte)(uVar82 >> 1) & 1);
            auVar119._4_4_ = (uint)bVar6 * auVar116._4_4_ | (uint)!bVar6 * auVar118._4_4_;
            bVar6 = (bool)((byte)(uVar82 >> 2) & 1);
            auVar119._8_4_ = (uint)bVar6 * auVar116._8_4_ | (uint)!bVar6 * auVar118._8_4_;
            bVar6 = (bool)((byte)(uVar82 >> 3) & 1);
            auVar119._12_4_ = (uint)bVar6 * auVar116._12_4_ | (uint)!bVar6 * auVar118._12_4_;
            bVar6 = (bool)((byte)(uVar82 >> 4) & 1);
            auVar119._16_4_ = (uint)bVar6 * auVar116._16_4_ | (uint)!bVar6 * auVar118._16_4_;
            bVar6 = (bool)((byte)(uVar82 >> 5) & 1);
            auVar119._20_4_ = (uint)bVar6 * auVar116._20_4_ | (uint)!bVar6 * auVar118._20_4_;
            bVar6 = (bool)((byte)(uVar82 >> 6) & 1);
            auVar119._24_4_ = (uint)bVar6 * auVar116._24_4_ | (uint)!bVar6 * auVar118._24_4_;
            bVar6 = SUB81(uVar82 >> 7,0);
            auVar119._28_4_ = (uint)bVar6 * auVar116._28_4_ | (uint)!bVar6 * auVar118._28_4_;
            auVar112 = vfmsub231ps_avx512vl(auVar112,auVar119,auVar105);
            auVar112 = vfnmsub231ps_avx512vl(auVar112,auVar119,auVar106);
            auVar116 = vmulps_avx512vl(auVar112,auVar112);
            auVar118 = vfmadd213ps_avx512vl(auVar266,auVar112,auVar107);
            auVar118 = vfmadd213ps_avx512vl(auVar118,auVar112,auVar110);
            auVar118 = vfmadd213ps_avx512vl(auVar118,auVar112,auVar111);
            auVar118 = vfmadd213ps_avx512vl(auVar118,auVar112,auVar108);
            auVar118 = vfmadd213ps_avx512vl(auVar118,auVar112,auVar104);
            auVar112 = vfmadd213ps_avx512vl(auVar118,auVar116,auVar112);
            auVar116 = vcvttps2dq_avx512vl(auVar119);
            auVar116 = vpslld_avx512vl(auVar116,0x17);
            auVar116 = vpaddd_avx512vl(auVar116,auVar109);
            auVar89 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*pauVar85 + 0x18)));
            auVar90 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*pauVar85 + 0x1c)));
            auVar116 = vfmadd213ps_avx512vl(auVar116,auVar112,auVar116);
            auVar112 = vinsertf32x4_avx512vl(ZEXT1632(auVar89),auVar90,1);
            auVar112 = vsubps_avx512vl(*(undefined1 (*) [32])(pauVar76[1] + 0x20),auVar112);
            auVar112 = vminps_avx(auVar112,auVar217);
            auVar112 = vmaxps_avx(auVar112,auVar243);
            auVar118 = vfmadd213ps_avx512vl(auVar263,auVar112,auVar104);
            auVar120 = vrndscaleps_avx512vl(auVar118,1);
            uVar82 = vcmpps_avx512vl(auVar118,auVar120,1);
            auVar118 = vsubps_avx512vl(auVar120,auVar268);
            bVar6 = (bool)((byte)uVar82 & 1);
            auVar121._0_4_ = (uint)bVar6 * auVar118._0_4_ | (uint)!bVar6 * auVar120._0_4_;
            bVar6 = (bool)((byte)(uVar82 >> 1) & 1);
            auVar121._4_4_ = (uint)bVar6 * auVar118._4_4_ | (uint)!bVar6 * auVar120._4_4_;
            bVar6 = (bool)((byte)(uVar82 >> 2) & 1);
            auVar121._8_4_ = (uint)bVar6 * auVar118._8_4_ | (uint)!bVar6 * auVar120._8_4_;
            bVar6 = (bool)((byte)(uVar82 >> 3) & 1);
            auVar121._12_4_ = (uint)bVar6 * auVar118._12_4_ | (uint)!bVar6 * auVar120._12_4_;
            bVar6 = (bool)((byte)(uVar82 >> 4) & 1);
            auVar121._16_4_ = (uint)bVar6 * auVar118._16_4_ | (uint)!bVar6 * auVar120._16_4_;
            bVar6 = (bool)((byte)(uVar82 >> 5) & 1);
            auVar121._20_4_ = (uint)bVar6 * auVar118._20_4_ | (uint)!bVar6 * auVar120._20_4_;
            bVar6 = (bool)((byte)(uVar82 >> 6) & 1);
            auVar121._24_4_ = (uint)bVar6 * auVar118._24_4_ | (uint)!bVar6 * auVar120._24_4_;
            bVar6 = SUB81(uVar82 >> 7,0);
            auVar121._28_4_ = (uint)bVar6 * auVar118._28_4_ | (uint)!bVar6 * auVar120._28_4_;
            auVar112 = vfmsub231ps_avx512vl(auVar112,auVar121,auVar105);
            auVar112 = vfnmsub231ps_avx512vl(auVar112,auVar121,auVar106);
            auVar118 = vmulps_avx512vl(auVar112,auVar112);
            auVar120 = vfmadd213ps_avx512vl(auVar266,auVar112,auVar107);
            auVar120 = vfmadd213ps_avx512vl(auVar120,auVar112,auVar110);
            auVar120 = vfmadd213ps_avx512vl(auVar120,auVar112,auVar111);
            auVar120 = vfmadd213ps_avx512vl(auVar120,auVar112,auVar108);
            auVar120 = vfmadd213ps_avx512vl(auVar120,auVar112,auVar104);
            auVar112 = vfmadd213ps_avx512vl(auVar120,auVar118,auVar112);
            auVar118 = vcvttps2dq_avx512vl(auVar121);
            auVar118 = vpslld_avx2(auVar118,0x17);
            auVar118 = vpaddd_avx512vl(auVar118,auVar109);
            auVar112 = vfmadd213ps_avx512vl(auVar118,auVar112,auVar118);
            *(undefined1 (*) [32])*pauVar76 = auVar113;
            *(undefined1 (*) [32])(*pauVar76 + 0x20) = auVar114;
            *(undefined1 (*) [32])pauVar76[1] = auVar116;
            *(undefined1 (*) [32])(pauVar76[1] + 0x20) = auVar112;
            auVar118 = vunpcklps_avx512vl(auVar113,auVar114);
            auVar113 = vunpckhps_avx512vl(auVar113,auVar114);
            auVar113 = vaddps_avx512vl(auVar118,auVar113);
            auVar114 = vunpcklps_avx512vl(auVar116,auVar112);
            auVar112 = vunpckhps_avx512vl(auVar116,auVar112);
            auVar112 = vaddps_avx512vl(auVar114,auVar112);
            auVar114 = vinsertf32x4_avx512vl(auVar113,auVar112._0_16_,1);
            auVar112 = vperm2f128_avx(auVar113,auVar112,0x31);
            auVar113 = vunpcklps_avx512vl(auVar114,auVar112);
            auVar112 = vunpckhps_avx512vl(auVar114,auVar112);
            auVar256._0_4_ = auVar112._0_4_ + *(float *)*pauVar80 + auVar113._0_4_;
            auVar256._4_4_ = auVar112._4_4_ + *(float *)(*pauVar80 + 4) + auVar113._4_4_;
            auVar256._8_4_ = auVar112._8_4_ + *(float *)(*pauVar80 + 8) + auVar113._8_4_;
            auVar256._12_4_ = auVar112._12_4_ + *(float *)(*pauVar80 + 0xc) + auVar113._12_4_;
            auVar256._16_4_ = auVar112._16_4_ + *(float *)(*pauVar80 + 0x10) + auVar113._16_4_;
            auVar256._20_4_ = auVar112._20_4_ + *(float *)(*pauVar80 + 0x14) + auVar113._20_4_;
            auVar256._24_4_ = auVar112._24_4_ + *(float *)(*pauVar80 + 0x18) + auVar113._24_4_;
            auVar256._28_4_ = auVar112._28_4_ + *(float *)(*pauVar80 + 0x1c) + auVar113._28_4_;
            *(undefined1 (*) [32])*pauVar80 = auVar256;
            pauVar76 = pauVar76 + 2;
            pauVar85 = (undefined1 (*) [64])(*pauVar85 + 0x20);
            pauVar80 = (undefined1 (*) [64])(*pauVar80 + 0x20);
            uVar81 = uVar77 + 0xf;
            uVar77 = uVar77 + 8;
          }
          uVar81 = uVar77 | 3;
          auVar215._8_4_ = 0xc2b0c0a5;
          auVar215._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar215._12_4_ = 0xc2b0c0a5;
          auVar241._8_4_ = 0x42b0c0a5;
          auVar241._0_8_ = 0x42b0c0a542b0c0a5;
          auVar241._12_4_ = 0x42b0c0a5;
          auVar261._8_4_ = 0x3f318000;
          auVar261._0_8_ = 0x3f3180003f318000;
          auVar261._12_4_ = 0x3f318000;
          auVar264._8_4_ = 0x3ab743ce;
          auVar264._0_8_ = 0x3ab743ce3ab743ce;
          auVar264._12_4_ = 0x3ab743ce;
          auVar267._8_4_ = 0x3c088908;
          auVar267._0_8_ = 0x3c0889083c088908;
          auVar267._12_4_ = 0x3c088908;
          auVar89 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
          auVar90 = vbroadcastss_avx512vl(ZEXT416(0xb95e8083));
          while ((int)uVar81 < size1) {
            uVar3 = *(undefined4 *)*pauVar85;
            auVar23._4_4_ = uVar3;
            auVar23._0_4_ = uVar3;
            auVar23._8_4_ = uVar3;
            auVar23._12_4_ = uVar3;
            auVar91 = vsubps_avx512vl(*(undefined1 (*) [16])*pauVar76,auVar23);
            auVar91 = vminps_avx(auVar91,auVar241);
            auVar91 = vmaxps_avx(auVar91,auVar215);
            auVar92 = vfmadd213ps_avx512vl(auVar207,auVar91,auVar88);
            auVar93 = vcvttps2dq_avx512vl(auVar92);
            auVar93 = vcvtdq2ps_avx512vl(auVar93);
            uVar82 = vcmpps_avx512vl(auVar92,auVar93,1);
            auVar92 = vsubps_avx512vl(auVar93,auVar89);
            bVar6 = (bool)((byte)uVar82 & 1);
            auVar94._0_4_ = (uint)bVar6 * auVar92._0_4_ | (uint)!bVar6 * auVar93._0_4_;
            bVar6 = (bool)((byte)(uVar82 >> 1) & 1);
            auVar94._4_4_ = (uint)bVar6 * auVar92._4_4_ | (uint)!bVar6 * auVar93._4_4_;
            bVar6 = (bool)((byte)(uVar82 >> 2) & 1);
            auVar94._8_4_ = (uint)bVar6 * auVar92._8_4_ | (uint)!bVar6 * auVar93._8_4_;
            bVar6 = (bool)((byte)(uVar82 >> 3) & 1);
            auVar94._12_4_ = (uint)bVar6 * auVar92._12_4_ | (uint)!bVar6 * auVar93._12_4_;
            auVar91 = vfmsub231ps_avx512vl(auVar91,auVar94,auVar261);
            auVar91 = vfnmsub231ps_avx512vl(auVar91,auVar94,auVar90);
            auVar92 = vmulps_avx512vl(auVar91,auVar91);
            auVar93 = vfmadd213ps_avx512vl(auVar234,auVar91,auVar264);
            auVar93 = vfmadd213ps_avx512vl(auVar93,auVar91,auVar267);
            auVar93 = vfmadd213ps_avx512vl(auVar93,auVar91,auVar220);
            auVar93 = vfmadd213ps_avx512vl(auVar93,auVar91,auVar246);
            auVar93 = vfmadd213ps_avx512vl(auVar93,auVar91,auVar88);
            auVar92 = vfmadd213ps_avx512vl(auVar93,auVar92,auVar91);
            auVar91 = vcvttps2dq_avx512vl(auVar94);
            auVar91 = vpslld_avx(auVar91,0x17);
            auVar91 = vpaddd_avx(auVar91,auVar250);
            auVar92 = vfmadd213ps_avx512vl(auVar91,auVar92,auVar91);
            uVar3 = *(undefined4 *)(*pauVar85 + 4);
            auVar24._4_4_ = uVar3;
            auVar24._0_4_ = uVar3;
            auVar24._8_4_ = uVar3;
            auVar24._12_4_ = uVar3;
            auVar91 = vsubps_avx512vl(*(undefined1 (*) [16])(*pauVar76 + 0x10),auVar24);
            auVar91 = vminps_avx512vl(auVar91,auVar241);
            auVar91 = vmaxps_avx512vl(auVar91,auVar215);
            auVar93 = vfmadd213ps_avx512vl(auVar207,auVar91,auVar88);
            auVar95 = vcvttps2dq_avx512vl(auVar93);
            auVar95 = vcvtdq2ps_avx512vl(auVar95);
            uVar82 = vcmpps_avx512vl(auVar93,auVar95,1);
            auVar93 = vsubps_avx512vl(auVar95,auVar89);
            bVar6 = (bool)((byte)uVar82 & 1);
            auVar96._0_4_ = (uint)bVar6 * auVar93._0_4_ | (uint)!bVar6 * auVar95._0_4_;
            bVar6 = (bool)((byte)(uVar82 >> 1) & 1);
            auVar96._4_4_ = (uint)bVar6 * auVar93._4_4_ | (uint)!bVar6 * auVar95._4_4_;
            bVar6 = (bool)((byte)(uVar82 >> 2) & 1);
            auVar96._8_4_ = (uint)bVar6 * auVar93._8_4_ | (uint)!bVar6 * auVar95._8_4_;
            bVar6 = (bool)((byte)(uVar82 >> 3) & 1);
            auVar96._12_4_ = (uint)bVar6 * auVar93._12_4_ | (uint)!bVar6 * auVar95._12_4_;
            auVar91 = vfmsub231ps_avx512vl(auVar91,auVar96,auVar261);
            auVar91 = vfnmsub231ps_avx512vl(auVar91,auVar96,auVar90);
            auVar93 = vmulps_avx512vl(auVar91,auVar91);
            auVar95 = vfmadd213ps_avx512vl(auVar234,auVar91,auVar264);
            auVar95 = vfmadd213ps_avx512vl(auVar95,auVar91,auVar267);
            auVar95 = vfmadd213ps_avx512vl(auVar95,auVar91,auVar220);
            auVar95 = vfmadd213ps_avx512vl(auVar95,auVar91,auVar246);
            auVar95 = vfmadd213ps_avx512vl(auVar95,auVar91,auVar88);
            auVar91 = vfmadd213ps_avx512vl(auVar95,auVar93,auVar91);
            auVar93 = vcvttps2dq_avx512vl(auVar96);
            auVar93 = vpslld_avx512vl(auVar93,0x17);
            auVar93 = vpaddd_avx512vl(auVar93,auVar250);
            auVar93 = vfmadd213ps_avx512vl(auVar93,auVar91,auVar93);
            uVar3 = *(undefined4 *)(*pauVar85 + 8);
            auVar25._4_4_ = uVar3;
            auVar25._0_4_ = uVar3;
            auVar25._8_4_ = uVar3;
            auVar25._12_4_ = uVar3;
            auVar91 = vsubps_avx512vl(*(undefined1 (*) [16])(*pauVar76 + 0x20),auVar25);
            auVar91 = vminps_avx512vl(auVar91,auVar241);
            auVar91 = vmaxps_avx512vl(auVar91,auVar215);
            auVar95 = vfmadd213ps_avx512vl(auVar207,auVar91,auVar88);
            auVar97 = vcvttps2dq_avx512vl(auVar95);
            auVar97 = vcvtdq2ps_avx512vl(auVar97);
            uVar82 = vcmpps_avx512vl(auVar95,auVar97,1);
            auVar95 = vsubps_avx512vl(auVar97,auVar89);
            bVar6 = (bool)((byte)uVar82 & 1);
            auVar98._0_4_ = (uint)bVar6 * auVar95._0_4_ | (uint)!bVar6 * auVar97._0_4_;
            bVar6 = (bool)((byte)(uVar82 >> 1) & 1);
            auVar98._4_4_ = (uint)bVar6 * auVar95._4_4_ | (uint)!bVar6 * auVar97._4_4_;
            bVar6 = (bool)((byte)(uVar82 >> 2) & 1);
            auVar98._8_4_ = (uint)bVar6 * auVar95._8_4_ | (uint)!bVar6 * auVar97._8_4_;
            bVar6 = (bool)((byte)(uVar82 >> 3) & 1);
            auVar98._12_4_ = (uint)bVar6 * auVar95._12_4_ | (uint)!bVar6 * auVar97._12_4_;
            auVar91 = vfmsub231ps_avx512vl(auVar91,auVar98,auVar261);
            auVar91 = vfnmsub231ps_avx512vl(auVar91,auVar98,auVar90);
            auVar95 = vmulps_avx512vl(auVar91,auVar91);
            auVar97 = vfmadd213ps_avx512vl(auVar234,auVar91,auVar264);
            auVar97 = vfmadd213ps_avx512vl(auVar97,auVar91,auVar267);
            auVar97 = vfmadd213ps_avx512vl(auVar97,auVar91,auVar220);
            auVar97 = vfmadd213ps_avx512vl(auVar97,auVar91,auVar246);
            auVar97 = vfmadd213ps_avx512vl(auVar97,auVar91,auVar88);
            auVar91 = vfmadd213ps_avx512vl(auVar97,auVar95,auVar91);
            auVar95 = vcvttps2dq_avx512vl(auVar98);
            auVar95 = vpslld_avx512vl(auVar95,0x17);
            auVar95 = vpaddd_avx512vl(auVar95,auVar250);
            auVar95 = vfmadd213ps_avx512vl(auVar95,auVar91,auVar95);
            uVar3 = *(undefined4 *)(*pauVar85 + 0xc);
            auVar26._4_4_ = uVar3;
            auVar26._0_4_ = uVar3;
            auVar26._8_4_ = uVar3;
            auVar26._12_4_ = uVar3;
            auVar91 = vsubps_avx512vl(*(undefined1 (*) [16])(*pauVar76 + 0x30),auVar26);
            auVar91 = vminps_avx(auVar91,auVar241);
            auVar91 = vmaxps_avx(auVar91,auVar215);
            auVar97 = vfmadd213ps_avx512vl(auVar207,auVar91,auVar88);
            auVar99 = vcvttps2dq_avx512vl(auVar97);
            auVar99 = vcvtdq2ps_avx512vl(auVar99);
            uVar82 = vcmpps_avx512vl(auVar97,auVar99,1);
            auVar97 = vsubps_avx512vl(auVar99,auVar89);
            bVar6 = (bool)((byte)uVar82 & 1);
            auVar100._0_4_ = (uint)bVar6 * auVar97._0_4_ | (uint)!bVar6 * auVar99._0_4_;
            bVar6 = (bool)((byte)(uVar82 >> 1) & 1);
            auVar100._4_4_ = (uint)bVar6 * auVar97._4_4_ | (uint)!bVar6 * auVar99._4_4_;
            bVar6 = (bool)((byte)(uVar82 >> 2) & 1);
            auVar100._8_4_ = (uint)bVar6 * auVar97._8_4_ | (uint)!bVar6 * auVar99._8_4_;
            bVar6 = (bool)((byte)(uVar82 >> 3) & 1);
            auVar100._12_4_ = (uint)bVar6 * auVar97._12_4_ | (uint)!bVar6 * auVar99._12_4_;
            auVar91 = vfmsub231ps_avx512vl(auVar91,auVar100,auVar261);
            auVar91 = vfnmsub231ps_avx512vl(auVar91,auVar100,auVar90);
            auVar97 = vmulps_avx512vl(auVar91,auVar91);
            auVar99 = vfmadd213ps_avx512vl(auVar234,auVar91,auVar264);
            auVar99 = vfmadd213ps_avx512vl(auVar99,auVar91,auVar267);
            auVar99 = vfmadd213ps_avx512vl(auVar99,auVar91,auVar220);
            auVar99 = vfmadd213ps_avx512vl(auVar99,auVar91,auVar246);
            auVar99 = vfmadd213ps_avx512vl(auVar99,auVar91,auVar88);
            auVar97 = vfmadd213ps_avx512vl(auVar99,auVar97,auVar91);
            auVar91 = vcvttps2dq_avx512vl(auVar100);
            auVar91 = vpslld_avx(auVar91,0x17);
            auVar91 = vpaddd_avx(auVar91,auVar250);
            auVar91 = vfmadd213ps_avx512vl(auVar91,auVar97,auVar91);
            *(undefined1 (*) [16])*pauVar76 = auVar92;
            *(undefined1 (*) [16])(*pauVar76 + 0x10) = auVar93;
            *(undefined1 (*) [16])(*pauVar76 + 0x20) = auVar95;
            *(undefined1 (*) [16])(*pauVar76 + 0x30) = auVar91;
            auVar97 = vunpcklps_avx512vl(auVar92,auVar93);
            auVar99 = vunpcklps_avx512vl(auVar95,auVar91);
            auVar101 = vunpckhps_avx512vl(auVar92,auVar93);
            auVar91 = vunpckhps_avx512vl(auVar95,auVar91);
            auVar92 = vmovlhps_avx512f(auVar97,auVar99);
            auVar95 = vunpckhpd_avx512vl(auVar97,auVar99);
            auVar93 = vmovlhps_avx512f(auVar101,auVar91);
            auVar91 = vunpckhpd_avx(auVar101,auVar91);
            auVar91 = vaddps_avx512vl(auVar92,auVar91);
            auVar91 = vaddps_avx512vl(auVar91,auVar93);
            auVar92 = vaddps_avx512vl(auVar95,*(undefined1 (*) [16])*pauVar80);
            auVar253._0_4_ = auVar92._0_4_ + auVar91._0_4_;
            auVar253._4_4_ = auVar92._4_4_ + auVar91._4_4_;
            auVar253._8_4_ = auVar92._8_4_ + auVar91._8_4_;
            auVar253._12_4_ = auVar92._12_4_ + auVar91._12_4_;
            *(undefined1 (*) [16])*pauVar80 = auVar253;
            pauVar76 = pauVar76 + 1;
            pauVar85 = (undefined1 (*) [64])(*pauVar85 + 0x10);
            pauVar80 = (undefined1 (*) [64])(*pauVar80 + 0x10);
            uVar81 = uVar77 + 7;
            uVar77 = uVar77 + 4;
          }
          auVar89 = vbroadcastss_avx512vl(ZEXT416(0xbf800000));
          auVar90 = vbroadcastss_avx512vl(ZEXT416(0x395e8083));
          if ((int)uVar77 < size1) {
            lVar84 = 0;
            do {
              uVar3 = *(undefined4 *)(*pauVar85 + lVar84 * 4);
              auVar27._4_4_ = uVar3;
              auVar27._0_4_ = uVar3;
              auVar27._8_4_ = uVar3;
              auVar27._12_4_ = uVar3;
              auVar91 = vsubps_avx512vl(*(undefined1 (*) [16])*pauVar76,auVar27);
              auVar91 = vminps_avx(auVar91,auVar241);
              auVar91 = vmaxps_avx(auVar91,auVar215);
              auVar92 = vfmadd231ps_fma(auVar88,auVar91,auVar207);
              auVar93 = vcvttps2dq_avx512vl(auVar92);
              auVar93 = vcvtdq2ps_avx512vl(auVar93);
              uVar82 = vcmpps_avx512vl(auVar92,auVar93,1);
              auVar92 = vaddps_avx512vl(auVar93,auVar89);
              bVar6 = (bool)((byte)uVar82 & 1);
              auVar102._0_4_ = (uint)bVar6 * auVar92._0_4_ | (uint)!bVar6 * auVar93._0_4_;
              bVar6 = (bool)((byte)(uVar82 >> 1) & 1);
              auVar102._4_4_ = (uint)bVar6 * auVar92._4_4_ | (uint)!bVar6 * auVar93._4_4_;
              bVar6 = (bool)((byte)(uVar82 >> 2) & 1);
              auVar102._8_4_ = (uint)bVar6 * auVar92._8_4_ | (uint)!bVar6 * auVar93._8_4_;
              bVar6 = (bool)((byte)(uVar82 >> 3) & 1);
              auVar102._12_4_ = (uint)bVar6 * auVar92._12_4_ | (uint)!bVar6 * auVar93._12_4_;
              auVar91 = vfmsub231ps_avx512vl(auVar91,auVar102,auVar261);
              auVar91 = vfmsub231ps_avx512vl(auVar91,auVar102,auVar90);
              auVar258._0_4_ = auVar91._0_4_ * auVar91._0_4_;
              auVar258._4_4_ = auVar91._4_4_ * auVar91._4_4_;
              auVar258._8_4_ = auVar91._8_4_ * auVar91._8_4_;
              auVar258._12_4_ = auVar91._12_4_ * auVar91._12_4_;
              auVar92 = vfmadd213ps_avx512vl(auVar234,auVar91,auVar264);
              auVar92 = vfmadd213ps_avx512vl(auVar92,auVar91,auVar267);
              auVar92 = vfmadd213ps_avx512vl(auVar92,auVar91,auVar220);
              auVar92 = vfmadd213ps_avx512vl(auVar92,auVar91,auVar246);
              auVar92 = vfmadd213ps_avx512vl(auVar92,auVar91,auVar88);
              auVar92 = vfmadd213ps_avx512vl(auVar92,auVar258,auVar91);
              auVar91 = vcvttps2dq_avx512vl(auVar102);
              auVar91 = vpslld_avx(auVar91,0x17);
              auVar91 = vpaddd_avx(auVar91,auVar250);
              auVar92 = vfmadd213ps_avx512vl(auVar91,auVar92,auVar91);
              *(undefined1 (*) [16])*pauVar76 = auVar92;
              auVar91 = vshufpd_avx(auVar92,auVar92,1);
              auVar254._0_4_ = auVar91._0_4_ + auVar92._0_4_;
              auVar254._4_4_ = auVar91._4_4_ + auVar92._4_4_;
              auVar254._8_4_ = auVar91._8_4_ + auVar92._8_4_;
              auVar254._12_4_ = auVar91._12_4_ + auVar92._12_4_;
              auVar91 = vmovshdup_avx(auVar254);
              *(float *)(*pauVar80 + lVar84 * 4) =
                   auVar91._0_4_ + *(float *)(*pauVar80 + lVar84 * 4) + auVar254._0_4_;
              pauVar76 = (undefined1 (*) [64])(*pauVar76 + 0x10);
              lVar84 = lVar84 + 1;
            } while (size1 - uVar77 != (int)lVar84);
          }
          uVar78 = uVar78 + 1;
          auVar143 = vmovdqa64_avx512f((undefined1  [64])::_pi32_512_0x7f);
        } while (uVar78 != (uint)elemcount);
      }
      uVar77 = 0;
      pauVar76 = (undefined1 (*) [64])_sumptr;
      if (0xf < size1) {
        iVar79 = 0xf;
        auVar141 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
        do {
          auVar142 = vdivps_avx512f(auVar141,*pauVar76);
          *pauVar76 = auVar142;
          pauVar76 = pauVar76 + 1;
          iVar79 = iVar79 + 0x10;
        } while (iVar79 < size1);
        uVar77 = size1 & 0x7ffffff0;
      }
      if ((int)(uVar77 | 7) < size1) {
        auVar198._8_4_ = 0x3f800000;
        auVar198._0_8_ = 0x3f8000003f800000;
        auVar198._12_4_ = 0x3f800000;
        auVar198._16_4_ = 0x3f800000;
        auVar198._20_4_ = 0x3f800000;
        auVar198._24_4_ = 0x3f800000;
        auVar198._28_4_ = 0x3f800000;
        uVar81 = uVar77;
        do {
          auVar104 = vdivps_avx(auVar198,*(undefined1 (*) [32])*pauVar76);
          *(undefined1 (*) [32])*pauVar76 = auVar104;
          pauVar76 = (undefined1 (*) [64])(*pauVar76 + 0x20);
          uVar77 = uVar81 + 8;
          iVar79 = uVar81 + 0xf;
          uVar81 = uVar77;
        } while (iVar79 < size1);
      }
      if ((int)(uVar77 | 3) < size1) {
        auVar195._8_4_ = 0x3f800000;
        auVar195._0_8_ = 0x3f8000003f800000;
        auVar195._12_4_ = 0x3f800000;
        uVar81 = uVar77;
        do {
          auVar88 = vdivps_avx(auVar195,*(undefined1 (*) [16])*pauVar76);
          *(undefined1 (*) [16])*pauVar76 = auVar88;
          pauVar76 = (undefined1 (*) [64])(*pauVar76 + 0x10);
          uVar77 = uVar81 + 4;
          iVar79 = uVar81 + 7;
          uVar81 = uVar77;
        } while (iVar79 < size1);
      }
      if ((int)uVar77 < size1) {
        auVar141 = vpbroadcastq_avx512f();
        uVar78 = 0;
        auVar142 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
        auVar143 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
        auVar144 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
        do {
          auVar145 = vpbroadcastq_avx512f();
          auVar146 = vporq_avx512f(auVar145,auVar142);
          auVar145 = vporq_avx512f(auVar145,auVar143);
          uVar21 = vpcmpuq_avx512f(auVar145,auVar141,2);
          bVar61 = (byte)uVar21;
          uVar21 = vpcmpuq_avx512f(auVar146,auVar141,2);
          bVar64 = (byte)uVar21;
          uVar87 = CONCAT11(bVar64,bVar61);
          piVar2 = (int *)(*pauVar76 + uVar78 * 4);
          auVar188._4_4_ = (uint)((byte)(uVar87 >> 1) & 1) * piVar2[1];
          auVar188._0_4_ = (uint)(bVar61 & 1) * *piVar2;
          auVar188._8_4_ = (uint)((byte)(uVar87 >> 2) & 1) * piVar2[2];
          auVar188._12_4_ = (uint)((byte)(uVar87 >> 3) & 1) * piVar2[3];
          auVar188._16_4_ = (uint)((byte)(uVar87 >> 4) & 1) * piVar2[4];
          auVar188._20_4_ = (uint)((byte)(uVar87 >> 5) & 1) * piVar2[5];
          auVar188._24_4_ = (uint)((byte)(uVar87 >> 6) & 1) * piVar2[6];
          auVar188._28_4_ = (uint)((byte)(uVar87 >> 7) & 1) * piVar2[7];
          auVar188._32_4_ = (uint)(bVar64 & 1) * piVar2[8];
          auVar188._36_4_ = (uint)(bVar64 >> 1 & 1) * piVar2[9];
          auVar188._40_4_ = (uint)(bVar64 >> 2 & 1) * piVar2[10];
          auVar188._44_4_ = (uint)(bVar64 >> 3 & 1) * piVar2[0xb];
          auVar188._48_4_ = (uint)(bVar64 >> 4 & 1) * piVar2[0xc];
          auVar188._52_4_ = (uint)(bVar64 >> 5 & 1) * piVar2[0xd];
          auVar188._56_4_ = (uint)(bVar64 >> 6 & 1) * piVar2[0xe];
          auVar188._60_4_ = (uint)(bVar64 >> 7) * piVar2[0xf];
          auVar145 = vdivps_avx512f(auVar144,auVar188);
          puVar1 = (uint *)(*pauVar76 + uVar78 * 4);
          bVar6 = (bool)((byte)(uVar87 >> 1) & 1);
          bVar7 = (bool)((byte)(uVar87 >> 2) & 1);
          bVar8 = (bool)((byte)(uVar87 >> 3) & 1);
          bVar9 = (bool)((byte)(uVar87 >> 4) & 1);
          bVar10 = (bool)((byte)(uVar87 >> 5) & 1);
          bVar11 = (bool)((byte)(uVar87 >> 6) & 1);
          bVar12 = (bool)((byte)(uVar87 >> 7) & 1);
          bVar13 = (bool)(bVar64 >> 1 & 1);
          bVar14 = (bool)(bVar64 >> 2 & 1);
          bVar15 = (bool)(bVar64 >> 3 & 1);
          bVar16 = (bool)(bVar64 >> 4 & 1);
          bVar17 = (bool)(bVar64 >> 5 & 1);
          bVar18 = (bool)(bVar64 >> 6 & 1);
          *puVar1 = (uint)(bVar61 & 1) * auVar145._0_4_ | (uint)!(bool)(bVar61 & 1) * *puVar1;
          puVar1[1] = (uint)bVar6 * auVar145._4_4_ | (uint)!bVar6 * puVar1[1];
          puVar1[2] = (uint)bVar7 * auVar145._8_4_ | (uint)!bVar7 * puVar1[2];
          puVar1[3] = (uint)bVar8 * auVar145._12_4_ | (uint)!bVar8 * puVar1[3];
          puVar1[4] = (uint)bVar9 * auVar145._16_4_ | (uint)!bVar9 * puVar1[4];
          puVar1[5] = (uint)bVar10 * auVar145._20_4_ | (uint)!bVar10 * puVar1[5];
          puVar1[6] = (uint)bVar11 * auVar145._24_4_ | (uint)!bVar11 * puVar1[6];
          puVar1[7] = (uint)bVar12 * auVar145._28_4_ | (uint)!bVar12 * puVar1[7];
          puVar1[8] = (uint)(bVar64 & 1) * auVar145._32_4_ | (uint)!(bool)(bVar64 & 1) * puVar1[8];
          puVar1[9] = (uint)bVar13 * auVar145._36_4_ | (uint)!bVar13 * puVar1[9];
          puVar1[10] = (uint)bVar14 * auVar145._40_4_ | (uint)!bVar14 * puVar1[10];
          puVar1[0xb] = (uint)bVar15 * auVar145._44_4_ | (uint)!bVar15 * puVar1[0xb];
          puVar1[0xc] = (uint)bVar16 * auVar145._48_4_ | (uint)!bVar16 * puVar1[0xc];
          puVar1[0xd] = (uint)bVar17 * auVar145._52_4_ | (uint)!bVar17 * puVar1[0xd];
          puVar1[0xe] = (uint)bVar18 * auVar145._56_4_ | (uint)!bVar18 * puVar1[0xe];
          puVar1[0xf] = (uint)(bVar64 >> 7) * auVar145._60_4_ |
                        (uint)!(bool)(bVar64 >> 7) * puVar1[0xf];
          uVar78 = uVar78 + 0x10;
        } while (((ulong)(~uVar77 + size1) + 0x10 & 0xfffffffffffffff0) != uVar78);
      }
      auVar144 = _DAT_005ab640;
      auVar143 = _DAT_005ab600;
      auVar142 = _DAT_005ab5c0;
      auVar141 = _DAT_005ab580;
      if (0 < elemcount) {
        uVar78 = 0;
        do {
          pauVar76 = (undefined1 (*) [64])(_ptr + uVar78 * (long)stride);
          pauVar80 = (undefined1 (*) [64])_sumptr;
          if (size1 < 0x10) {
            uVar77 = 0;
          }
          else {
            iVar79 = 0xf;
            do {
              auVar145 = *pauVar80;
              auVar146 = vpermps_avx512f(auVar141,auVar145);
              auVar189 = vpermps_avx512f(auVar142,auVar145);
              auVar190 = vpermps_avx512f(auVar143,auVar145);
              auVar145 = vpermps_avx512f(auVar144,auVar145);
              auVar146 = vmulps_avx512f(auVar146,*pauVar76);
              auVar189 = vmulps_avx512f(auVar189,pauVar76[1]);
              auVar190 = vmulps_avx512f(auVar190,pauVar76[2]);
              auVar145 = vmulps_avx512f(auVar145,pauVar76[3]);
              *pauVar76 = auVar146;
              pauVar76[1] = auVar189;
              pauVar76[2] = auVar190;
              pauVar76[3] = auVar145;
              pauVar76 = pauVar76 + 4;
              pauVar80 = pauVar80 + 1;
              iVar79 = iVar79 + 0x10;
              uVar77 = size1 & 0xfffffff0;
            } while (iVar79 < size1);
          }
          uVar81 = uVar77 | 7;
          while ((int)uVar81 < size1) {
            fVar193 = *(float *)*pauVar80;
            fVar5 = *(float *)(*pauVar80 + 4);
            auVar65._4_4_ = fVar193 * *(float *)(*pauVar76 + 4);
            auVar65._0_4_ = fVar193 * *(float *)*pauVar76;
            auVar65._8_4_ = fVar193 * *(float *)(*pauVar76 + 8);
            auVar65._12_4_ = fVar193 * *(float *)(*pauVar76 + 0xc);
            auVar65._16_4_ = fVar5 * *(float *)(*pauVar76 + 0x10);
            auVar65._20_4_ = fVar5 * *(float *)(*pauVar76 + 0x14);
            auVar65._24_4_ = fVar5 * *(float *)(*pauVar76 + 0x18);
            auVar65._28_4_ = fVar5;
            fVar193 = *(float *)(*pauVar80 + 8);
            fVar5 = *(float *)(*pauVar80 + 0xc);
            auVar66._4_4_ = fVar193 * *(float *)(*pauVar76 + 0x24);
            auVar66._0_4_ = fVar193 * *(float *)(*pauVar76 + 0x20);
            auVar66._8_4_ = fVar193 * *(float *)(*pauVar76 + 0x28);
            auVar66._12_4_ = fVar193 * *(float *)(*pauVar76 + 0x2c);
            auVar66._16_4_ = fVar5 * *(float *)(*pauVar76 + 0x30);
            auVar66._20_4_ = fVar5 * *(float *)(*pauVar76 + 0x34);
            auVar66._24_4_ = fVar5 * *(float *)(*pauVar76 + 0x38);
            auVar66._28_4_ = fVar5;
            fVar193 = *(float *)(*pauVar80 + 0x10);
            fVar5 = *(float *)(*pauVar80 + 0x14);
            auVar67._4_4_ = fVar193 * *(float *)(pauVar76[1] + 4);
            auVar67._0_4_ = fVar193 * *(float *)pauVar76[1];
            auVar67._8_4_ = fVar193 * *(float *)(pauVar76[1] + 8);
            auVar67._12_4_ = fVar193 * *(float *)(pauVar76[1] + 0xc);
            auVar67._16_4_ = fVar5 * *(float *)(pauVar76[1] + 0x10);
            auVar67._20_4_ = fVar5 * *(float *)(pauVar76[1] + 0x14);
            auVar67._24_4_ = fVar5 * *(float *)(pauVar76[1] + 0x18);
            auVar67._28_4_ = fVar5;
            fVar193 = *(float *)(*pauVar80 + 0x18);
            fVar5 = *(float *)(*pauVar80 + 0x1c);
            auVar68._4_4_ = fVar193 * *(float *)(pauVar76[1] + 0x24);
            auVar68._0_4_ = fVar193 * *(float *)(pauVar76[1] + 0x20);
            auVar68._8_4_ = fVar193 * *(float *)(pauVar76[1] + 0x28);
            auVar68._12_4_ = fVar193 * *(float *)(pauVar76[1] + 0x2c);
            auVar68._16_4_ = fVar5 * *(float *)(pauVar76[1] + 0x30);
            auVar68._20_4_ = fVar5 * *(float *)(pauVar76[1] + 0x34);
            auVar68._24_4_ = fVar5 * *(float *)(pauVar76[1] + 0x38);
            auVar68._28_4_ = fVar5;
            *(undefined1 (*) [32])*pauVar76 = auVar65;
            *(undefined1 (*) [32])(*pauVar76 + 0x20) = auVar66;
            *(undefined1 (*) [32])pauVar76[1] = auVar67;
            *(undefined1 (*) [32])(pauVar76[1] + 0x20) = auVar68;
            pauVar76 = pauVar76 + 2;
            pauVar80 = (undefined1 (*) [64])(*pauVar80 + 0x20);
            uVar81 = uVar77 + 0xf;
            uVar77 = uVar77 + 8;
          }
          uVar81 = uVar77 | 3;
          while ((int)uVar81 < size1) {
            fVar193 = *(float *)*pauVar80;
            auVar227._0_4_ = fVar193 * *(float *)*pauVar76;
            auVar227._4_4_ = fVar193 * *(float *)(*pauVar76 + 4);
            auVar227._8_4_ = fVar193 * *(float *)(*pauVar76 + 8);
            auVar227._12_4_ = fVar193 * *(float *)(*pauVar76 + 0xc);
            fVar193 = *(float *)(*pauVar80 + 4);
            auVar229._0_4_ = fVar193 * *(float *)(*pauVar76 + 0x10);
            auVar229._4_4_ = fVar193 * *(float *)(*pauVar76 + 0x14);
            auVar229._8_4_ = fVar193 * *(float *)(*pauVar76 + 0x18);
            auVar229._12_4_ = fVar193 * *(float *)(*pauVar76 + 0x1c);
            fVar193 = *(float *)(*pauVar80 + 8);
            auVar233._0_4_ = fVar193 * *(float *)(*pauVar76 + 0x20);
            auVar233._4_4_ = fVar193 * *(float *)(*pauVar76 + 0x24);
            auVar233._8_4_ = fVar193 * *(float *)(*pauVar76 + 0x28);
            auVar233._12_4_ = fVar193 * *(float *)(*pauVar76 + 0x2c);
            fVar193 = *(float *)(*pauVar80 + 0xc);
            auVar236._0_4_ = fVar193 * *(float *)(*pauVar76 + 0x30);
            auVar236._4_4_ = fVar193 * *(float *)(*pauVar76 + 0x34);
            auVar236._8_4_ = fVar193 * *(float *)(*pauVar76 + 0x38);
            auVar236._12_4_ = fVar193 * *(float *)(*pauVar76 + 0x3c);
            *(undefined1 (*) [16])*pauVar76 = auVar227;
            *(undefined1 (*) [16])(*pauVar76 + 0x10) = auVar229;
            *(undefined1 (*) [16])(*pauVar76 + 0x20) = auVar233;
            *(undefined1 (*) [16])(*pauVar76 + 0x30) = auVar236;
            pauVar76 = pauVar76 + 1;
            pauVar80 = (undefined1 (*) [64])(*pauVar80 + 0x10);
            uVar81 = uVar77 + 7;
            uVar77 = uVar77 + 4;
          }
          if ((int)uVar77 < size1) {
            lVar84 = 0;
            do {
              fVar193 = *(float *)(*pauVar80 + lVar84 * 4);
              auVar228._0_4_ = fVar193 * *(float *)*pauVar76;
              auVar228._4_4_ = fVar193 * *(float *)(*pauVar76 + 4);
              auVar228._8_4_ = fVar193 * *(float *)(*pauVar76 + 8);
              auVar228._12_4_ = fVar193 * *(float *)(*pauVar76 + 0xc);
              *(undefined1 (*) [16])*pauVar76 = auVar228;
              pauVar76 = (undefined1 (*) [64])(*pauVar76 + 0x10);
              lVar84 = lVar84 + 1;
            } while (size1 - uVar77 != (int)lVar84);
          }
          uVar78 = uVar78 + 1;
        } while (uVar78 != (uint)elemcount);
      }
    }
  }
  else if (elempack == 8) {
    if (0 < elemcount) {
      uVar78 = 0;
      do {
        pauVar76 = (undefined1 (*) [64])(_ptr + uVar78 * (long)stride);
        pauVar80 = (undefined1 (*) [64])_maxptr;
        if (size1 < 0x10) {
          uVar77 = 0;
        }
        else {
          iVar79 = 0xf;
          do {
            auVar141 = vunpcklps_avx512f(*pauVar76,pauVar76[1]);
            auVar143 = vunpckhps_avx512f(*pauVar76,pauVar76[1]);
            auVar141 = vmaxps_avx512f(auVar141,auVar143);
            auVar143 = vunpcklps_avx512f(pauVar76[2],pauVar76[3]);
            auVar144 = vunpckhps_avx512f(pauVar76[2],pauVar76[3]);
            auVar143 = vmaxps_avx512f(auVar143,auVar144);
            auVar144 = vunpcklps_avx512f(pauVar76[4],pauVar76[5]);
            auVar145 = vunpckhps_avx512f(pauVar76[4],pauVar76[5]);
            auVar144 = vmaxps_avx512f(auVar144,auVar145);
            auVar145 = vunpcklps_avx512f(pauVar76[6],pauVar76[7]);
            auVar146 = vunpckhps_avx512f(pauVar76[6],pauVar76[7]);
            auVar145 = vmaxps_avx512f(auVar145,auVar146);
            auVar146 = vunpcklps_avx512f(auVar141,auVar143);
            auVar141 = vunpckhps_avx512f(auVar141,auVar143);
            auVar141 = vmaxps_avx512f(auVar146,auVar141);
            auVar143 = vunpcklps_avx512f(auVar144,auVar145);
            auVar144 = vunpckhps_avx512f(auVar144,auVar145);
            auVar143 = vmaxps_avx512f(auVar143,auVar144);
            auVar144 = vshuff64x2_avx512f(auVar141,auVar143,0x88);
            auVar141 = vshuff64x2_avx512f(auVar141,auVar143,0xdd);
            auVar141 = vmaxps_avx512f(auVar144,auVar141);
            auVar141 = vpermps_avx512f(auVar142,auVar141);
            auVar141 = vmaxps_avx512f(auVar141,*pauVar80);
            *pauVar80 = auVar141;
            pauVar76 = pauVar76 + 8;
            pauVar80 = pauVar80 + 1;
            iVar79 = iVar79 + 0x10;
            uVar77 = size1 & 0xfffffff0U;
          } while (iVar79 < size1);
        }
        uVar81 = uVar77 | 7;
        while ((int)uVar81 < size1) {
          auVar105 = vunpcklps_avx(*(undefined1 (*) [32])*pauVar76,*(undefined1 (*) [32])pauVar76[2]
                                  );
          auVar104 = vunpckhps_avx(*(undefined1 (*) [32])*pauVar76,*(undefined1 (*) [32])pauVar76[2]
                                  );
          auVar104 = vmaxps_avx(auVar105,auVar104);
          auVar106 = vunpcklps_avx(*(undefined1 (*) [32])pauVar76[1],
                                   *(undefined1 (*) [32])pauVar76[3]);
          auVar105 = vunpckhps_avx(*(undefined1 (*) [32])pauVar76[1],
                                   *(undefined1 (*) [32])pauVar76[3]);
          auVar105 = vmaxps_avx(auVar106,auVar105);
          auVar107 = vunpcklps_avx(*(undefined1 (*) [32])(*pauVar76 + 0x20),
                                   *(undefined1 (*) [32])(pauVar76[2] + 0x20));
          auVar106 = vunpckhps_avx(*(undefined1 (*) [32])(*pauVar76 + 0x20),
                                   *(undefined1 (*) [32])(pauVar76[2] + 0x20));
          auVar106 = vmaxps_avx(auVar107,auVar106);
          auVar108 = vunpcklps_avx(*(undefined1 (*) [32])(pauVar76[1] + 0x20),
                                   *(undefined1 (*) [32])(pauVar76[3] + 0x20));
          auVar107 = vunpckhps_avx(*(undefined1 (*) [32])(pauVar76[1] + 0x20),
                                   *(undefined1 (*) [32])(pauVar76[3] + 0x20));
          auVar107 = vmaxps_avx(auVar108,auVar107);
          auVar108 = vunpcklps_avx(auVar104,auVar105);
          auVar104 = vunpckhps_avx(auVar104,auVar105);
          auVar104 = vmaxps_avx(auVar108,auVar104);
          auVar108 = vunpcklps_avx(auVar106,auVar107);
          auVar105 = vunpckhps_avx(auVar106,auVar107);
          auVar105 = vmaxps_avx(auVar108,auVar105);
          auVar106 = vunpcklps_avx(auVar104,auVar105);
          auVar104 = vunpckhps_avx(auVar104,auVar105);
          auVar105._16_16_ = auVar104._0_16_;
          auVar105._0_16_ = auVar106._0_16_;
          auVar104 = vperm2f128_avx(auVar106,auVar104,0x31);
          auVar104 = vmaxps_avx(auVar105,auVar104);
          auVar104 = vmaxps_avx(auVar104,*(undefined1 (*) [32])*pauVar80);
          *(undefined1 (*) [32])*pauVar80 = auVar104;
          pauVar76 = pauVar76 + 4;
          pauVar80 = (undefined1 (*) [64])(*pauVar80 + 0x20);
          uVar81 = uVar77 + 0xf;
          uVar77 = uVar77 + 8;
        }
        if ((int)uVar77 < size1) {
          lVar84 = 0;
          do {
            auVar88 = vmaxps_avx(*(undefined1 (*) [16])(*pauVar76 + 0x10),
                                 *(undefined1 (*) [16])*pauVar76);
            auVar89 = vshufpd_avx(auVar88,auVar88,3);
            auVar88 = vmaxps_avx(auVar88,auVar89);
            auVar89 = vmovshdup_avx(auVar88);
            auVar88 = vmaxss_avx(auVar88,auVar89);
            auVar88 = vmaxss_avx(auVar88,ZEXT416(*(uint *)(*pauVar80 + lVar84 * 4)));
            *(int *)(*pauVar80 + lVar84 * 4) = auVar88._0_4_;
            pauVar76 = (undefined1 (*) [64])(*pauVar76 + 0x20);
            lVar84 = lVar84 + 1;
          } while (size1 - uVar77 != (int)lVar84);
        }
        afVar75 = ::_ps512_cephes_exp_p5;
        uVar78 = uVar78 + 1;
      } while (uVar78 != (uint)elemcount);
      auVar141 = vbroadcastss_avx512f(ZEXT416(0x80000000));
      auVar147 = vxorps_avx512dq(auVar141,(undefined1  [64])::_ps512_cephes_exp_C1);
      auVar148 = vxorps_avx512dq(auVar141,(undefined1  [64])::_ps512_cephes_exp_C2);
      uVar78 = 0;
      auVar104 = vbroadcastss_avx512vl(ZEXT416(0xc2b0c0a5));
      auVar157 = ZEXT3264(auVar104);
      auVar141 = ZEXT3264(CONCAT428(0x3f000000,
                                    CONCAT424(0x3f000000,
                                              CONCAT420(0x3f000000,
                                                        CONCAT416(0x3f000000,
                                                                  CONCAT412(0x3f000000,
                                                                            CONCAT48(0x3f000000,
                                                                                                                                                                          
                                                  0x3f0000003f000000)))))));
      auVar104 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar143 = ZEXT3264(auVar104);
      auVar104 = vbroadcastss_avx512vl(ZEXT416(0x3f318000));
      auVar144 = ZEXT3264(auVar104);
      auVar104 = vbroadcastss_avx512vl(ZEXT416(0xb95e8083));
      auVar145 = ZEXT3264(auVar104);
      auVar104 = vbroadcastss_avx512vl(ZEXT416(0x3ab743ce));
      auVar142 = ZEXT3264(auVar104);
      auVar104 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
      auVar189 = ZEXT3264(auVar104);
      auVar104 = vbroadcastss_avx512vl(ZEXT416(0x3c088908));
      auVar190 = ZEXT3264(auVar104);
      auVar104 = vbroadcastss_avx512vl(ZEXT416(0x3d2aa9c1));
      auVar146 = ZEXT3264(auVar104);
      auVar104 = vpbroadcastd_avx512vl(ZEXT416(0x3f800000));
      auVar150 = ZEXT3264(auVar104);
      do {
        pauVar76 = (undefined1 (*) [64])(_ptr + uVar78 * (long)stride);
        pauVar80 = (undefined1 (*) [64])_sumptr;
        pfVar83 = _maxptr;
        if (size1 < 0x10) {
          uVar77 = 0;
        }
        else {
          iVar79 = 0xf;
          afVar271 = ::_ps512_1;
          do {
            afVar270 = ::_ps512_1;
            fVar193 = *pfVar83;
            fVar5 = pfVar83[1];
            auVar109._4_4_ = fVar5;
            auVar109._0_4_ = fVar5;
            auVar109._8_4_ = fVar5;
            auVar109._12_4_ = fVar5;
            auVar109._16_4_ = fVar5;
            auVar109._20_4_ = fVar5;
            auVar109._24_4_ = fVar5;
            auVar109._28_4_ = fVar5;
            fVar5 = pfVar83[2];
            fVar4 = pfVar83[3];
            auVar111._4_4_ = fVar4;
            auVar111._0_4_ = fVar4;
            auVar111._8_4_ = fVar4;
            auVar111._12_4_ = fVar4;
            auVar111._16_4_ = fVar4;
            auVar111._20_4_ = fVar4;
            auVar111._24_4_ = fVar4;
            auVar111._28_4_ = fVar4;
            auVar104 = vbroadcastss_avx512vl(ZEXT416((uint)pfVar83[4]));
            auVar105 = vbroadcastss_avx512vl(ZEXT416((uint)pfVar83[5]));
            auVar106 = vbroadcastss_avx512vl(ZEXT416((uint)pfVar83[6]));
            auVar107 = vbroadcastss_avx512vl(ZEXT416((uint)pfVar83[7]));
            auVar108 = vbroadcastss_avx512vl(ZEXT416((uint)pfVar83[8]));
            auVar141 = vinsertf64x4_avx512f
                                 (ZEXT3264(CONCAT428(fVar193,CONCAT424(fVar193,CONCAT420(fVar193,
                                                  CONCAT416(fVar193,CONCAT412(fVar193,CONCAT48(
                                                  fVar193,CONCAT44(fVar193,fVar193)))))))),auVar109,
                                  1);
            fVar193 = pfVar83[9];
            auVar110._4_4_ = fVar193;
            auVar110._0_4_ = fVar193;
            auVar110._8_4_ = fVar193;
            auVar110._12_4_ = fVar193;
            auVar110._16_4_ = fVar193;
            auVar110._20_4_ = fVar193;
            auVar110._24_4_ = fVar193;
            auVar110._28_4_ = fVar193;
            auVar141 = vsubps_avx512f(*pauVar76,auVar141);
            auVar142 = vinsertf64x4_avx512f
                                 (ZEXT3264(CONCAT428(fVar5,CONCAT424(fVar5,CONCAT420(fVar5,CONCAT416
                                                  (fVar5,CONCAT412(fVar5,CONCAT48(fVar5,CONCAT44(
                                                  fVar5,fVar5)))))))),auVar111,1);
            fVar193 = pfVar83[10];
            auVar142 = vsubps_avx512f(pauVar76[1],auVar142);
            auVar143 = vinsertf64x4_avx512f(ZEXT3264(auVar104),auVar105,1);
            fVar5 = pfVar83[0xb];
            auVar112._4_4_ = fVar5;
            auVar112._0_4_ = fVar5;
            auVar112._8_4_ = fVar5;
            auVar112._12_4_ = fVar5;
            auVar112._16_4_ = fVar5;
            auVar112._20_4_ = fVar5;
            auVar112._24_4_ = fVar5;
            auVar112._28_4_ = fVar5;
            auVar143 = vsubps_avx512f(pauVar76[2],auVar143);
            auVar144 = vinsertf64x4_avx512f(ZEXT3264(auVar106),auVar107,1);
            auVar104 = vbroadcastss_avx512vl(ZEXT416((uint)pfVar83[0xc]));
            auVar144 = vsubps_avx512f(pauVar76[3],auVar144);
            auVar145 = vinsertf64x4_avx512f(ZEXT3264(auVar108),auVar110,1);
            fVar5 = pfVar83[0xd];
            auVar106._4_4_ = fVar5;
            auVar106._0_4_ = fVar5;
            auVar106._8_4_ = fVar5;
            auVar106._12_4_ = fVar5;
            auVar106._16_4_ = fVar5;
            auVar106._20_4_ = fVar5;
            auVar106._24_4_ = fVar5;
            auVar106._28_4_ = fVar5;
            auVar145 = vsubps_avx512f(pauVar76[4],auVar145);
            auVar146 = vinsertf64x4_avx512f
                                 (ZEXT3264(CONCAT428(fVar193,CONCAT424(fVar193,CONCAT420(fVar193,
                                                  CONCAT416(fVar193,CONCAT412(fVar193,CONCAT48(
                                                  fVar193,CONCAT44(fVar193,fVar193)))))))),auVar112,
                                  1);
            fVar193 = pfVar83[0xe];
            auVar146 = vsubps_avx512f(pauVar76[5],auVar146);
            auVar189 = vinsertf64x4_avx512f(ZEXT3264(auVar104),auVar106,1);
            fVar5 = pfVar83[0xf];
            auVar107._4_4_ = fVar5;
            auVar107._0_4_ = fVar5;
            auVar107._8_4_ = fVar5;
            auVar107._12_4_ = fVar5;
            auVar107._16_4_ = fVar5;
            auVar107._20_4_ = fVar5;
            auVar107._24_4_ = fVar5;
            auVar107._28_4_ = fVar5;
            auVar189 = vsubps_avx512f(pauVar76[6],auVar189);
            auVar190 = vinsertf64x4_avx512f
                                 (ZEXT3264(CONCAT428(fVar193,CONCAT424(fVar193,CONCAT420(fVar193,
                                                  CONCAT416(fVar193,CONCAT412(fVar193,CONCAT48(
                                                  fVar193,CONCAT44(fVar193,fVar193)))))))),auVar107,
                                  1);
            auVar190 = vsubps_avx512f(pauVar76[7],auVar190);
            auVar141 = vminps_avx512f(auVar141,(undefined1  [64])::_ps512_exp_hi);
            auVar141 = vmaxps_avx512f(auVar141,(undefined1  [64])::_ps512_exp_lo);
            auVar157 = vfmadd213ps_avx512f((undefined1  [64])::_ps512_cephes_LOG2EF,auVar141,
                                           (undefined1  [64])afVar75);
            auVar150 = vrndscaleps_avx512f(auVar157,1);
            uVar82 = vcmpps_avx512f(auVar157,auVar150,1);
            auVar149 = vsubps_avx512f(auVar150,(undefined1  [64])afVar271);
            bVar6 = (bool)((byte)uVar82 & 1);
            auVar157._0_4_ = (uint)bVar6 * auVar149._0_4_ | (uint)!bVar6 * auVar150._0_4_;
            bVar6 = (bool)((byte)(uVar82 >> 1) & 1);
            auVar157._4_4_ = (uint)bVar6 * auVar149._4_4_ | (uint)!bVar6 * auVar150._4_4_;
            bVar6 = (bool)((byte)(uVar82 >> 2) & 1);
            auVar157._8_4_ = (uint)bVar6 * auVar149._8_4_ | (uint)!bVar6 * auVar150._8_4_;
            bVar6 = (bool)((byte)(uVar82 >> 3) & 1);
            auVar157._12_4_ = (uint)bVar6 * auVar149._12_4_ | (uint)!bVar6 * auVar150._12_4_;
            bVar6 = (bool)((byte)(uVar82 >> 4) & 1);
            auVar157._16_4_ = (uint)bVar6 * auVar149._16_4_ | (uint)!bVar6 * auVar150._16_4_;
            bVar6 = (bool)((byte)(uVar82 >> 5) & 1);
            auVar157._20_4_ = (uint)bVar6 * auVar149._20_4_ | (uint)!bVar6 * auVar150._20_4_;
            bVar6 = (bool)((byte)(uVar82 >> 6) & 1);
            auVar157._24_4_ = (uint)bVar6 * auVar149._24_4_ | (uint)!bVar6 * auVar150._24_4_;
            bVar6 = (bool)((byte)(uVar82 >> 7) & 1);
            auVar157._28_4_ = (uint)bVar6 * auVar149._28_4_ | (uint)!bVar6 * auVar150._28_4_;
            bVar6 = (bool)((byte)(uVar82 >> 8) & 1);
            auVar157._32_4_ = (uint)bVar6 * auVar149._32_4_ | (uint)!bVar6 * auVar150._32_4_;
            bVar6 = (bool)((byte)(uVar82 >> 9) & 1);
            auVar157._36_4_ = (uint)bVar6 * auVar149._36_4_ | (uint)!bVar6 * auVar150._36_4_;
            bVar6 = (bool)((byte)(uVar82 >> 10) & 1);
            auVar157._40_4_ = (uint)bVar6 * auVar149._40_4_ | (uint)!bVar6 * auVar150._40_4_;
            bVar6 = (bool)((byte)(uVar82 >> 0xb) & 1);
            auVar157._44_4_ = (uint)bVar6 * auVar149._44_4_ | (uint)!bVar6 * auVar150._44_4_;
            bVar6 = (bool)((byte)(uVar82 >> 0xc) & 1);
            auVar157._48_4_ = (uint)bVar6 * auVar149._48_4_ | (uint)!bVar6 * auVar150._48_4_;
            bVar6 = (bool)((byte)(uVar82 >> 0xd) & 1);
            auVar157._52_4_ = (uint)bVar6 * auVar149._52_4_ | (uint)!bVar6 * auVar150._52_4_;
            bVar6 = (bool)((byte)(uVar82 >> 0xe) & 1);
            auVar157._56_4_ = (uint)bVar6 * auVar149._56_4_ | (uint)!bVar6 * auVar150._56_4_;
            bVar6 = SUB81(uVar82 >> 0xf,0);
            auVar157._60_4_ = (uint)bVar6 * auVar149._60_4_ | (uint)!bVar6 * auVar150._60_4_;
            auVar141 = vfmadd231ps_avx512f(auVar141,auVar157,auVar147);
            auVar142 = vminps_avx512f(auVar142,(undefined1  [64])::_ps512_exp_hi);
            auVar141 = vfmadd231ps_avx512f(auVar141,auVar157,auVar148);
            auVar142 = vmaxps_avx512f(auVar142,(undefined1  [64])::_ps512_exp_lo);
            auVar150 = vfmadd213ps_avx512f((undefined1  [64])::_ps512_cephes_LOG2EF,auVar142,
                                           (undefined1  [64])afVar75);
            auVar149 = vmulps_avx512f(auVar141,auVar141);
            auVar151 = vrndscaleps_avx512f(auVar150,1);
            uVar82 = vcmpps_avx512f(auVar150,auVar151,1);
            auVar152 = vsubps_avx512f(auVar151,(undefined1  [64])afVar271);
            bVar6 = (bool)((byte)uVar82 & 1);
            auVar150._0_4_ = (uint)bVar6 * auVar152._0_4_ | (uint)!bVar6 * auVar151._0_4_;
            bVar6 = (bool)((byte)(uVar82 >> 1) & 1);
            auVar150._4_4_ = (uint)bVar6 * auVar152._4_4_ | (uint)!bVar6 * auVar151._4_4_;
            bVar6 = (bool)((byte)(uVar82 >> 2) & 1);
            auVar150._8_4_ = (uint)bVar6 * auVar152._8_4_ | (uint)!bVar6 * auVar151._8_4_;
            bVar6 = (bool)((byte)(uVar82 >> 3) & 1);
            auVar150._12_4_ = (uint)bVar6 * auVar152._12_4_ | (uint)!bVar6 * auVar151._12_4_;
            bVar6 = (bool)((byte)(uVar82 >> 4) & 1);
            auVar150._16_4_ = (uint)bVar6 * auVar152._16_4_ | (uint)!bVar6 * auVar151._16_4_;
            bVar6 = (bool)((byte)(uVar82 >> 5) & 1);
            auVar150._20_4_ = (uint)bVar6 * auVar152._20_4_ | (uint)!bVar6 * auVar151._20_4_;
            bVar6 = (bool)((byte)(uVar82 >> 6) & 1);
            auVar150._24_4_ = (uint)bVar6 * auVar152._24_4_ | (uint)!bVar6 * auVar151._24_4_;
            bVar6 = (bool)((byte)(uVar82 >> 7) & 1);
            auVar150._28_4_ = (uint)bVar6 * auVar152._28_4_ | (uint)!bVar6 * auVar151._28_4_;
            bVar6 = (bool)((byte)(uVar82 >> 8) & 1);
            auVar150._32_4_ = (uint)bVar6 * auVar152._32_4_ | (uint)!bVar6 * auVar151._32_4_;
            bVar6 = (bool)((byte)(uVar82 >> 9) & 1);
            auVar150._36_4_ = (uint)bVar6 * auVar152._36_4_ | (uint)!bVar6 * auVar151._36_4_;
            bVar6 = (bool)((byte)(uVar82 >> 10) & 1);
            auVar150._40_4_ = (uint)bVar6 * auVar152._40_4_ | (uint)!bVar6 * auVar151._40_4_;
            bVar6 = (bool)((byte)(uVar82 >> 0xb) & 1);
            auVar150._44_4_ = (uint)bVar6 * auVar152._44_4_ | (uint)!bVar6 * auVar151._44_4_;
            bVar6 = (bool)((byte)(uVar82 >> 0xc) & 1);
            auVar150._48_4_ = (uint)bVar6 * auVar152._48_4_ | (uint)!bVar6 * auVar151._48_4_;
            bVar6 = (bool)((byte)(uVar82 >> 0xd) & 1);
            auVar150._52_4_ = (uint)bVar6 * auVar152._52_4_ | (uint)!bVar6 * auVar151._52_4_;
            bVar6 = (bool)((byte)(uVar82 >> 0xe) & 1);
            auVar150._56_4_ = (uint)bVar6 * auVar152._56_4_ | (uint)!bVar6 * auVar151._56_4_;
            bVar6 = SUB81(uVar82 >> 0xf,0);
            auVar150._60_4_ = (uint)bVar6 * auVar152._60_4_ | (uint)!bVar6 * auVar151._60_4_;
            auVar142 = vfmadd231ps_avx512f(auVar142,auVar150,auVar147);
            auVar142 = vfmadd231ps_avx512f(auVar142,auVar150,auVar148);
            auVar143 = vminps_avx512f(auVar143,(undefined1  [64])::_ps512_exp_hi);
            auVar151 = vmulps_avx512f(auVar142,auVar142);
            auVar143 = vmaxps_avx512f(auVar143,(undefined1  [64])::_ps512_exp_lo);
            auVar152 = vfmadd213ps_avx512f((undefined1  [64])::_ps512_cephes_LOG2EF,auVar143,
                                           (undefined1  [64])afVar75);
            auVar158 = vrndscaleps_avx512f(auVar152,1);
            uVar82 = vcmpps_avx512f(auVar152,auVar158,1);
            auVar152 = vsubps_avx512f(auVar158,(undefined1  [64])::_ps512_1);
            bVar6 = (bool)((byte)uVar82 & 1);
            auVar159._0_4_ = (uint)bVar6 * auVar152._0_4_ | (uint)!bVar6 * auVar158._0_4_;
            bVar6 = (bool)((byte)(uVar82 >> 1) & 1);
            auVar159._4_4_ = (uint)bVar6 * auVar152._4_4_ | (uint)!bVar6 * auVar158._4_4_;
            bVar6 = (bool)((byte)(uVar82 >> 2) & 1);
            auVar159._8_4_ = (uint)bVar6 * auVar152._8_4_ | (uint)!bVar6 * auVar158._8_4_;
            bVar6 = (bool)((byte)(uVar82 >> 3) & 1);
            auVar159._12_4_ = (uint)bVar6 * auVar152._12_4_ | (uint)!bVar6 * auVar158._12_4_;
            bVar6 = (bool)((byte)(uVar82 >> 4) & 1);
            auVar159._16_4_ = (uint)bVar6 * auVar152._16_4_ | (uint)!bVar6 * auVar158._16_4_;
            bVar6 = (bool)((byte)(uVar82 >> 5) & 1);
            auVar159._20_4_ = (uint)bVar6 * auVar152._20_4_ | (uint)!bVar6 * auVar158._20_4_;
            bVar6 = (bool)((byte)(uVar82 >> 6) & 1);
            auVar159._24_4_ = (uint)bVar6 * auVar152._24_4_ | (uint)!bVar6 * auVar158._24_4_;
            bVar6 = (bool)((byte)(uVar82 >> 7) & 1);
            auVar159._28_4_ = (uint)bVar6 * auVar152._28_4_ | (uint)!bVar6 * auVar158._28_4_;
            bVar6 = (bool)((byte)(uVar82 >> 8) & 1);
            auVar159._32_4_ = (uint)bVar6 * auVar152._32_4_ | (uint)!bVar6 * auVar158._32_4_;
            bVar6 = (bool)((byte)(uVar82 >> 9) & 1);
            auVar159._36_4_ = (uint)bVar6 * auVar152._36_4_ | (uint)!bVar6 * auVar158._36_4_;
            bVar6 = (bool)((byte)(uVar82 >> 10) & 1);
            auVar159._40_4_ = (uint)bVar6 * auVar152._40_4_ | (uint)!bVar6 * auVar158._40_4_;
            bVar6 = (bool)((byte)(uVar82 >> 0xb) & 1);
            auVar159._44_4_ = (uint)bVar6 * auVar152._44_4_ | (uint)!bVar6 * auVar158._44_4_;
            bVar6 = (bool)((byte)(uVar82 >> 0xc) & 1);
            auVar159._48_4_ = (uint)bVar6 * auVar152._48_4_ | (uint)!bVar6 * auVar158._48_4_;
            bVar6 = (bool)((byte)(uVar82 >> 0xd) & 1);
            auVar159._52_4_ = (uint)bVar6 * auVar152._52_4_ | (uint)!bVar6 * auVar158._52_4_;
            bVar6 = (bool)((byte)(uVar82 >> 0xe) & 1);
            auVar159._56_4_ = (uint)bVar6 * auVar152._56_4_ | (uint)!bVar6 * auVar158._56_4_;
            bVar6 = SUB81(uVar82 >> 0xf,0);
            auVar159._60_4_ = (uint)bVar6 * auVar152._60_4_ | (uint)!bVar6 * auVar158._60_4_;
            auVar152 = vfmadd213ps_avx512f(auVar141,(undefined1  [64])::_ps512_cephes_exp_p0,
                                           (undefined1  [64])::_ps512_cephes_exp_p1);
            auVar143 = vfmadd231ps_avx512f(auVar143,auVar159,auVar147);
            auVar143 = vfmadd231ps_avx512f(auVar143,auVar159,auVar148);
            auVar158 = vmulps_avx512f(auVar143,auVar143);
            auVar161 = vfmadd213ps_avx512f(auVar142,(undefined1  [64])::_ps512_cephes_exp_p0,
                                           (undefined1  [64])::_ps512_cephes_exp_p1);
            auVar162 = vfmadd213ps_avx512f(auVar143,(undefined1  [64])::_ps512_cephes_exp_p0,
                                           (undefined1  [64])::_ps512_cephes_exp_p1);
            auVar144 = vminps_avx512f(auVar144,(undefined1  [64])::_ps512_exp_hi);
            auVar152 = vfmadd213ps_avx512f(auVar152,auVar141,
                                           (undefined1  [64])::_ps512_cephes_exp_p2);
            auVar144 = vmaxps_avx512f(auVar144,(undefined1  [64])::_ps512_exp_lo);
            auVar163 = vfmadd213ps_avx512f((undefined1  [64])::_ps512_cephes_LOG2EF,auVar144,
                                           (undefined1  [64])afVar75);
            auVar161 = vfmadd213ps_avx512f(auVar161,auVar142,
                                           (undefined1  [64])::_ps512_cephes_exp_p2);
            auVar165 = vrndscaleps_avx512f(auVar163,1);
            uVar82 = vcmpps_avx512f(auVar163,auVar165,1);
            auVar176 = vsubps_avx512f(auVar165,(undefined1  [64])::_ps512_1);
            bVar6 = (bool)((byte)uVar82 & 1);
            auVar163._0_4_ = (uint)bVar6 * auVar176._0_4_ | (uint)!bVar6 * auVar165._0_4_;
            bVar6 = (bool)((byte)(uVar82 >> 1) & 1);
            auVar163._4_4_ = (uint)bVar6 * auVar176._4_4_ | (uint)!bVar6 * auVar165._4_4_;
            bVar6 = (bool)((byte)(uVar82 >> 2) & 1);
            auVar163._8_4_ = (uint)bVar6 * auVar176._8_4_ | (uint)!bVar6 * auVar165._8_4_;
            bVar6 = (bool)((byte)(uVar82 >> 3) & 1);
            auVar163._12_4_ = (uint)bVar6 * auVar176._12_4_ | (uint)!bVar6 * auVar165._12_4_;
            bVar6 = (bool)((byte)(uVar82 >> 4) & 1);
            auVar163._16_4_ = (uint)bVar6 * auVar176._16_4_ | (uint)!bVar6 * auVar165._16_4_;
            bVar6 = (bool)((byte)(uVar82 >> 5) & 1);
            auVar163._20_4_ = (uint)bVar6 * auVar176._20_4_ | (uint)!bVar6 * auVar165._20_4_;
            bVar6 = (bool)((byte)(uVar82 >> 6) & 1);
            auVar163._24_4_ = (uint)bVar6 * auVar176._24_4_ | (uint)!bVar6 * auVar165._24_4_;
            bVar6 = (bool)((byte)(uVar82 >> 7) & 1);
            auVar163._28_4_ = (uint)bVar6 * auVar176._28_4_ | (uint)!bVar6 * auVar165._28_4_;
            bVar6 = (bool)((byte)(uVar82 >> 8) & 1);
            auVar163._32_4_ = (uint)bVar6 * auVar176._32_4_ | (uint)!bVar6 * auVar165._32_4_;
            bVar6 = (bool)((byte)(uVar82 >> 9) & 1);
            auVar163._36_4_ = (uint)bVar6 * auVar176._36_4_ | (uint)!bVar6 * auVar165._36_4_;
            bVar6 = (bool)((byte)(uVar82 >> 10) & 1);
            auVar163._40_4_ = (uint)bVar6 * auVar176._40_4_ | (uint)!bVar6 * auVar165._40_4_;
            bVar6 = (bool)((byte)(uVar82 >> 0xb) & 1);
            auVar163._44_4_ = (uint)bVar6 * auVar176._44_4_ | (uint)!bVar6 * auVar165._44_4_;
            bVar6 = (bool)((byte)(uVar82 >> 0xc) & 1);
            auVar163._48_4_ = (uint)bVar6 * auVar176._48_4_ | (uint)!bVar6 * auVar165._48_4_;
            bVar6 = (bool)((byte)(uVar82 >> 0xd) & 1);
            auVar163._52_4_ = (uint)bVar6 * auVar176._52_4_ | (uint)!bVar6 * auVar165._52_4_;
            bVar6 = (bool)((byte)(uVar82 >> 0xe) & 1);
            auVar163._56_4_ = (uint)bVar6 * auVar176._56_4_ | (uint)!bVar6 * auVar165._56_4_;
            bVar6 = SUB81(uVar82 >> 0xf,0);
            auVar163._60_4_ = (uint)bVar6 * auVar176._60_4_ | (uint)!bVar6 * auVar165._60_4_;
            auVar162 = vfmadd213ps_avx512f(auVar162,auVar143,
                                           (undefined1  [64])::_ps512_cephes_exp_p2);
            auVar144 = vfmadd231ps_avx512f(auVar144,auVar163,auVar147);
            auVar144 = vfmadd231ps_avx512f(auVar144,auVar163,auVar148);
            auVar165 = vmulps_avx512f(auVar144,auVar144);
            auVar152 = vfmadd213ps_avx512f(auVar152,auVar141,
                                           (undefined1  [64])::_ps512_cephes_exp_p3);
            auVar176 = vfmadd213ps_avx512f(auVar144,(undefined1  [64])::_ps512_cephes_exp_p0,
                                           (undefined1  [64])::_ps512_cephes_exp_p1);
            auVar176 = vfmadd213ps_avx512f(auVar176,auVar144,
                                           (undefined1  [64])::_ps512_cephes_exp_p2);
            auVar161 = vfmadd213ps_avx512f(auVar161,auVar142,
                                           (undefined1  [64])::_ps512_cephes_exp_p3);
            auVar145 = vminps_avx512f(auVar145,(undefined1  [64])::_ps512_exp_hi);
            auVar145 = vmaxps_avx512f(auVar145,(undefined1  [64])::_ps512_exp_lo);
            auVar162 = vfmadd213ps_avx512f(auVar162,auVar143,
                                           (undefined1  [64])::_ps512_cephes_exp_p3);
            auVar177 = vfmadd213ps_avx512f((undefined1  [64])::_ps512_cephes_LOG2EF,auVar145,
                                           (undefined1  [64])afVar75);
            auVar178 = vrndscaleps_avx512f(auVar177,1);
            uVar82 = vcmpps_avx512f(auVar177,auVar178,1);
            auVar176 = vfmadd213ps_avx512f(auVar176,auVar144,
                                           (undefined1  [64])::_ps512_cephes_exp_p3);
            auVar177 = vsubps_avx512f(auVar178,(undefined1  [64])::_ps512_1);
            bVar6 = (bool)((byte)uVar82 & 1);
            auVar181._0_4_ = (uint)bVar6 * auVar177._0_4_ | (uint)!bVar6 * auVar178._0_4_;
            bVar6 = (bool)((byte)(uVar82 >> 1) & 1);
            auVar181._4_4_ = (uint)bVar6 * auVar177._4_4_ | (uint)!bVar6 * auVar178._4_4_;
            bVar6 = (bool)((byte)(uVar82 >> 2) & 1);
            auVar181._8_4_ = (uint)bVar6 * auVar177._8_4_ | (uint)!bVar6 * auVar178._8_4_;
            bVar6 = (bool)((byte)(uVar82 >> 3) & 1);
            auVar181._12_4_ = (uint)bVar6 * auVar177._12_4_ | (uint)!bVar6 * auVar178._12_4_;
            bVar6 = (bool)((byte)(uVar82 >> 4) & 1);
            auVar181._16_4_ = (uint)bVar6 * auVar177._16_4_ | (uint)!bVar6 * auVar178._16_4_;
            bVar6 = (bool)((byte)(uVar82 >> 5) & 1);
            auVar181._20_4_ = (uint)bVar6 * auVar177._20_4_ | (uint)!bVar6 * auVar178._20_4_;
            bVar6 = (bool)((byte)(uVar82 >> 6) & 1);
            auVar181._24_4_ = (uint)bVar6 * auVar177._24_4_ | (uint)!bVar6 * auVar178._24_4_;
            bVar6 = (bool)((byte)(uVar82 >> 7) & 1);
            auVar181._28_4_ = (uint)bVar6 * auVar177._28_4_ | (uint)!bVar6 * auVar178._28_4_;
            bVar6 = (bool)((byte)(uVar82 >> 8) & 1);
            auVar181._32_4_ = (uint)bVar6 * auVar177._32_4_ | (uint)!bVar6 * auVar178._32_4_;
            bVar6 = (bool)((byte)(uVar82 >> 9) & 1);
            auVar181._36_4_ = (uint)bVar6 * auVar177._36_4_ | (uint)!bVar6 * auVar178._36_4_;
            bVar6 = (bool)((byte)(uVar82 >> 10) & 1);
            auVar181._40_4_ = (uint)bVar6 * auVar177._40_4_ | (uint)!bVar6 * auVar178._40_4_;
            bVar6 = (bool)((byte)(uVar82 >> 0xb) & 1);
            auVar181._44_4_ = (uint)bVar6 * auVar177._44_4_ | (uint)!bVar6 * auVar178._44_4_;
            bVar6 = (bool)((byte)(uVar82 >> 0xc) & 1);
            auVar181._48_4_ = (uint)bVar6 * auVar177._48_4_ | (uint)!bVar6 * auVar178._48_4_;
            bVar6 = (bool)((byte)(uVar82 >> 0xd) & 1);
            auVar181._52_4_ = (uint)bVar6 * auVar177._52_4_ | (uint)!bVar6 * auVar178._52_4_;
            bVar6 = (bool)((byte)(uVar82 >> 0xe) & 1);
            auVar181._56_4_ = (uint)bVar6 * auVar177._56_4_ | (uint)!bVar6 * auVar178._56_4_;
            bVar6 = SUB81(uVar82 >> 0xf,0);
            auVar181._60_4_ = (uint)bVar6 * auVar177._60_4_ | (uint)!bVar6 * auVar178._60_4_;
            auVar145 = vfmadd231ps_avx512f(auVar145,auVar181,auVar147);
            auVar145 = vfmadd231ps_avx512f(auVar145,auVar181,auVar148);
            auVar152 = vfmadd213ps_avx512f(auVar152,auVar141,
                                           (undefined1  [64])::_ps512_cephes_exp_p4);
            auVar177 = vmulps_avx512f(auVar145,auVar145);
            auVar178 = vfmadd213ps_avx512f(auVar145,(undefined1  [64])::_ps512_cephes_exp_p0,
                                           (undefined1  [64])::_ps512_cephes_exp_p1);
            auVar161 = vfmadd213ps_avx512f(auVar161,auVar142,
                                           (undefined1  [64])::_ps512_cephes_exp_p4);
            auVar178 = vfmadd213ps_avx512f(auVar178,auVar145,
                                           (undefined1  [64])::_ps512_cephes_exp_p2);
            auVar178 = vfmadd213ps_avx512f(auVar178,auVar145,
                                           (undefined1  [64])::_ps512_cephes_exp_p3);
            auVar146 = vminps_avx512f(auVar146,(undefined1  [64])::_ps512_exp_hi);
            auVar162 = vfmadd213ps_avx512f(auVar162,auVar143,
                                           (undefined1  [64])::_ps512_cephes_exp_p4);
            auVar146 = vmaxps_avx512f(auVar146,(undefined1  [64])::_ps512_exp_lo);
            auVar182 = vfmadd213ps_avx512f((undefined1  [64])::_ps512_cephes_LOG2EF,auVar146,
                                           (undefined1  [64])afVar75);
            auVar176 = vfmadd213ps_avx512f(auVar176,auVar144,
                                           (undefined1  [64])::_ps512_cephes_exp_p4);
            auVar183 = vrndscaleps_avx512f(auVar182,1);
            uVar82 = vcmpps_avx512f(auVar182,auVar183,1);
            auVar184 = vsubps_avx512f(auVar183,(undefined1  [64])::_ps512_1);
            bVar6 = (bool)((byte)uVar82 & 1);
            auVar182._0_4_ = (uint)bVar6 * auVar184._0_4_ | (uint)!bVar6 * auVar183._0_4_;
            bVar6 = (bool)((byte)(uVar82 >> 1) & 1);
            auVar182._4_4_ = (uint)bVar6 * auVar184._4_4_ | (uint)!bVar6 * auVar183._4_4_;
            bVar6 = (bool)((byte)(uVar82 >> 2) & 1);
            auVar182._8_4_ = (uint)bVar6 * auVar184._8_4_ | (uint)!bVar6 * auVar183._8_4_;
            bVar6 = (bool)((byte)(uVar82 >> 3) & 1);
            auVar182._12_4_ = (uint)bVar6 * auVar184._12_4_ | (uint)!bVar6 * auVar183._12_4_;
            bVar6 = (bool)((byte)(uVar82 >> 4) & 1);
            auVar182._16_4_ = (uint)bVar6 * auVar184._16_4_ | (uint)!bVar6 * auVar183._16_4_;
            bVar6 = (bool)((byte)(uVar82 >> 5) & 1);
            auVar182._20_4_ = (uint)bVar6 * auVar184._20_4_ | (uint)!bVar6 * auVar183._20_4_;
            bVar6 = (bool)((byte)(uVar82 >> 6) & 1);
            auVar182._24_4_ = (uint)bVar6 * auVar184._24_4_ | (uint)!bVar6 * auVar183._24_4_;
            bVar6 = (bool)((byte)(uVar82 >> 7) & 1);
            auVar182._28_4_ = (uint)bVar6 * auVar184._28_4_ | (uint)!bVar6 * auVar183._28_4_;
            bVar6 = (bool)((byte)(uVar82 >> 8) & 1);
            auVar182._32_4_ = (uint)bVar6 * auVar184._32_4_ | (uint)!bVar6 * auVar183._32_4_;
            bVar6 = (bool)((byte)(uVar82 >> 9) & 1);
            auVar182._36_4_ = (uint)bVar6 * auVar184._36_4_ | (uint)!bVar6 * auVar183._36_4_;
            bVar6 = (bool)((byte)(uVar82 >> 10) & 1);
            auVar182._40_4_ = (uint)bVar6 * auVar184._40_4_ | (uint)!bVar6 * auVar183._40_4_;
            bVar6 = (bool)((byte)(uVar82 >> 0xb) & 1);
            auVar182._44_4_ = (uint)bVar6 * auVar184._44_4_ | (uint)!bVar6 * auVar183._44_4_;
            bVar6 = (bool)((byte)(uVar82 >> 0xc) & 1);
            auVar182._48_4_ = (uint)bVar6 * auVar184._48_4_ | (uint)!bVar6 * auVar183._48_4_;
            bVar6 = (bool)((byte)(uVar82 >> 0xd) & 1);
            auVar182._52_4_ = (uint)bVar6 * auVar184._52_4_ | (uint)!bVar6 * auVar183._52_4_;
            bVar6 = (bool)((byte)(uVar82 >> 0xe) & 1);
            auVar182._56_4_ = (uint)bVar6 * auVar184._56_4_ | (uint)!bVar6 * auVar183._56_4_;
            bVar6 = SUB81(uVar82 >> 0xf,0);
            auVar182._60_4_ = (uint)bVar6 * auVar184._60_4_ | (uint)!bVar6 * auVar183._60_4_;
            auVar178 = vfmadd213ps_avx512f(auVar178,auVar145,
                                           (undefined1  [64])::_ps512_cephes_exp_p4);
            auVar146 = vfmadd231ps_avx512f(auVar146,auVar182,auVar147);
            auVar146 = vfmadd231ps_avx512f(auVar146,auVar182,auVar148);
            auVar183 = vmulps_avx512f(auVar146,auVar146);
            auVar152 = vfmadd213ps_avx512f(auVar152,auVar141,(undefined1  [64])afVar75);
            auVar184 = vfmadd213ps_avx512f(auVar146,(undefined1  [64])::_ps512_cephes_exp_p0,
                                           (undefined1  [64])::_ps512_cephes_exp_p1);
            auVar184 = vfmadd213ps_avx512f(auVar184,auVar146,
                                           (undefined1  [64])::_ps512_cephes_exp_p2);
            auVar161 = vfmadd213ps_avx512f(auVar161,auVar142,(undefined1  [64])afVar75);
            auVar184 = vfmadd213ps_avx512f(auVar184,auVar146,
                                           (undefined1  [64])::_ps512_cephes_exp_p3);
            auVar184 = vfmadd213ps_avx512f(auVar184,auVar146,
                                           (undefined1  [64])::_ps512_cephes_exp_p4);
            auVar189 = vminps_avx512f(auVar189,(undefined1  [64])::_ps512_exp_hi);
            auVar162 = vfmadd213ps_avx512f(auVar162,auVar143,(undefined1  [64])afVar75);
            auVar189 = vmaxps_avx512f(auVar189,(undefined1  [64])::_ps512_exp_lo);
            auVar185 = vfmadd213ps_avx512f((undefined1  [64])::_ps512_cephes_LOG2EF,auVar189,
                                           (undefined1  [64])afVar75);
            auVar176 = vfmadd213ps_avx512f(auVar176,auVar144,(undefined1  [64])afVar75);
            auVar186 = vrndscaleps_avx512f(auVar185,1);
            uVar82 = vcmpps_avx512f(auVar185,auVar186,1);
            auVar187 = vsubps_avx512f(auVar186,(undefined1  [64])::_ps512_1);
            bVar6 = (bool)((byte)uVar82 & 1);
            auVar185._0_4_ = (uint)bVar6 * auVar187._0_4_ | (uint)!bVar6 * auVar186._0_4_;
            bVar6 = (bool)((byte)(uVar82 >> 1) & 1);
            auVar185._4_4_ = (uint)bVar6 * auVar187._4_4_ | (uint)!bVar6 * auVar186._4_4_;
            bVar6 = (bool)((byte)(uVar82 >> 2) & 1);
            auVar185._8_4_ = (uint)bVar6 * auVar187._8_4_ | (uint)!bVar6 * auVar186._8_4_;
            bVar6 = (bool)((byte)(uVar82 >> 3) & 1);
            auVar185._12_4_ = (uint)bVar6 * auVar187._12_4_ | (uint)!bVar6 * auVar186._12_4_;
            bVar6 = (bool)((byte)(uVar82 >> 4) & 1);
            auVar185._16_4_ = (uint)bVar6 * auVar187._16_4_ | (uint)!bVar6 * auVar186._16_4_;
            bVar6 = (bool)((byte)(uVar82 >> 5) & 1);
            auVar185._20_4_ = (uint)bVar6 * auVar187._20_4_ | (uint)!bVar6 * auVar186._20_4_;
            bVar6 = (bool)((byte)(uVar82 >> 6) & 1);
            auVar185._24_4_ = (uint)bVar6 * auVar187._24_4_ | (uint)!bVar6 * auVar186._24_4_;
            bVar6 = (bool)((byte)(uVar82 >> 7) & 1);
            auVar185._28_4_ = (uint)bVar6 * auVar187._28_4_ | (uint)!bVar6 * auVar186._28_4_;
            bVar6 = (bool)((byte)(uVar82 >> 8) & 1);
            auVar185._32_4_ = (uint)bVar6 * auVar187._32_4_ | (uint)!bVar6 * auVar186._32_4_;
            bVar6 = (bool)((byte)(uVar82 >> 9) & 1);
            auVar185._36_4_ = (uint)bVar6 * auVar187._36_4_ | (uint)!bVar6 * auVar186._36_4_;
            bVar6 = (bool)((byte)(uVar82 >> 10) & 1);
            auVar185._40_4_ = (uint)bVar6 * auVar187._40_4_ | (uint)!bVar6 * auVar186._40_4_;
            bVar6 = (bool)((byte)(uVar82 >> 0xb) & 1);
            auVar185._44_4_ = (uint)bVar6 * auVar187._44_4_ | (uint)!bVar6 * auVar186._44_4_;
            bVar6 = (bool)((byte)(uVar82 >> 0xc) & 1);
            auVar185._48_4_ = (uint)bVar6 * auVar187._48_4_ | (uint)!bVar6 * auVar186._48_4_;
            bVar6 = (bool)((byte)(uVar82 >> 0xd) & 1);
            auVar185._52_4_ = (uint)bVar6 * auVar187._52_4_ | (uint)!bVar6 * auVar186._52_4_;
            bVar6 = (bool)((byte)(uVar82 >> 0xe) & 1);
            auVar185._56_4_ = (uint)bVar6 * auVar187._56_4_ | (uint)!bVar6 * auVar186._56_4_;
            bVar6 = SUB81(uVar82 >> 0xf,0);
            auVar185._60_4_ = (uint)bVar6 * auVar187._60_4_ | (uint)!bVar6 * auVar186._60_4_;
            auVar178 = vfmadd213ps_avx512f(auVar178,auVar145,(undefined1  [64])afVar75);
            auVar189 = vfmadd231ps_avx512f(auVar189,auVar185,auVar147);
            auVar189 = vfmadd231ps_avx512f(auVar189,auVar185,auVar148);
            auVar190 = vminps_avx512f((undefined1  [64])::_ps512_exp_hi,auVar190);
            auVar184 = vfmadd213ps_avx512f(auVar184,auVar146,(undefined1  [64])afVar75);
            auVar190 = vmaxps_avx512f(auVar190,(undefined1  [64])::_ps512_exp_lo);
            auVar186 = vfmadd213ps_avx512f((undefined1  [64])::_ps512_cephes_LOG2EF,auVar190,
                                           (undefined1  [64])afVar75);
            auVar141 = vfmadd132ps_avx512f(auVar152,auVar141,auVar149);
            auVar149 = vrndscaleps_avx512f(auVar186,1);
            uVar82 = vcmpps_avx512f(auVar186,auVar149,1);
            auVar152 = vmulps_avx512f(auVar189,auVar189);
            auVar142 = vfmadd132ps_avx512f(auVar161,auVar142,auVar151);
            auVar151 = vfmadd213ps_avx512f(auVar189,(undefined1  [64])::_ps512_cephes_exp_p0,
                                           (undefined1  [64])::_ps512_cephes_exp_p1);
            auVar151 = vfmadd213ps_avx512f(auVar151,auVar189,
                                           (undefined1  [64])::_ps512_cephes_exp_p2);
            auVar143 = vfmadd132ps_avx512f(auVar162,auVar143,auVar158);
            auVar151 = vfmadd213ps_avx512f(auVar151,auVar189,
                                           (undefined1  [64])::_ps512_cephes_exp_p3);
            auVar151 = vfmadd213ps_avx512f(auVar151,auVar189,
                                           (undefined1  [64])::_ps512_cephes_exp_p4);
            auVar151 = vfmadd213ps_avx512f(auVar151,auVar189,(undefined1  [64])afVar75);
            auVar144 = vfmadd132ps_avx512f(auVar176,auVar144,auVar165);
            auVar158 = vmovdqa64_avx512f((undefined1  [64])::_pi32_512_0x7f);
            auVar161 = vsubps_avx512f(auVar149,(undefined1  [64])::_ps512_1);
            bVar6 = (bool)((byte)uVar82 & 1);
            auVar162._0_4_ = (uint)bVar6 * auVar161._0_4_ | (uint)!bVar6 * auVar149._0_4_;
            bVar6 = (bool)((byte)(uVar82 >> 1) & 1);
            auVar162._4_4_ = (uint)bVar6 * auVar161._4_4_ | (uint)!bVar6 * auVar149._4_4_;
            bVar6 = (bool)((byte)(uVar82 >> 2) & 1);
            auVar162._8_4_ = (uint)bVar6 * auVar161._8_4_ | (uint)!bVar6 * auVar149._8_4_;
            bVar6 = (bool)((byte)(uVar82 >> 3) & 1);
            auVar162._12_4_ = (uint)bVar6 * auVar161._12_4_ | (uint)!bVar6 * auVar149._12_4_;
            bVar6 = (bool)((byte)(uVar82 >> 4) & 1);
            auVar162._16_4_ = (uint)bVar6 * auVar161._16_4_ | (uint)!bVar6 * auVar149._16_4_;
            bVar6 = (bool)((byte)(uVar82 >> 5) & 1);
            auVar162._20_4_ = (uint)bVar6 * auVar161._20_4_ | (uint)!bVar6 * auVar149._20_4_;
            bVar6 = (bool)((byte)(uVar82 >> 6) & 1);
            auVar162._24_4_ = (uint)bVar6 * auVar161._24_4_ | (uint)!bVar6 * auVar149._24_4_;
            bVar6 = (bool)((byte)(uVar82 >> 7) & 1);
            auVar162._28_4_ = (uint)bVar6 * auVar161._28_4_ | (uint)!bVar6 * auVar149._28_4_;
            bVar6 = (bool)((byte)(uVar82 >> 8) & 1);
            auVar162._32_4_ = (uint)bVar6 * auVar161._32_4_ | (uint)!bVar6 * auVar149._32_4_;
            bVar6 = (bool)((byte)(uVar82 >> 9) & 1);
            auVar162._36_4_ = (uint)bVar6 * auVar161._36_4_ | (uint)!bVar6 * auVar149._36_4_;
            bVar6 = (bool)((byte)(uVar82 >> 10) & 1);
            auVar162._40_4_ = (uint)bVar6 * auVar161._40_4_ | (uint)!bVar6 * auVar149._40_4_;
            bVar6 = (bool)((byte)(uVar82 >> 0xb) & 1);
            auVar162._44_4_ = (uint)bVar6 * auVar161._44_4_ | (uint)!bVar6 * auVar149._44_4_;
            bVar6 = (bool)((byte)(uVar82 >> 0xc) & 1);
            auVar162._48_4_ = (uint)bVar6 * auVar161._48_4_ | (uint)!bVar6 * auVar149._48_4_;
            bVar6 = (bool)((byte)(uVar82 >> 0xd) & 1);
            auVar162._52_4_ = (uint)bVar6 * auVar161._52_4_ | (uint)!bVar6 * auVar149._52_4_;
            bVar6 = (bool)((byte)(uVar82 >> 0xe) & 1);
            auVar162._56_4_ = (uint)bVar6 * auVar161._56_4_ | (uint)!bVar6 * auVar149._56_4_;
            bVar6 = SUB81(uVar82 >> 0xf,0);
            auVar162._60_4_ = (uint)bVar6 * auVar161._60_4_ | (uint)!bVar6 * auVar149._60_4_;
            auVar190 = vfmadd231ps_avx512f(auVar190,auVar162,auVar147);
            auVar190 = vfmadd231ps_avx512f(auVar190,auVar162,auVar148);
            auVar145 = vfmadd132ps_avx512f(auVar178,auVar145,auVar177);
            auVar149 = vmulps_avx512f(auVar190,auVar190);
            auVar161 = vfmadd213ps_avx512f(auVar190,(undefined1  [64])::_ps512_cephes_exp_p0,
                                           (undefined1  [64])::_ps512_cephes_exp_p1);
            auVar146 = vfmadd213ps_avx512f(auVar184,auVar183,auVar146);
            auVar161 = vfmadd213ps_avx512f(auVar161,auVar190,
                                           (undefined1  [64])::_ps512_cephes_exp_p2);
            auVar161 = vfmadd213ps_avx512f(auVar161,auVar190,
                                           (undefined1  [64])::_ps512_cephes_exp_p3);
            auVar161 = vfmadd213ps_avx512f(auVar161,auVar190,
                                           (undefined1  [64])::_ps512_cephes_exp_p4);
            auVar189 = vfmadd213ps_avx512f(auVar151,auVar152,auVar189);
            auVar151 = vfmadd213ps_avx512f(auVar161,auVar190,(undefined1  [64])afVar75);
            auVar190 = vfmadd213ps_avx512f(auVar151,auVar149,auVar190);
            auVar157 = vcvttps2dq_avx512f(auVar157);
            auVar141 = vaddps_avx512f(auVar141,(undefined1  [64])::_ps512_1);
            auVar157 = vpaddd_avx512f(auVar157,auVar158);
            auVar157 = vpslld_avx512f(auVar157,0x17);
            auVar150 = vcvttps2dq_avx512f(auVar150);
            auVar142 = vaddps_avx512f(auVar142,(undefined1  [64])::_ps512_1);
            auVar150 = vpaddd_avx512f(auVar150,auVar158);
            auVar150 = vpslld_avx512f(auVar150,0x17);
            auVar149 = vcvttps2dq_avx512f(auVar159);
            auVar143 = vaddps_avx512f(auVar143,(undefined1  [64])::_ps512_1);
            auVar149 = vpaddd_avx512f(auVar149,auVar158);
            auVar149 = vpslld_avx512f(auVar149,0x17);
            auVar144 = vaddps_avx512f(auVar144,(undefined1  [64])::_ps512_1);
            auVar141 = vmulps_avx512f(auVar141,auVar157);
            auVar157 = vcvttps2dq_avx512f(auVar163);
            auVar157 = vpaddd_avx512f(auVar157,auVar158);
            auVar157 = vpslld_avx512f(auVar157,0x17);
            auVar142 = vmulps_avx512f(auVar142,auVar150);
            auVar145 = vaddps_avx512f(auVar145,(undefined1  [64])::_ps512_1);
            auVar150 = vcvttps2dq_avx512f(auVar181);
            auVar150 = vpaddd_avx512f(auVar150,auVar158);
            auVar143 = vmulps_avx512f(auVar143,auVar149);
            auVar150 = vpslld_avx512f(auVar150,0x17);
            auVar146 = vaddps_avx512f(auVar146,(undefined1  [64])::_ps512_1);
            auVar149 = vcvttps2dq_avx512f(auVar182);
            auVar144 = vmulps_avx512f(auVar144,auVar157);
            auVar157 = vpaddd_avx512f(auVar149,auVar158);
            auVar157 = vpslld_avx512f(auVar157,0x17);
            auVar189 = vaddps_avx512f(auVar189,(undefined1  [64])::_ps512_1);
            auVar145 = vmulps_avx512f(auVar145,auVar150);
            auVar150 = vcvttps2dq_avx512f(auVar185);
            auVar150 = vpaddd_avx512f(auVar150,auVar158);
            auVar150 = vpslld_avx512f(auVar150,0x17);
            auVar146 = vmulps_avx512f(auVar146,auVar157);
            auVar190 = vaddps_avx512f(auVar190,(undefined1  [64])::_ps512_1);
            auVar157 = vcvttps2dq_avx512f(auVar162);
            in_ZMM12 = vpaddd_avx512f(auVar157,auVar158);
            auVar189 = vmulps_avx512f(auVar189,auVar150);
            auVar157 = vpslld_avx512f(in_ZMM12,0x17);
            auVar190 = vmulps_avx512f(auVar190,auVar157);
            *pauVar76 = auVar141;
            pauVar76[1] = auVar142;
            pauVar76[2] = auVar143;
            pauVar76[3] = auVar144;
            pauVar76[4] = auVar145;
            pauVar76[5] = auVar146;
            pauVar76[6] = auVar189;
            auVar157 = vunpcklps_avx512f(auVar141,auVar142);
            auVar141 = vunpckhps_avx512f(auVar141,auVar142);
            auVar141 = vaddps_avx512f(auVar157,auVar141);
            auVar142 = vunpcklps_avx512f(auVar143,auVar144);
            auVar143 = vunpckhps_avx512f(auVar143,auVar144);
            auVar144 = vunpcklps_avx512f(auVar145,auVar146);
            auVar142 = vaddps_avx512f(auVar142,auVar143);
            auVar143 = vunpckhps_avx512f(auVar145,auVar146);
            auVar145 = vunpcklps_avx512f(auVar189,auVar190);
            auVar146 = vunpckhps_avx512f(auVar189,auVar190);
            auVar143 = vaddps_avx512f(auVar144,auVar143);
            auVar144 = vaddps_avx512f(auVar145,auVar146);
            auVar145 = vunpcklps_avx512f(auVar141,auVar142);
            auVar141 = vunpckhps_avx512f(auVar141,auVar142);
            auVar141 = vaddps_avx512f(auVar145,auVar141);
            auVar142 = vunpcklps_avx512f(auVar143,auVar144);
            auVar143 = vunpckhps_avx512f(auVar143,auVar144);
            auVar142 = vaddps_avx512f(auVar142,auVar143);
            pauVar76[7] = auVar190;
            auVar143 = vpermt2ps_avx512f(auVar141,_DAT_005ab740,auVar142);
            auVar141 = vpermt2ps_avx512f(auVar141,_DAT_005ab780,auVar142);
            auVar141 = vaddps_avx512f(auVar141,auVar143);
            auVar141 = vaddps_avx512f(auVar141,*pauVar80);
            pauVar76 = pauVar76 + 8;
            *pauVar80 = auVar141;
            pfVar83 = pfVar83 + 0x10;
            pauVar80 = pauVar80 + 1;
            iVar79 = iVar79 + 0x10;
            afVar271 = afVar270;
          } while (iVar79 < size1);
          auVar104 = vbroadcastss_avx512vl(ZEXT416(0xc2b0c0a5));
          auVar157 = ZEXT3264(auVar104);
          auVar141 = ZEXT3264(CONCAT428(0x3f000000,
                                        CONCAT424(0x3f000000,
                                                  CONCAT420(0x3f000000,
                                                            CONCAT416(0x3f000000,
                                                                      CONCAT412(0x3f000000,
                                                                                CONCAT48(0x3f000000,
                                                                                                                                                                                  
                                                  0x3f0000003f000000)))))));
          auVar104 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
          auVar143 = ZEXT3264(auVar104);
          auVar104 = vbroadcastss_avx512vl(ZEXT416(0x3f318000));
          auVar144 = ZEXT3264(auVar104);
          auVar104 = vbroadcastss_avx512vl(ZEXT416(0xb95e8083));
          auVar145 = ZEXT3264(auVar104);
          auVar104 = vbroadcastss_avx512vl(ZEXT416(0x3ab743ce));
          auVar142 = ZEXT3264(auVar104);
          auVar104 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
          auVar189 = ZEXT3264(auVar104);
          auVar104 = vbroadcastss_avx512vl(ZEXT416(0x3c088908));
          auVar190 = ZEXT3264(auVar104);
          auVar104 = vbroadcastss_avx512vl(ZEXT416(0x3d2aa9c1));
          auVar146 = ZEXT3264(auVar104);
          auVar104 = vpbroadcastd_avx512vl(ZEXT416(0x3f800000));
          auVar150 = ZEXT3264(auVar104);
          uVar77 = size1 & 0xfffffff0U;
        }
        uVar81 = uVar77 | 7;
        auVar108._8_4_ = 0x42b0c0a5;
        auVar108._0_8_ = 0x42b0c0a542b0c0a5;
        auVar108._12_4_ = 0x42b0c0a5;
        auVar108._16_4_ = 0x42b0c0a5;
        auVar108._20_4_ = 0x42b0c0a5;
        auVar108._24_4_ = 0x42b0c0a5;
        auVar108._28_4_ = 0x42b0c0a5;
        auVar114._8_4_ = 0x3fb8aa3b;
        auVar114._0_8_ = 0x3fb8aa3b3fb8aa3b;
        auVar114._12_4_ = 0x3fb8aa3b;
        auVar114._16_4_ = 0x3fb8aa3b;
        auVar114._20_4_ = 0x3fb8aa3b;
        auVar114._24_4_ = 0x3fb8aa3b;
        auVar114._28_4_ = 0x3fb8aa3b;
        auVar113._8_4_ = 0x3e2aaaaa;
        auVar113._0_8_ = 0x3e2aaaaa3e2aaaaa;
        auVar113._12_4_ = 0x3e2aaaaa;
        auVar113._16_4_ = 0x3e2aaaaa;
        auVar113._20_4_ = 0x3e2aaaaa;
        auVar113._24_4_ = 0x3e2aaaaa;
        auVar113._28_4_ = 0x3e2aaaaa;
        while( true ) {
          auVar104 = auVar141._0_32_;
          auVar109 = auVar189._0_32_;
          auVar106 = auVar144._0_32_;
          auVar105 = auVar142._0_32_;
          auVar110 = auVar190._0_32_;
          auVar107 = auVar146._0_32_;
          if (size1 <= (int)uVar81) break;
          fVar193 = *pfVar83;
          auVar124._4_4_ = fVar193;
          auVar124._0_4_ = fVar193;
          auVar124._8_4_ = fVar193;
          auVar124._12_4_ = fVar193;
          auVar124._16_4_ = fVar193;
          auVar124._20_4_ = fVar193;
          auVar124._24_4_ = fVar193;
          auVar124._28_4_ = fVar193;
          auVar111 = vsubps_avx512vl(*(undefined1 (*) [32])*pauVar76,auVar124);
          auVar111 = vminps_avx(auVar111,auVar108);
          auVar129._8_4_ = 0xc2b0c0a5;
          auVar129._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar129._12_4_ = 0xc2b0c0a5;
          auVar129._16_4_ = 0xc2b0c0a5;
          auVar129._20_4_ = 0xc2b0c0a5;
          auVar129._24_4_ = 0xc2b0c0a5;
          auVar129._28_4_ = 0xc2b0c0a5;
          auVar112 = vmaxps_avx512vl(auVar111,auVar129);
          auVar116 = vfmadd213ps_avx512vl(auVar114,auVar112,auVar104);
          auVar111 = vroundps_avx(auVar116,1);
          uVar82 = vcmpps_avx512vl(auVar116,auVar111,1);
          auVar124 = auVar143._0_32_;
          auVar116 = vsubps_avx512vl(auVar111,auVar124);
          bVar6 = (bool)((byte)uVar82 & 1);
          auVar126._0_4_ = (uint)bVar6 * auVar116._0_4_ | (uint)!bVar6 * auVar111._0_4_;
          bVar6 = (bool)((byte)(uVar82 >> 1) & 1);
          auVar126._4_4_ = (uint)bVar6 * auVar116._4_4_ | (uint)!bVar6 * auVar111._4_4_;
          bVar6 = (bool)((byte)(uVar82 >> 2) & 1);
          auVar126._8_4_ = (uint)bVar6 * auVar116._8_4_ | (uint)!bVar6 * auVar111._8_4_;
          bVar6 = (bool)((byte)(uVar82 >> 3) & 1);
          auVar126._12_4_ = (uint)bVar6 * auVar116._12_4_ | (uint)!bVar6 * auVar111._12_4_;
          bVar6 = (bool)((byte)(uVar82 >> 4) & 1);
          auVar126._16_4_ = (uint)bVar6 * auVar116._16_4_ | (uint)!bVar6 * auVar111._16_4_;
          bVar6 = (bool)((byte)(uVar82 >> 5) & 1);
          auVar126._20_4_ = (uint)bVar6 * auVar116._20_4_ | (uint)!bVar6 * auVar111._20_4_;
          bVar6 = (bool)((byte)(uVar82 >> 6) & 1);
          auVar126._24_4_ = (uint)bVar6 * auVar116._24_4_ | (uint)!bVar6 * auVar111._24_4_;
          bVar6 = SUB81(uVar82 >> 7,0);
          auVar126._28_4_ = (uint)bVar6 * auVar116._28_4_ | (uint)!bVar6 * auVar111._28_4_;
          fVar193 = pfVar83[1];
          auVar130._4_4_ = fVar193;
          auVar130._0_4_ = fVar193;
          auVar130._8_4_ = fVar193;
          auVar130._12_4_ = fVar193;
          auVar130._16_4_ = fVar193;
          auVar130._20_4_ = fVar193;
          auVar130._24_4_ = fVar193;
          auVar130._28_4_ = fVar193;
          auVar111 = vsubps_avx512vl(*(undefined1 (*) [32])(*pauVar76 + 0x20),auVar130);
          auVar112 = vfmsub231ps_avx512vl(auVar112,auVar126,auVar106);
          auVar111 = vminps_avx(auVar111,auVar108);
          auVar131._8_4_ = 0xc2b0c0a5;
          auVar131._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar131._12_4_ = 0xc2b0c0a5;
          auVar131._16_4_ = 0xc2b0c0a5;
          auVar131._20_4_ = 0xc2b0c0a5;
          auVar131._24_4_ = 0xc2b0c0a5;
          auVar131._28_4_ = 0xc2b0c0a5;
          auVar116 = vmaxps_avx512vl(auVar111,auVar131);
          auVar118 = vcvttps2dq_avx512vl(auVar126);
          auVar88 = vfmadd213ps_fma(auVar114,auVar116,auVar104);
          auVar111 = vroundps_avx(ZEXT1632(auVar88),1);
          uVar82 = vcmpps_avx512vl(ZEXT1632(auVar88),auVar111,1);
          auVar273 = auVar145._0_32_;
          auVar112 = vfnmsub231ps_avx512vl(auVar112,auVar126,auVar273);
          auVar120 = vsubps_avx512vl(auVar111,auVar124);
          bVar6 = (bool)((byte)uVar82 & 1);
          auVar127._0_4_ = (float)((uint)bVar6 * auVar120._0_4_ | (uint)!bVar6 * auVar111._0_4_);
          bVar6 = (bool)((byte)(uVar82 >> 1) & 1);
          auVar127._4_4_ = (float)((uint)bVar6 * auVar120._4_4_ | (uint)!bVar6 * auVar111._4_4_);
          bVar6 = (bool)((byte)(uVar82 >> 2) & 1);
          auVar127._8_4_ = (float)((uint)bVar6 * auVar120._8_4_ | (uint)!bVar6 * auVar111._8_4_);
          bVar6 = (bool)((byte)(uVar82 >> 3) & 1);
          auVar127._12_4_ = (float)((uint)bVar6 * auVar120._12_4_ | (uint)!bVar6 * auVar111._12_4_);
          bVar6 = (bool)((byte)(uVar82 >> 4) & 1);
          auVar127._16_4_ = (float)((uint)bVar6 * auVar120._16_4_ | (uint)!bVar6 * auVar111._16_4_);
          bVar6 = (bool)((byte)(uVar82 >> 5) & 1);
          auVar127._20_4_ = (float)((uint)bVar6 * auVar120._20_4_ | (uint)!bVar6 * auVar111._20_4_);
          bVar6 = (bool)((byte)(uVar82 >> 6) & 1);
          auVar127._24_4_ = (float)((uint)bVar6 * auVar120._24_4_ | (uint)!bVar6 * auVar111._24_4_);
          bVar6 = SUB81(uVar82 >> 7,0);
          auVar127._28_4_ = (float)((uint)bVar6 * auVar120._28_4_ | (uint)!bVar6 * auVar111._28_4_);
          auVar111 = vfmsub231ps_avx512vl(auVar116,auVar127,auVar106);
          auVar116 = vfnmsub231ps_avx512vl(auVar111,auVar127,auVar273);
          auVar120 = vmulps_avx512vl(auVar112,auVar112);
          fVar193 = pfVar83[2];
          auVar133._4_4_ = fVar193;
          auVar133._0_4_ = fVar193;
          auVar133._8_4_ = fVar193;
          auVar133._12_4_ = fVar193;
          auVar133._16_4_ = fVar193;
          auVar133._20_4_ = fVar193;
          auVar133._24_4_ = fVar193;
          auVar133._28_4_ = fVar193;
          auVar111 = vsubps_avx512vl(*(undefined1 (*) [32])pauVar76[1],auVar133);
          auVar122 = vfmadd213ps_avx512vl(auVar109,auVar112,auVar105);
          auVar111 = vminps_avx(auVar111,auVar108);
          auVar135._8_4_ = 0xc2b0c0a5;
          auVar135._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar135._12_4_ = 0xc2b0c0a5;
          auVar135._16_4_ = 0xc2b0c0a5;
          auVar135._20_4_ = 0xc2b0c0a5;
          auVar135._24_4_ = 0xc2b0c0a5;
          auVar135._28_4_ = 0xc2b0c0a5;
          auVar111 = vmaxps_avx512vl(auVar111,auVar135);
          auVar141._0_4_ = auVar116._0_4_ * auVar116._0_4_;
          auVar141._4_4_ = auVar116._4_4_ * auVar116._4_4_;
          auVar141._8_4_ = auVar116._8_4_ * auVar116._8_4_;
          auVar141._12_4_ = auVar116._12_4_ * auVar116._12_4_;
          auVar141._16_4_ = auVar116._16_4_ * auVar116._16_4_;
          auVar141._20_4_ = auVar116._20_4_ * auVar116._20_4_;
          auVar141._28_36_ = in_ZMM12._28_36_;
          auVar141._24_4_ = auVar116._24_4_ * auVar116._24_4_;
          auVar88 = vfmadd213ps_fma(auVar114,auVar111,auVar104);
          auVar104 = vroundps_avx(ZEXT1632(auVar88),1);
          uVar82 = vcmpps_avx512vl(ZEXT1632(auVar88),auVar104,1);
          auVar123 = vfmadd213ps_avx512vl(auVar109,auVar116,auVar105);
          auVar124 = vsubps_avx512vl(auVar104,auVar124);
          bVar6 = (bool)((byte)uVar82 & 1);
          auVar128._0_4_ = (float)((uint)bVar6 * auVar124._0_4_ | (uint)!bVar6 * auVar104._0_4_);
          bVar6 = (bool)((byte)(uVar82 >> 1) & 1);
          auVar128._4_4_ = (float)((uint)bVar6 * auVar124._4_4_ | (uint)!bVar6 * auVar104._4_4_);
          bVar6 = (bool)((byte)(uVar82 >> 2) & 1);
          auVar128._8_4_ = (float)((uint)bVar6 * auVar124._8_4_ | (uint)!bVar6 * auVar104._8_4_);
          bVar6 = (bool)((byte)(uVar82 >> 3) & 1);
          auVar128._12_4_ = (float)((uint)bVar6 * auVar124._12_4_ | (uint)!bVar6 * auVar104._12_4_);
          bVar6 = (bool)((byte)(uVar82 >> 4) & 1);
          auVar128._16_4_ = (float)((uint)bVar6 * auVar124._16_4_ | (uint)!bVar6 * auVar104._16_4_);
          bVar6 = (bool)((byte)(uVar82 >> 5) & 1);
          auVar128._20_4_ = (float)((uint)bVar6 * auVar124._20_4_ | (uint)!bVar6 * auVar104._20_4_);
          bVar6 = (bool)((byte)(uVar82 >> 6) & 1);
          auVar128._24_4_ = (float)((uint)bVar6 * auVar124._24_4_ | (uint)!bVar6 * auVar104._24_4_);
          bVar6 = SUB81(uVar82 >> 7,0);
          auVar128._28_4_ = (float)((uint)bVar6 * auVar124._28_4_ | (uint)!bVar6 * auVar104._28_4_);
          auVar104 = vfmsub231ps_avx512vl(auVar111,auVar128,auVar106);
          auVar111 = vfnmsub231ps_avx512vl(auVar104,auVar128,auVar273);
          auVar124 = vmulps_avx512vl(auVar111,auVar111);
          fVar193 = pfVar83[3];
          auVar137._4_4_ = fVar193;
          auVar137._0_4_ = fVar193;
          auVar137._8_4_ = fVar193;
          auVar137._12_4_ = fVar193;
          auVar137._16_4_ = fVar193;
          auVar137._20_4_ = fVar193;
          auVar137._24_4_ = fVar193;
          auVar137._28_4_ = fVar193;
          auVar104 = vsubps_avx512vl(*(undefined1 (*) [32])(pauVar76[1] + 0x20),auVar137);
          auVar129 = vfmadd213ps_avx512vl(auVar109,auVar111,auVar105);
          auVar104 = vminps_avx(auVar104,auVar108);
          auVar138._8_4_ = 0xc2b0c0a5;
          auVar138._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar138._12_4_ = 0xc2b0c0a5;
          auVar138._16_4_ = 0xc2b0c0a5;
          auVar138._20_4_ = 0xc2b0c0a5;
          auVar138._24_4_ = 0xc2b0c0a5;
          auVar138._28_4_ = 0xc2b0c0a5;
          auVar130 = vmaxps_avx512vl(auVar104,auVar138);
          auVar122 = vfmadd213ps_avx512vl(auVar122,auVar112,auVar110);
          auVar28._8_4_ = 0x3f000000;
          auVar28._0_8_ = 0x3f0000003f000000;
          auVar28._12_4_ = 0x3f000000;
          auVar28._16_4_ = 0x3f000000;
          auVar28._20_4_ = 0x3f000000;
          auVar28._24_4_ = 0x3f000000;
          auVar28._28_4_ = 0x3f000000;
          auVar131 = vfmadd213ps_avx512vl(auVar114,auVar130,auVar28);
          auVar104 = vroundps_avx(auVar131,1);
          uVar82 = vcmpps_avx512vl(auVar131,auVar104,1);
          auVar123 = vfmadd213ps_avx512vl(auVar123,auVar116,auVar110);
          auVar29._8_4_ = 0x3f800000;
          auVar29._0_8_ = 0x3f8000003f800000;
          auVar29._12_4_ = 0x3f800000;
          auVar29._16_4_ = 0x3f800000;
          auVar29._20_4_ = 0x3f800000;
          auVar29._24_4_ = 0x3f800000;
          auVar29._28_4_ = 0x3f800000;
          auVar131 = vsubps_avx512vl(auVar104,auVar29);
          bVar6 = (bool)((byte)uVar82 & 1);
          auVar132._0_4_ = (float)((uint)bVar6 * auVar131._0_4_ | (uint)!bVar6 * auVar104._0_4_);
          bVar6 = (bool)((byte)(uVar82 >> 1) & 1);
          auVar132._4_4_ = (float)((uint)bVar6 * auVar131._4_4_ | (uint)!bVar6 * auVar104._4_4_);
          bVar6 = (bool)((byte)(uVar82 >> 2) & 1);
          auVar132._8_4_ = (float)((uint)bVar6 * auVar131._8_4_ | (uint)!bVar6 * auVar104._8_4_);
          bVar6 = (bool)((byte)(uVar82 >> 3) & 1);
          auVar132._12_4_ = (float)((uint)bVar6 * auVar131._12_4_ | (uint)!bVar6 * auVar104._12_4_);
          bVar6 = (bool)((byte)(uVar82 >> 4) & 1);
          auVar132._16_4_ = (float)((uint)bVar6 * auVar131._16_4_ | (uint)!bVar6 * auVar104._16_4_);
          bVar6 = (bool)((byte)(uVar82 >> 5) & 1);
          auVar132._20_4_ = (float)((uint)bVar6 * auVar131._20_4_ | (uint)!bVar6 * auVar104._20_4_);
          bVar6 = (bool)((byte)(uVar82 >> 6) & 1);
          auVar132._24_4_ = (float)((uint)bVar6 * auVar131._24_4_ | (uint)!bVar6 * auVar104._24_4_);
          bVar6 = SUB81(uVar82 >> 7,0);
          auVar132._28_4_ = (float)((uint)bVar6 * auVar131._28_4_ | (uint)!bVar6 * auVar104._28_4_);
          auVar104 = vfmsub231ps_avx512vl(auVar130,auVar132,auVar106);
          auVar106 = vfnmsub231ps_avx512vl(auVar104,auVar132,auVar273);
          auVar129 = vfmadd213ps_avx512vl(auVar129,auVar111,auVar110);
          auVar130 = vmulps_avx512vl(auVar106,auVar106);
          auVar104 = vfmadd213ps_avx512vl(auVar109,auVar106,auVar105);
          auVar109 = vfmadd213ps_avx512vl(auVar104,auVar106,auVar110);
          fVar193 = pfVar83[4];
          auVar273._4_4_ = fVar193;
          auVar273._0_4_ = fVar193;
          auVar273._8_4_ = fVar193;
          auVar273._12_4_ = fVar193;
          auVar273._16_4_ = fVar193;
          auVar273._20_4_ = fVar193;
          auVar273._24_4_ = fVar193;
          auVar273._28_4_ = fVar193;
          auVar104 = vsubps_avx512vl(*(undefined1 (*) [32])pauVar76[2],auVar273);
          auVar104 = vminps_avx(auVar104,auVar108);
          auVar122 = vfmadd213ps_avx512vl(auVar122,auVar112,auVar107);
          auVar30._8_4_ = 0xc2b0c0a5;
          auVar30._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar30._12_4_ = 0xc2b0c0a5;
          auVar30._16_4_ = 0xc2b0c0a5;
          auVar30._20_4_ = 0xc2b0c0a5;
          auVar30._24_4_ = 0xc2b0c0a5;
          auVar30._28_4_ = 0xc2b0c0a5;
          auVar104 = vmaxps_avx512vl(auVar104,auVar30);
          auVar31._8_4_ = 0x3f000000;
          auVar31._0_8_ = 0x3f0000003f000000;
          auVar31._12_4_ = 0x3f000000;
          auVar31._16_4_ = 0x3f000000;
          auVar31._20_4_ = 0x3f000000;
          auVar31._24_4_ = 0x3f000000;
          auVar31._28_4_ = 0x3f000000;
          auVar131 = vfmadd213ps_avx512vl(auVar114,auVar104,auVar31);
          auVar123 = vfmadd213ps_avx512vl(auVar123,auVar116,auVar107);
          auVar133 = vrndscaleps_avx512vl(auVar131,1);
          uVar82 = vcmpps_avx512vl(auVar131,auVar133,1);
          auVar32._8_4_ = 0x3f800000;
          auVar32._0_8_ = 0x3f8000003f800000;
          auVar32._12_4_ = 0x3f800000;
          auVar32._16_4_ = 0x3f800000;
          auVar32._20_4_ = 0x3f800000;
          auVar32._24_4_ = 0x3f800000;
          auVar32._28_4_ = 0x3f800000;
          auVar131 = vsubps_avx512vl(auVar133,auVar32);
          bVar6 = (bool)((byte)uVar82 & 1);
          auVar134._0_4_ = (uint)bVar6 * auVar131._0_4_ | (uint)!bVar6 * auVar133._0_4_;
          bVar6 = (bool)((byte)(uVar82 >> 1) & 1);
          auVar134._4_4_ = (uint)bVar6 * auVar131._4_4_ | (uint)!bVar6 * auVar133._4_4_;
          bVar6 = (bool)((byte)(uVar82 >> 2) & 1);
          auVar134._8_4_ = (uint)bVar6 * auVar131._8_4_ | (uint)!bVar6 * auVar133._8_4_;
          bVar6 = (bool)((byte)(uVar82 >> 3) & 1);
          auVar134._12_4_ = (uint)bVar6 * auVar131._12_4_ | (uint)!bVar6 * auVar133._12_4_;
          bVar6 = (bool)((byte)(uVar82 >> 4) & 1);
          auVar134._16_4_ = (uint)bVar6 * auVar131._16_4_ | (uint)!bVar6 * auVar133._16_4_;
          bVar6 = (bool)((byte)(uVar82 >> 5) & 1);
          auVar134._20_4_ = (uint)bVar6 * auVar131._20_4_ | (uint)!bVar6 * auVar133._20_4_;
          bVar6 = (bool)((byte)(uVar82 >> 6) & 1);
          auVar134._24_4_ = (uint)bVar6 * auVar131._24_4_ | (uint)!bVar6 * auVar133._24_4_;
          bVar6 = SUB81(uVar82 >> 7,0);
          auVar134._28_4_ = (uint)bVar6 * auVar131._28_4_ | (uint)!bVar6 * auVar133._28_4_;
          auVar129 = vfmadd213ps_avx512vl(auVar129,auVar111,auVar107);
          auVar33._8_4_ = 0x3f318000;
          auVar33._0_8_ = 0x3f3180003f318000;
          auVar33._12_4_ = 0x3f318000;
          auVar33._16_4_ = 0x3f318000;
          auVar33._20_4_ = 0x3f318000;
          auVar33._24_4_ = 0x3f318000;
          auVar33._28_4_ = 0x3f318000;
          auVar104 = vfmsub231ps_avx512vl(auVar104,auVar134,auVar33);
          auVar34._8_4_ = 0xb95e8083;
          auVar34._0_8_ = 0xb95e8083b95e8083;
          auVar34._12_4_ = 0xb95e8083;
          auVar34._16_4_ = 0xb95e8083;
          auVar34._20_4_ = 0xb95e8083;
          auVar34._24_4_ = 0xb95e8083;
          auVar34._28_4_ = 0xb95e8083;
          auVar131 = vfnmsub231ps_avx512vl(auVar104,auVar134,auVar34);
          auVar133 = vmulps_avx512vl(auVar131,auVar131);
          auVar109 = vfmadd213ps_avx512vl(auVar109,auVar106,auVar107);
          auVar244._8_4_ = 0x39506967;
          auVar244._0_8_ = 0x3950696739506967;
          auVar244._12_4_ = 0x39506967;
          auVar244._16_4_ = 0x39506967;
          auVar244._20_4_ = 0x39506967;
          auVar244._24_4_ = 0x39506967;
          auVar244._28_4_ = 0x39506967;
          auVar104 = vfmadd213ps_avx512vl(auVar244,auVar131,auVar105);
          auVar104 = vfmadd213ps_avx512vl(auVar104,auVar131,auVar110);
          auVar105 = vfmadd213ps_avx512vl(auVar122,auVar112,auVar113);
          auVar110 = vfmadd213ps_avx512vl(auVar104,auVar131,auVar107);
          fVar193 = pfVar83[5];
          auVar35._4_4_ = fVar193;
          auVar35._0_4_ = fVar193;
          auVar35._8_4_ = fVar193;
          auVar35._12_4_ = fVar193;
          auVar35._16_4_ = fVar193;
          auVar35._20_4_ = fVar193;
          auVar35._24_4_ = fVar193;
          auVar35._28_4_ = fVar193;
          auVar104 = vsubps_avx512vl(*(undefined1 (*) [32])(pauVar76[2] + 0x20),auVar35);
          auVar122 = vfmadd213ps_avx512vl(auVar123,auVar116,auVar113);
          auVar104 = vminps_avx(auVar104,auVar108);
          auVar36._8_4_ = 0xc2b0c0a5;
          auVar36._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar36._12_4_ = 0xc2b0c0a5;
          auVar36._16_4_ = 0xc2b0c0a5;
          auVar36._20_4_ = 0xc2b0c0a5;
          auVar36._24_4_ = 0xc2b0c0a5;
          auVar36._28_4_ = 0xc2b0c0a5;
          auVar104 = vmaxps_avx512vl(auVar104,auVar36);
          auVar123 = vfmadd213ps_avx512vl(auVar129,auVar111,auVar113);
          auVar37._8_4_ = 0x3f000000;
          auVar37._0_8_ = 0x3f0000003f000000;
          auVar37._12_4_ = 0x3f000000;
          auVar37._16_4_ = 0x3f000000;
          auVar37._20_4_ = 0x3f000000;
          auVar37._24_4_ = 0x3f000000;
          auVar37._28_4_ = 0x3f000000;
          auVar129 = vfmadd213ps_avx512vl(auVar114,auVar104,auVar37);
          auVar135 = vrndscaleps_avx512vl(auVar129,1);
          uVar82 = vcmpps_avx512vl(auVar129,auVar135,1);
          auVar88 = vfmadd213ps_fma(auVar109,auVar106,auVar113);
          auVar38._8_4_ = 0x3f800000;
          auVar38._0_8_ = 0x3f8000003f800000;
          auVar38._12_4_ = 0x3f800000;
          auVar38._16_4_ = 0x3f800000;
          auVar38._20_4_ = 0x3f800000;
          auVar38._24_4_ = 0x3f800000;
          auVar38._28_4_ = 0x3f800000;
          auVar109 = vsubps_avx512vl(auVar135,auVar38);
          bVar6 = (bool)((byte)uVar82 & 1);
          auVar136._0_4_ = (uint)bVar6 * auVar109._0_4_ | (uint)!bVar6 * auVar135._0_4_;
          bVar6 = (bool)((byte)(uVar82 >> 1) & 1);
          auVar136._4_4_ = (uint)bVar6 * auVar109._4_4_ | (uint)!bVar6 * auVar135._4_4_;
          bVar6 = (bool)((byte)(uVar82 >> 2) & 1);
          auVar136._8_4_ = (uint)bVar6 * auVar109._8_4_ | (uint)!bVar6 * auVar135._8_4_;
          bVar6 = (bool)((byte)(uVar82 >> 3) & 1);
          auVar136._12_4_ = (uint)bVar6 * auVar109._12_4_ | (uint)!bVar6 * auVar135._12_4_;
          bVar6 = (bool)((byte)(uVar82 >> 4) & 1);
          auVar136._16_4_ = (uint)bVar6 * auVar109._16_4_ | (uint)!bVar6 * auVar135._16_4_;
          bVar6 = (bool)((byte)(uVar82 >> 5) & 1);
          auVar136._20_4_ = (uint)bVar6 * auVar109._20_4_ | (uint)!bVar6 * auVar135._20_4_;
          bVar6 = (bool)((byte)(uVar82 >> 6) & 1);
          auVar136._24_4_ = (uint)bVar6 * auVar109._24_4_ | (uint)!bVar6 * auVar135._24_4_;
          bVar6 = SUB81(uVar82 >> 7,0);
          auVar136._28_4_ = (uint)bVar6 * auVar109._28_4_ | (uint)!bVar6 * auVar135._28_4_;
          auVar39._8_4_ = 0x3f318000;
          auVar39._0_8_ = 0x3f3180003f318000;
          auVar39._12_4_ = 0x3f318000;
          auVar39._16_4_ = 0x3f318000;
          auVar39._20_4_ = 0x3f318000;
          auVar39._24_4_ = 0x3f318000;
          auVar39._28_4_ = 0x3f318000;
          auVar104 = vfmsub231ps_avx512vl(auVar104,auVar136,auVar39);
          auVar40._8_4_ = 0xb95e8083;
          auVar40._0_8_ = 0xb95e8083b95e8083;
          auVar40._12_4_ = 0xb95e8083;
          auVar40._16_4_ = 0xb95e8083;
          auVar40._20_4_ = 0xb95e8083;
          auVar40._24_4_ = 0xb95e8083;
          auVar40._28_4_ = 0xb95e8083;
          auVar109 = vfnmsub231ps_avx512vl(auVar104,auVar136,auVar40);
          auVar110 = vfmadd213ps_avx512vl(auVar110,auVar131,auVar113);
          auVar129 = vmulps_avx512vl(auVar109,auVar109);
          auVar104 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
          auVar41._8_4_ = 0x3ab743ce;
          auVar41._0_8_ = 0x3ab743ce3ab743ce;
          auVar41._12_4_ = 0x3ab743ce;
          auVar41._16_4_ = 0x3ab743ce;
          auVar41._20_4_ = 0x3ab743ce;
          auVar41._24_4_ = 0x3ab743ce;
          auVar41._28_4_ = 0x3ab743ce;
          auVar104 = vfmadd213ps_avx512vl(auVar104,auVar109,auVar41);
          auVar42._8_4_ = 0x3f000000;
          auVar42._0_8_ = 0x3f0000003f000000;
          auVar42._12_4_ = 0x3f000000;
          auVar42._16_4_ = 0x3f000000;
          auVar42._20_4_ = 0x3f000000;
          auVar42._24_4_ = 0x3f000000;
          auVar42._28_4_ = 0x3f000000;
          auVar105 = vfmadd213ps_avx512vl(auVar105,auVar112,auVar42);
          auVar43._8_4_ = 0x3c088908;
          auVar43._0_8_ = 0x3c0889083c088908;
          auVar43._12_4_ = 0x3c088908;
          auVar43._16_4_ = 0x3c088908;
          auVar43._20_4_ = 0x3c088908;
          auVar43._24_4_ = 0x3c088908;
          auVar43._28_4_ = 0x3c088908;
          auVar104 = vfmadd213ps_avx512vl(auVar104,auVar109,auVar43);
          auVar104 = vfmadd213ps_avx512vl(auVar104,auVar109,auVar107);
          auVar107 = vfmadd213ps_avx512vl(auVar104,auVar109,auVar113);
          auVar44._8_4_ = 0x3f000000;
          auVar44._0_8_ = 0x3f0000003f000000;
          auVar44._12_4_ = 0x3f000000;
          auVar44._16_4_ = 0x3f000000;
          auVar44._20_4_ = 0x3f000000;
          auVar44._24_4_ = 0x3f000000;
          auVar44._28_4_ = 0x3f000000;
          auVar122 = vfmadd213ps_avx512vl(auVar122,auVar116,auVar44);
          fVar193 = pfVar83[6];
          auVar45._4_4_ = fVar193;
          auVar45._0_4_ = fVar193;
          auVar45._8_4_ = fVar193;
          auVar45._12_4_ = fVar193;
          auVar45._16_4_ = fVar193;
          auVar45._20_4_ = fVar193;
          auVar45._24_4_ = fVar193;
          auVar45._28_4_ = fVar193;
          auVar104 = vsubps_avx512vl(*(undefined1 (*) [32])pauVar76[3],auVar45);
          auVar104 = vminps_avx(auVar104,auVar108);
          auVar46._8_4_ = 0x3f000000;
          auVar46._0_8_ = 0x3f0000003f000000;
          auVar46._12_4_ = 0x3f000000;
          auVar46._16_4_ = 0x3f000000;
          auVar46._20_4_ = 0x3f000000;
          auVar46._24_4_ = 0x3f000000;
          auVar46._28_4_ = 0x3f000000;
          auVar123 = vfmadd213ps_avx512vl(auVar123,auVar111,auVar46);
          auVar47._8_4_ = 0xc2b0c0a5;
          auVar47._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar47._12_4_ = 0xc2b0c0a5;
          auVar47._16_4_ = 0xc2b0c0a5;
          auVar47._20_4_ = 0xc2b0c0a5;
          auVar47._24_4_ = 0xc2b0c0a5;
          auVar47._28_4_ = 0xc2b0c0a5;
          auVar104 = vmaxps_avx512vl(auVar104,auVar47);
          auVar48._8_4_ = 0x3f000000;
          auVar48._0_8_ = 0x3f0000003f000000;
          auVar48._12_4_ = 0x3f000000;
          auVar48._16_4_ = 0x3f000000;
          auVar48._20_4_ = 0x3f000000;
          auVar48._24_4_ = 0x3f000000;
          auVar48._28_4_ = 0x3f000000;
          auVar135 = vfmadd213ps_avx512vl(auVar114,auVar104,auVar48);
          auVar49._8_4_ = 0x3f000000;
          auVar49._0_8_ = 0x3f0000003f000000;
          auVar49._12_4_ = 0x3f000000;
          auVar49._16_4_ = 0x3f000000;
          auVar49._20_4_ = 0x3f000000;
          auVar49._24_4_ = 0x3f000000;
          auVar49._28_4_ = 0x3f000000;
          auVar137 = vfmadd213ps_avx512vl(ZEXT1632(auVar88),auVar106,auVar49);
          auVar138 = vrndscaleps_avx512vl(auVar135,1);
          uVar82 = vcmpps_avx512vl(auVar135,auVar138,1);
          auVar50._8_4_ = 0x3f800000;
          auVar50._0_8_ = 0x3f8000003f800000;
          auVar50._12_4_ = 0x3f800000;
          auVar50._16_4_ = 0x3f800000;
          auVar50._20_4_ = 0x3f800000;
          auVar50._24_4_ = 0x3f800000;
          auVar50._28_4_ = 0x3f800000;
          auVar135 = vsubps_avx512vl(auVar138,auVar50);
          bVar6 = (bool)((byte)uVar82 & 1);
          auVar139._0_4_ = (float)((uint)bVar6 * auVar135._0_4_ | (uint)!bVar6 * auVar138._0_4_);
          bVar6 = (bool)((byte)(uVar82 >> 1) & 1);
          auVar139._4_4_ = (float)((uint)bVar6 * auVar135._4_4_ | (uint)!bVar6 * auVar138._4_4_);
          bVar6 = (bool)((byte)(uVar82 >> 2) & 1);
          auVar139._8_4_ = (float)((uint)bVar6 * auVar135._8_4_ | (uint)!bVar6 * auVar138._8_4_);
          bVar6 = (bool)((byte)(uVar82 >> 3) & 1);
          auVar139._12_4_ = (float)((uint)bVar6 * auVar135._12_4_ | (uint)!bVar6 * auVar138._12_4_);
          bVar6 = (bool)((byte)(uVar82 >> 4) & 1);
          auVar139._16_4_ = (float)((uint)bVar6 * auVar135._16_4_ | (uint)!bVar6 * auVar138._16_4_);
          bVar6 = (bool)((byte)(uVar82 >> 5) & 1);
          auVar139._20_4_ = (float)((uint)bVar6 * auVar135._20_4_ | (uint)!bVar6 * auVar138._20_4_);
          bVar6 = (bool)((byte)(uVar82 >> 6) & 1);
          auVar139._24_4_ = (float)((uint)bVar6 * auVar135._24_4_ | (uint)!bVar6 * auVar138._24_4_);
          bVar6 = SUB81(uVar82 >> 7,0);
          auVar139._28_4_ = (float)((uint)bVar6 * auVar135._28_4_ | (uint)!bVar6 * auVar138._28_4_);
          auVar51._8_4_ = 0x3f000000;
          auVar51._0_8_ = 0x3f0000003f000000;
          auVar51._12_4_ = 0x3f000000;
          auVar51._16_4_ = 0x3f000000;
          auVar51._20_4_ = 0x3f000000;
          auVar51._24_4_ = 0x3f000000;
          auVar51._28_4_ = 0x3f000000;
          auVar110 = vfmadd213ps_avx512vl(auVar110,auVar131,auVar51);
          auVar52._8_4_ = 0x3f318000;
          auVar52._0_8_ = 0x3f3180003f318000;
          auVar52._12_4_ = 0x3f318000;
          auVar52._16_4_ = 0x3f318000;
          auVar52._20_4_ = 0x3f318000;
          auVar52._24_4_ = 0x3f318000;
          auVar52._28_4_ = 0x3f318000;
          auVar104 = vfmsub231ps_avx512vl(auVar104,auVar139,auVar52);
          auVar53._8_4_ = 0xb95e8083;
          auVar53._0_8_ = 0xb95e8083b95e8083;
          auVar53._12_4_ = 0xb95e8083;
          auVar53._16_4_ = 0xb95e8083;
          auVar53._20_4_ = 0xb95e8083;
          auVar53._24_4_ = 0xb95e8083;
          auVar53._28_4_ = 0xb95e8083;
          auVar135 = vfnmsub231ps_avx512vl(auVar104,auVar139,auVar53);
          auVar138 = vmulps_avx512vl(auVar135,auVar135);
          auVar54._8_4_ = 0x3f000000;
          auVar54._0_8_ = 0x3f0000003f000000;
          auVar54._12_4_ = 0x3f000000;
          auVar54._16_4_ = 0x3f000000;
          auVar54._20_4_ = 0x3f000000;
          auVar54._24_4_ = 0x3f000000;
          auVar54._28_4_ = 0x3f000000;
          auVar107 = vfmadd213ps_avx512vl(auVar107,auVar109,auVar54);
          fVar193 = pfVar83[7];
          auVar55._4_4_ = fVar193;
          auVar55._0_4_ = fVar193;
          auVar55._8_4_ = fVar193;
          auVar55._12_4_ = fVar193;
          auVar55._16_4_ = fVar193;
          auVar55._20_4_ = fVar193;
          auVar55._24_4_ = fVar193;
          auVar55._28_4_ = fVar193;
          auVar104 = vsubps_avx512vl(*(undefined1 (*) [32])(pauVar76[3] + 0x20),auVar55);
          auVar104 = vminps_avx(auVar104,auVar108);
          auVar105 = vfmadd213ps_avx512vl(auVar105,auVar120,auVar112);
          auVar112 = vbroadcastss_avx512vl(ZEXT416(0xc2b0c0a5));
          auVar157 = ZEXT3264(auVar112);
          auVar112 = vmaxps_avx512vl(auVar104,auVar112);
          auVar56._8_4_ = 0x3f000000;
          auVar56._0_8_ = 0x3f0000003f000000;
          auVar56._12_4_ = 0x3f000000;
          auVar56._16_4_ = 0x3f000000;
          auVar56._20_4_ = 0x3f000000;
          auVar56._24_4_ = 0x3f000000;
          auVar56._28_4_ = 0x3f000000;
          auVar120 = vfmadd213ps_avx512vl(auVar114,auVar112,auVar56);
          auVar116 = vfmadd213ps_avx512vl(auVar122,auVar141._0_32_,auVar116);
          auVar104 = vroundps_avx(auVar120,1);
          uVar82 = vcmpps_avx512vl(auVar120,auVar104,1);
          auVar260._8_4_ = 0x39506967;
          auVar260._0_8_ = 0x3950696739506967;
          auVar260._12_4_ = 0x39506967;
          auVar260._16_4_ = 0x39506967;
          auVar260._20_4_ = 0x39506967;
          auVar260._24_4_ = 0x39506967;
          auVar260._28_4_ = 0x39506967;
          auVar120 = vfmadd213ps_avx512vl(auVar123,auVar124,auVar111);
          auVar122 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
          auVar143 = ZEXT3264(auVar122);
          auVar57._8_4_ = 0x3ab743ce;
          auVar57._0_8_ = 0x3ab743ce3ab743ce;
          auVar57._12_4_ = 0x3ab743ce;
          auVar57._16_4_ = 0x3ab743ce;
          auVar57._20_4_ = 0x3ab743ce;
          auVar57._24_4_ = 0x3ab743ce;
          auVar57._28_4_ = 0x3ab743ce;
          auVar123 = vfmadd213ps_avx512vl(auVar260,auVar135,auVar57);
          auVar58._8_4_ = 0x3c088908;
          auVar58._0_8_ = 0x3c0889083c088908;
          auVar58._12_4_ = 0x3c088908;
          auVar58._16_4_ = 0x3c088908;
          auVar58._20_4_ = 0x3c088908;
          auVar58._24_4_ = 0x3c088908;
          auVar58._28_4_ = 0x3c088908;
          auVar123 = vfmadd213ps_avx512vl(auVar123,auVar135,auVar58);
          auVar59._8_4_ = 0x3d2aa9c1;
          auVar59._0_8_ = 0x3d2aa9c13d2aa9c1;
          auVar59._12_4_ = 0x3d2aa9c1;
          auVar59._16_4_ = 0x3d2aa9c1;
          auVar59._20_4_ = 0x3d2aa9c1;
          auVar59._24_4_ = 0x3d2aa9c1;
          auVar59._28_4_ = 0x3d2aa9c1;
          auVar123 = vfmadd213ps_avx512vl(auVar123,auVar135,auVar59);
          auVar106 = vfmadd213ps_avx512vl(auVar137,auVar130,auVar106);
          auVar124 = vbroadcastss_avx512vl(ZEXT416(0x3f318000));
          auVar144 = ZEXT3264(auVar124);
          auVar269._8_4_ = 0x3f000000;
          auVar269._0_8_ = 0x3f0000003f000000;
          auVar269._12_4_ = 0x3f000000;
          auVar269._16_4_ = 0x3f000000;
          auVar269._20_4_ = 0x3f000000;
          auVar269._24_4_ = 0x3f000000;
          auVar269._28_4_ = 0x3f000000;
          auVar141 = ZEXT3264(auVar269);
          auVar88 = vfmadd213ps_fma(auVar123,auVar135,auVar113);
          auVar88 = vfmadd213ps_fma(ZEXT1632(auVar88),auVar135,auVar269);
          auVar122 = vsubps_avx512vl(auVar104,auVar122);
          bVar6 = (bool)((byte)uVar82 & 1);
          auVar140._0_4_ = (float)((uint)bVar6 * auVar122._0_4_ | (uint)!bVar6 * auVar104._0_4_);
          bVar6 = (bool)((byte)(uVar82 >> 1) & 1);
          auVar140._4_4_ = (float)((uint)bVar6 * auVar122._4_4_ | (uint)!bVar6 * auVar104._4_4_);
          bVar6 = (bool)((byte)(uVar82 >> 2) & 1);
          auVar140._8_4_ = (float)((uint)bVar6 * auVar122._8_4_ | (uint)!bVar6 * auVar104._8_4_);
          bVar6 = (bool)((byte)(uVar82 >> 3) & 1);
          auVar140._12_4_ = (float)((uint)bVar6 * auVar122._12_4_ | (uint)!bVar6 * auVar104._12_4_);
          bVar6 = (bool)((byte)(uVar82 >> 4) & 1);
          auVar140._16_4_ = (float)((uint)bVar6 * auVar122._16_4_ | (uint)!bVar6 * auVar104._16_4_);
          bVar6 = (bool)((byte)(uVar82 >> 5) & 1);
          auVar140._20_4_ = (float)((uint)bVar6 * auVar122._20_4_ | (uint)!bVar6 * auVar104._20_4_);
          bVar6 = (bool)((byte)(uVar82 >> 6) & 1);
          auVar140._24_4_ = (float)((uint)bVar6 * auVar122._24_4_ | (uint)!bVar6 * auVar104._24_4_);
          bVar6 = SUB81(uVar82 >> 7,0);
          auVar140._28_4_ = (float)((uint)bVar6 * auVar122._28_4_ | (uint)!bVar6 * auVar104._28_4_);
          auVar104 = vfmadd213ps_avx512vl(auVar110,auVar133,auVar131);
          auVar110 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
          auVar189 = ZEXT3264(auVar110);
          auVar122 = vbroadcastss_avx512vl(ZEXT416(0xb95e8083));
          auVar145 = ZEXT3264(auVar122);
          auVar112 = vfmsub231ps_avx512vl(auVar112,auVar140,auVar124);
          auVar112 = vfnmsub231ps_avx512vl(auVar112,auVar140,auVar122);
          auVar63._4_4_ = auVar112._4_4_ * auVar112._4_4_;
          auVar63._0_4_ = auVar112._0_4_ * auVar112._0_4_;
          auVar63._8_4_ = auVar112._8_4_ * auVar112._8_4_;
          auVar63._12_4_ = auVar112._12_4_ * auVar112._12_4_;
          auVar63._16_4_ = auVar112._16_4_ * auVar112._16_4_;
          auVar63._20_4_ = auVar112._20_4_ * auVar112._20_4_;
          auVar63._24_4_ = auVar112._24_4_ * auVar112._24_4_;
          auVar63._28_4_ = auVar111._28_4_;
          auVar107 = vfmadd213ps_avx512vl(auVar107,auVar129,auVar109);
          auVar109 = vbroadcastss_avx512vl(ZEXT416(0x3c088908));
          auVar190 = ZEXT3264(auVar109);
          auVar111 = vbroadcastss_avx512vl(ZEXT416(0x3ab743ce));
          auVar142 = ZEXT3264(auVar111);
          auVar110 = vfmadd213ps_avx512vl(auVar110,auVar112,auVar111);
          auVar109 = vfmadd213ps_avx512vl(auVar110,auVar112,auVar109);
          auVar110 = vfmadd213ps_avx512vl(ZEXT1632(auVar88),auVar138,auVar135);
          in_ZMM12 = ZEXT3264(auVar110);
          auVar111 = vbroadcastss_avx512vl(ZEXT416(0x3d2aa9c1));
          auVar146 = ZEXT3264(auVar111);
          auVar109 = vfmadd213ps_avx512vl(auVar109,auVar112,auVar111);
          auVar88 = vfmadd213ps_fma(auVar109,auVar112,auVar113);
          auVar88 = vfmadd213ps_fma(ZEXT1632(auVar88),auVar112,auVar269);
          auVar88 = vfmadd213ps_fma(ZEXT1632(auVar88),auVar63,auVar112);
          auVar109 = vpslld_avx512vl(auVar118,0x17);
          auVar111 = vpbroadcastd_avx512vl(ZEXT416(0x3f800000));
          auVar150 = ZEXT3264(auVar111);
          auVar109 = vpaddd_avx512vl(auVar109,auVar111);
          auVar222._0_4_ = (int)auVar127._0_4_;
          auVar222._4_4_ = (int)auVar127._4_4_;
          auVar222._8_4_ = (int)auVar127._8_4_;
          auVar222._12_4_ = (int)auVar127._12_4_;
          auVar222._16_4_ = (int)auVar127._16_4_;
          auVar222._20_4_ = (int)auVar127._20_4_;
          auVar222._24_4_ = (int)auVar127._24_4_;
          auVar222._28_4_ = (int)auVar127._28_4_;
          auVar105 = vfmadd213ps_avx512vl(auVar109,auVar105,auVar109);
          auVar109 = vpslld_avx2(auVar222,0x17);
          auVar109 = vpaddd_avx512vl(auVar109,auVar111);
          auVar218._0_4_ = (int)auVar128._0_4_;
          auVar218._4_4_ = (int)auVar128._4_4_;
          auVar218._8_4_ = (int)auVar128._8_4_;
          auVar218._12_4_ = (int)auVar128._12_4_;
          auVar218._16_4_ = (int)auVar128._16_4_;
          auVar218._20_4_ = (int)auVar128._20_4_;
          auVar218._24_4_ = (int)auVar128._24_4_;
          auVar218._28_4_ = (int)auVar128._28_4_;
          auVar109 = vfmadd213ps_avx512vl(auVar109,auVar116,auVar109);
          auVar112 = vpslld_avx2(auVar218,0x17);
          auVar112 = vpaddd_avx512vl(auVar112,auVar111);
          auVar248._0_4_ = (int)auVar132._0_4_;
          auVar248._4_4_ = (int)auVar132._4_4_;
          auVar248._8_4_ = (int)auVar132._8_4_;
          auVar248._12_4_ = (int)auVar132._12_4_;
          auVar248._16_4_ = (int)auVar132._16_4_;
          auVar248._20_4_ = (int)auVar132._20_4_;
          auVar248._24_4_ = (int)auVar132._24_4_;
          auVar248._28_4_ = (int)auVar132._28_4_;
          auVar112 = vfmadd213ps_avx512vl(auVar112,auVar120,auVar112);
          auVar116 = vpslld_avx2(auVar248,0x17);
          auVar116 = vpaddd_avx512vl(auVar116,auVar111);
          auVar118 = vcvttps2dq_avx512vl(auVar134);
          auVar89 = vfmadd213ps_fma(auVar116,auVar106,auVar116);
          auVar106 = vpslld_avx2(auVar118,0x17);
          auVar106 = vpaddd_avx512vl(auVar106,auVar111);
          auVar116 = vcvttps2dq_avx512vl(auVar136);
          auVar90 = vfmadd213ps_fma(auVar106,auVar104,auVar106);
          auVar104 = vpslld_avx2(auVar116,0x17);
          auVar104 = vpaddd_avx512vl(auVar104,auVar111);
          auVar237._0_4_ = (int)auVar139._0_4_;
          auVar237._4_4_ = (int)auVar139._4_4_;
          auVar237._8_4_ = (int)auVar139._8_4_;
          auVar237._12_4_ = (int)auVar139._12_4_;
          auVar237._16_4_ = (int)auVar139._16_4_;
          auVar237._20_4_ = (int)auVar139._20_4_;
          auVar237._24_4_ = (int)auVar139._24_4_;
          auVar237._28_4_ = (int)auVar139._28_4_;
          auVar116 = vfmadd213ps_avx512vl(auVar104,auVar107,auVar104);
          auVar104 = vpslld_avx2(auVar237,0x17);
          auVar104 = vpaddd_avx512vl(auVar104,auVar111);
          auVar211._0_4_ = (int)auVar140._0_4_;
          auVar211._4_4_ = (int)auVar140._4_4_;
          auVar211._8_4_ = (int)auVar140._8_4_;
          auVar211._12_4_ = (int)auVar140._12_4_;
          auVar211._16_4_ = (int)auVar140._16_4_;
          auVar211._20_4_ = (int)auVar140._20_4_;
          auVar211._24_4_ = (int)auVar140._24_4_;
          auVar211._28_4_ = (int)auVar140._28_4_;
          auVar91 = vfmadd213ps_fma(auVar104,auVar110,auVar104);
          auVar104 = vpslld_avx2(auVar211,0x17);
          auVar104 = vpaddd_avx512vl(auVar104,auVar111);
          auVar88 = vfmadd213ps_fma(auVar104,ZEXT1632(auVar88),auVar104);
          *(undefined1 (*) [32])*pauVar76 = auVar105;
          *(undefined1 (*) [32])(*pauVar76 + 0x20) = auVar109;
          *(undefined1 (*) [32])pauVar76[1] = auVar112;
          *(undefined1 (*) [32])(pauVar76[1] + 0x20) = ZEXT1632(auVar89);
          *(undefined1 (*) [32])pauVar76[2] = ZEXT1632(auVar90);
          *(undefined1 (*) [32])(pauVar76[2] + 0x20) = auVar116;
          *(undefined1 (*) [32])pauVar76[3] = ZEXT1632(auVar91);
          *(undefined1 (*) [32])(pauVar76[3] + 0x20) = ZEXT1632(auVar88);
          auVar106 = vunpcklps_avx(auVar105,ZEXT1632(auVar90));
          auVar104 = vunpckhps_avx(auVar105,ZEXT1632(auVar90));
          auVar107 = vunpcklps_avx(auVar112,ZEXT1632(auVar91));
          auVar105 = vunpckhps_avx(auVar112,ZEXT1632(auVar91));
          auVar202._0_4_ = auVar106._0_4_ + auVar104._0_4_;
          auVar202._4_4_ = auVar106._4_4_ + auVar104._4_4_;
          auVar202._8_4_ = auVar106._8_4_ + auVar104._8_4_;
          auVar202._12_4_ = auVar106._12_4_ + auVar104._12_4_;
          auVar202._16_4_ = auVar106._16_4_ + auVar104._16_4_;
          auVar202._20_4_ = auVar106._20_4_ + auVar104._20_4_;
          auVar202._24_4_ = auVar106._24_4_ + auVar104._24_4_;
          auVar202._28_4_ = auVar106._28_4_ + auVar104._28_4_;
          auVar219._0_4_ = auVar107._0_4_ + auVar105._0_4_;
          auVar219._4_4_ = auVar107._4_4_ + auVar105._4_4_;
          auVar219._8_4_ = auVar107._8_4_ + auVar105._8_4_;
          auVar219._12_4_ = auVar107._12_4_ + auVar105._12_4_;
          auVar219._16_4_ = auVar107._16_4_ + auVar105._16_4_;
          auVar219._20_4_ = auVar107._20_4_ + auVar105._20_4_;
          auVar219._24_4_ = auVar107._24_4_ + auVar105._24_4_;
          auVar219._28_4_ = auVar107._28_4_ + auVar105._28_4_;
          auVar105 = vunpcklps_avx(auVar109,auVar116);
          auVar104 = vunpckhps_avx(auVar109,auVar116);
          auVar223._0_4_ = auVar105._0_4_ + auVar104._0_4_;
          auVar223._4_4_ = auVar105._4_4_ + auVar104._4_4_;
          auVar223._8_4_ = auVar105._8_4_ + auVar104._8_4_;
          auVar223._12_4_ = auVar105._12_4_ + auVar104._12_4_;
          auVar223._16_4_ = auVar105._16_4_ + auVar104._16_4_;
          auVar223._20_4_ = auVar105._20_4_ + auVar104._20_4_;
          auVar223._24_4_ = auVar105._24_4_ + auVar104._24_4_;
          auVar223._28_4_ = auVar105._28_4_ + auVar104._28_4_;
          auVar105 = vunpcklps_avx(ZEXT1632(auVar89),ZEXT1632(auVar88));
          auVar104 = vunpckhps_avx(ZEXT1632(auVar89),ZEXT1632(auVar88));
          auVar212._0_4_ = auVar105._0_4_ + auVar104._0_4_;
          auVar212._4_4_ = auVar105._4_4_ + auVar104._4_4_;
          auVar212._8_4_ = auVar105._8_4_ + auVar104._8_4_;
          auVar212._12_4_ = auVar105._12_4_ + auVar104._12_4_;
          auVar212._16_4_ = auVar105._16_4_ + auVar104._16_4_;
          auVar212._20_4_ = auVar105._20_4_ + auVar104._20_4_;
          auVar212._24_4_ = auVar105._24_4_ + auVar104._24_4_;
          auVar212._28_4_ = auVar105._28_4_ + auVar104._28_4_;
          auVar106 = vunpcklps_avx(auVar202,auVar219);
          auVar104 = vunpckhps_avx(auVar202,auVar219);
          auVar107 = vunpcklps_avx(auVar223,auVar212);
          auVar105 = vunpckhps_avx(auVar223,auVar212);
          auVar203._0_4_ = auVar106._0_4_ + auVar104._0_4_;
          auVar203._4_4_ = auVar106._4_4_ + auVar104._4_4_;
          auVar203._8_4_ = auVar106._8_4_ + auVar104._8_4_;
          auVar203._12_4_ = auVar106._12_4_ + auVar104._12_4_;
          auVar203._16_4_ = auVar106._16_4_ + auVar104._16_4_;
          auVar203._20_4_ = auVar106._20_4_ + auVar104._20_4_;
          auVar203._24_4_ = auVar106._24_4_ + auVar104._24_4_;
          auVar203._28_4_ = auVar106._28_4_ + auVar104._28_4_;
          auVar213._0_4_ = auVar107._0_4_ + auVar105._0_4_;
          auVar213._4_4_ = auVar107._4_4_ + auVar105._4_4_;
          auVar213._8_4_ = auVar107._8_4_ + auVar105._8_4_;
          auVar213._12_4_ = auVar107._12_4_ + auVar105._12_4_;
          auVar213._16_4_ = auVar107._16_4_ + auVar105._16_4_;
          auVar213._20_4_ = auVar107._20_4_ + auVar105._20_4_;
          auVar213._24_4_ = auVar107._24_4_ + auVar105._24_4_;
          auVar213._28_4_ = auVar107._28_4_ + auVar105._28_4_;
          auVar105 = vunpcklps_avx(auVar203,auVar213);
          auVar104 = vunpckhps_avx(auVar203,auVar213);
          auVar106 = vperm2f128_avx(auVar105,auVar104,0x31);
          auVar204._0_4_ = auVar106._0_4_ + *(float *)*pauVar80 + auVar105._0_4_;
          auVar204._4_4_ = auVar106._4_4_ + *(float *)(*pauVar80 + 4) + auVar105._4_4_;
          auVar204._8_4_ = auVar106._8_4_ + *(float *)(*pauVar80 + 8) + auVar105._8_4_;
          auVar204._12_4_ = auVar106._12_4_ + *(float *)(*pauVar80 + 0xc) + auVar105._12_4_;
          auVar204._16_4_ = auVar106._16_4_ + *(float *)(*pauVar80 + 0x10) + auVar104._0_4_;
          auVar204._20_4_ = auVar106._20_4_ + *(float *)(*pauVar80 + 0x14) + auVar104._4_4_;
          auVar204._24_4_ = auVar106._24_4_ + *(float *)(*pauVar80 + 0x18) + auVar104._8_4_;
          auVar204._28_4_ = auVar106._28_4_ + *(float *)(*pauVar80 + 0x1c) + auVar104._12_4_;
          pauVar76 = pauVar76 + 4;
          pfVar83 = pfVar83 + 8;
          *(undefined1 (*) [32])*pauVar80 = auVar204;
          pauVar80 = (undefined1 (*) [64])(*pauVar80 + 0x20);
          uVar81 = uVar77 + 0xf;
          uVar77 = uVar77 + 8;
        }
        auVar116._8_4_ = 0xbf800000;
        auVar116._0_8_ = 0xbf800000bf800000;
        auVar116._12_4_ = 0xbf800000;
        auVar116._16_4_ = 0xbf800000;
        auVar116._20_4_ = 0xbf800000;
        auVar116._24_4_ = 0xbf800000;
        auVar116._28_4_ = 0xbf800000;
        auVar118._8_4_ = 0x395e8083;
        auVar118._0_8_ = 0x395e8083395e8083;
        auVar118._12_4_ = 0x395e8083;
        auVar118._16_4_ = 0x395e8083;
        auVar118._20_4_ = 0x395e8083;
        auVar118._24_4_ = 0x395e8083;
        auVar118._28_4_ = 0x395e8083;
        if ((int)uVar77 < size1) {
          lVar84 = 0;
          do {
            fVar193 = pfVar83[lVar84];
            auVar120._4_4_ = fVar193;
            auVar120._0_4_ = fVar193;
            auVar120._8_4_ = fVar193;
            auVar120._12_4_ = fVar193;
            auVar120._16_4_ = fVar193;
            auVar120._20_4_ = fVar193;
            auVar120._24_4_ = fVar193;
            auVar120._28_4_ = fVar193;
            auVar111 = vsubps_avx512vl(*(undefined1 (*) [32])*pauVar76,auVar120);
            auVar111 = vminps_avx(auVar111,auVar108);
            auVar112 = vmaxps_avx512vl(auVar111,auVar157._0_32_);
            auVar88 = vfmadd231ps_fma(auVar104,auVar112,auVar114);
            auVar111 = vroundps_avx(ZEXT1632(auVar88),1);
            uVar82 = vcmpps_avx512vl(ZEXT1632(auVar88),auVar111,1);
            auVar120 = vaddps_avx512vl(auVar111,auVar116);
            bVar6 = (bool)((byte)uVar82 & 1);
            auVar122._0_4_ = (float)((uint)bVar6 * auVar120._0_4_ | (uint)!bVar6 * auVar111._0_4_);
            bVar6 = (bool)((byte)(uVar82 >> 1) & 1);
            auVar122._4_4_ = (float)((uint)bVar6 * auVar120._4_4_ | (uint)!bVar6 * auVar111._4_4_);
            bVar6 = (bool)((byte)(uVar82 >> 2) & 1);
            auVar122._8_4_ = (float)((uint)bVar6 * auVar120._8_4_ | (uint)!bVar6 * auVar111._8_4_);
            bVar6 = (bool)((byte)(uVar82 >> 3) & 1);
            auVar122._12_4_ =
                 (float)((uint)bVar6 * auVar120._12_4_ | (uint)!bVar6 * auVar111._12_4_);
            bVar6 = (bool)((byte)(uVar82 >> 4) & 1);
            auVar122._16_4_ =
                 (float)((uint)bVar6 * auVar120._16_4_ | (uint)!bVar6 * auVar111._16_4_);
            bVar6 = (bool)((byte)(uVar82 >> 5) & 1);
            auVar122._20_4_ =
                 (float)((uint)bVar6 * auVar120._20_4_ | (uint)!bVar6 * auVar111._20_4_);
            bVar6 = (bool)((byte)(uVar82 >> 6) & 1);
            auVar122._24_4_ =
                 (float)((uint)bVar6 * auVar120._24_4_ | (uint)!bVar6 * auVar111._24_4_);
            bVar6 = SUB81(uVar82 >> 7,0);
            auVar122._28_4_ =
                 (float)((uint)bVar6 * auVar120._28_4_ | (uint)!bVar6 * auVar111._28_4_);
            auVar111 = vfmsub231ps_avx512vl(auVar112,auVar122,auVar106);
            auVar89 = vfmsub231ps_fma(auVar111,auVar122,auVar118);
            auVar112 = ZEXT1632(auVar89);
            auVar111 = vfmadd213ps_avx512vl(auVar109,auVar112,auVar105);
            auVar111 = vfmadd213ps_avx512vl(auVar111,auVar112,auVar110);
            auVar111 = vfmadd213ps_avx512vl(auVar111,auVar112,auVar107);
            auVar112 = ZEXT1632(auVar89);
            auVar88 = vfmadd213ps_fma(auVar111,auVar112,auVar113);
            auVar88 = vfmadd213ps_fma(ZEXT1632(auVar88),auVar112,auVar104);
            auVar88 = vfmadd213ps_fma(ZEXT1632(auVar88),
                                      ZEXT1632(CONCAT412(auVar89._12_4_ * auVar89._12_4_,
                                                         CONCAT48(auVar89._8_4_ * auVar89._8_4_,
                                                                  CONCAT44(auVar89._4_4_ *
                                                                           auVar89._4_4_,
                                                                           auVar89._0_4_ *
                                                                           auVar89._0_4_)))),
                                      auVar112);
            auVar123._0_4_ = (int)auVar122._0_4_;
            auVar123._4_4_ = (int)auVar122._4_4_;
            auVar123._8_4_ = (int)auVar122._8_4_;
            auVar123._12_4_ = (int)auVar122._12_4_;
            auVar123._16_4_ = (int)auVar122._16_4_;
            auVar123._20_4_ = (int)auVar122._20_4_;
            auVar123._24_4_ = (int)auVar122._24_4_;
            auVar123._28_4_ = (int)auVar122._28_4_;
            auVar111 = vpslld_avx2(auVar123,0x17);
            auVar111 = vpaddd_avx512vl(auVar111,auVar150._0_32_);
            auVar88 = vfmadd213ps_fma(auVar111,ZEXT1632(auVar88),auVar111);
            *(undefined1 (*) [32])*pauVar76 = ZEXT1632(auVar88);
            auVar89._0_4_ = auVar88._0_4_ + 0.0;
            auVar89._4_4_ = auVar88._4_4_ + 0.0;
            auVar89._8_4_ = auVar88._8_4_ + 0.0;
            auVar89._12_4_ = auVar88._12_4_ + 0.0;
            auVar88 = vshufpd_avx(auVar89,auVar89,1);
            auVar90._0_4_ = auVar88._0_4_ + auVar89._0_4_;
            auVar90._4_4_ = auVar88._4_4_ + auVar89._4_4_;
            auVar90._8_4_ = auVar88._8_4_ + auVar89._8_4_;
            auVar90._12_4_ = auVar88._12_4_ + auVar89._12_4_;
            auVar88 = vmovshdup_avx(auVar90);
            *(float *)(*pauVar80 + lVar84 * 4) =
                 auVar88._0_4_ + *(float *)(*pauVar80 + lVar84 * 4) + auVar90._0_4_;
            pauVar76 = (undefined1 (*) [64])(*pauVar76 + 0x20);
            lVar84 = lVar84 + 1;
          } while (size1 - uVar77 != (int)lVar84);
        }
        uVar78 = uVar78 + 1;
      } while (uVar78 != (uint)elemcount);
    }
    uVar77 = 0;
    pauVar76 = (undefined1 (*) [64])_sumptr;
    if (0xf < size1) {
      iVar79 = 0xf;
      auVar141 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
      do {
        auVar142 = vdivps_avx512f(auVar141,*pauVar76);
        *pauVar76 = auVar142;
        pauVar76 = pauVar76 + 1;
        iVar79 = iVar79 + 0x10;
      } while (iVar79 < size1);
      uVar77 = size1 & 0x7ffffff0;
    }
    if ((int)(uVar77 | 7) < size1) {
      auVar205._8_4_ = 0x3f800000;
      auVar205._0_8_ = 0x3f8000003f800000;
      auVar205._12_4_ = 0x3f800000;
      auVar205._16_4_ = 0x3f800000;
      auVar205._20_4_ = 0x3f800000;
      auVar205._24_4_ = 0x3f800000;
      auVar205._28_4_ = 0x3f800000;
      uVar81 = uVar77;
      do {
        auVar104 = vdivps_avx(auVar205,*(undefined1 (*) [32])*pauVar76);
        *(undefined1 (*) [32])*pauVar76 = auVar104;
        pauVar76 = (undefined1 (*) [64])(*pauVar76 + 0x20);
        uVar77 = uVar81 + 8;
        iVar79 = uVar81 + 0xf;
        uVar81 = uVar77;
      } while (iVar79 < size1);
    }
    if ((int)(uVar77 | 3) < size1) {
      auVar91._8_4_ = 0x3f800000;
      auVar91._0_8_ = 0x3f8000003f800000;
      auVar91._12_4_ = 0x3f800000;
      uVar81 = uVar77;
      do {
        auVar88 = vdivps_avx(auVar91,*(undefined1 (*) [16])*pauVar76);
        *(undefined1 (*) [16])*pauVar76 = auVar88;
        pauVar76 = (undefined1 (*) [64])(*pauVar76 + 0x10);
        uVar77 = uVar81 + 4;
        iVar79 = uVar81 + 7;
        uVar81 = uVar77;
      } while (iVar79 < size1);
    }
    if ((int)uVar77 < size1) {
      auVar141 = vpbroadcastq_avx512f();
      uVar78 = 0;
      auVar142 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar143 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      auVar144 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
      do {
        auVar145 = vpbroadcastq_avx512f();
        auVar146 = vporq_avx512f(auVar145,auVar142);
        auVar145 = vporq_avx512f(auVar145,auVar143);
        uVar21 = vpcmpuq_avx512f(auVar145,auVar141,2);
        bVar61 = (byte)uVar21;
        uVar21 = vpcmpuq_avx512f(auVar146,auVar141,2);
        bVar64 = (byte)uVar21;
        uVar87 = CONCAT11(bVar64,bVar61);
        piVar2 = (int *)(*pauVar76 + uVar78 * 4);
        auVar145._4_4_ = (uint)((byte)(uVar87 >> 1) & 1) * piVar2[1];
        auVar145._0_4_ = (uint)(bVar61 & 1) * *piVar2;
        auVar145._8_4_ = (uint)((byte)(uVar87 >> 2) & 1) * piVar2[2];
        auVar145._12_4_ = (uint)((byte)(uVar87 >> 3) & 1) * piVar2[3];
        auVar145._16_4_ = (uint)((byte)(uVar87 >> 4) & 1) * piVar2[4];
        auVar145._20_4_ = (uint)((byte)(uVar87 >> 5) & 1) * piVar2[5];
        auVar145._24_4_ = (uint)((byte)(uVar87 >> 6) & 1) * piVar2[6];
        auVar145._28_4_ = (uint)((byte)(uVar87 >> 7) & 1) * piVar2[7];
        auVar145._32_4_ = (uint)(bVar64 & 1) * piVar2[8];
        auVar145._36_4_ = (uint)(bVar64 >> 1 & 1) * piVar2[9];
        auVar145._40_4_ = (uint)(bVar64 >> 2 & 1) * piVar2[10];
        auVar145._44_4_ = (uint)(bVar64 >> 3 & 1) * piVar2[0xb];
        auVar145._48_4_ = (uint)(bVar64 >> 4 & 1) * piVar2[0xc];
        auVar145._52_4_ = (uint)(bVar64 >> 5 & 1) * piVar2[0xd];
        auVar145._56_4_ = (uint)(bVar64 >> 6 & 1) * piVar2[0xe];
        auVar145._60_4_ = (uint)(bVar64 >> 7) * piVar2[0xf];
        auVar145 = vdivps_avx512f(auVar144,auVar145);
        puVar1 = (uint *)(*pauVar76 + uVar78 * 4);
        bVar6 = (bool)((byte)(uVar87 >> 1) & 1);
        bVar7 = (bool)((byte)(uVar87 >> 2) & 1);
        bVar8 = (bool)((byte)(uVar87 >> 3) & 1);
        bVar9 = (bool)((byte)(uVar87 >> 4) & 1);
        bVar10 = (bool)((byte)(uVar87 >> 5) & 1);
        bVar11 = (bool)((byte)(uVar87 >> 6) & 1);
        bVar12 = (bool)((byte)(uVar87 >> 7) & 1);
        bVar13 = (bool)(bVar64 >> 1 & 1);
        bVar14 = (bool)(bVar64 >> 2 & 1);
        bVar15 = (bool)(bVar64 >> 3 & 1);
        bVar16 = (bool)(bVar64 >> 4 & 1);
        bVar17 = (bool)(bVar64 >> 5 & 1);
        bVar18 = (bool)(bVar64 >> 6 & 1);
        *puVar1 = (uint)(bVar61 & 1) * auVar145._0_4_ | (uint)!(bool)(bVar61 & 1) * *puVar1;
        puVar1[1] = (uint)bVar6 * auVar145._4_4_ | (uint)!bVar6 * puVar1[1];
        puVar1[2] = (uint)bVar7 * auVar145._8_4_ | (uint)!bVar7 * puVar1[2];
        puVar1[3] = (uint)bVar8 * auVar145._12_4_ | (uint)!bVar8 * puVar1[3];
        puVar1[4] = (uint)bVar9 * auVar145._16_4_ | (uint)!bVar9 * puVar1[4];
        puVar1[5] = (uint)bVar10 * auVar145._20_4_ | (uint)!bVar10 * puVar1[5];
        puVar1[6] = (uint)bVar11 * auVar145._24_4_ | (uint)!bVar11 * puVar1[6];
        puVar1[7] = (uint)bVar12 * auVar145._28_4_ | (uint)!bVar12 * puVar1[7];
        puVar1[8] = (uint)(bVar64 & 1) * auVar145._32_4_ | (uint)!(bool)(bVar64 & 1) * puVar1[8];
        puVar1[9] = (uint)bVar13 * auVar145._36_4_ | (uint)!bVar13 * puVar1[9];
        puVar1[10] = (uint)bVar14 * auVar145._40_4_ | (uint)!bVar14 * puVar1[10];
        puVar1[0xb] = (uint)bVar15 * auVar145._44_4_ | (uint)!bVar15 * puVar1[0xb];
        puVar1[0xc] = (uint)bVar16 * auVar145._48_4_ | (uint)!bVar16 * puVar1[0xc];
        puVar1[0xd] = (uint)bVar17 * auVar145._52_4_ | (uint)!bVar17 * puVar1[0xd];
        puVar1[0xe] = (uint)bVar18 * auVar145._56_4_ | (uint)!bVar18 * puVar1[0xe];
        puVar1[0xf] = (uint)(bVar64 >> 7) * auVar145._60_4_ |
                      (uint)!(bool)(bVar64 >> 7) * puVar1[0xf];
        uVar78 = uVar78 + 0x10;
      } while (((ulong)(~uVar77 + size1) + 0x10 & 0xfffffffffffffff0) != uVar78);
    }
    if (0 < elemcount) {
      uVar78 = 0;
      do {
        pauVar76 = (undefined1 (*) [64])(_ptr + uVar78 * (long)stride);
        pfVar83 = _sumptr;
        if (size1 < 0x10) {
          uVar77 = 0;
        }
        else {
          iVar79 = 0xf;
          do {
            fVar193 = *pfVar83;
            fVar5 = pfVar83[1];
            auVar214._4_4_ = fVar5;
            auVar214._0_4_ = fVar5;
            auVar214._8_4_ = fVar5;
            auVar214._12_4_ = fVar5;
            auVar214._16_4_ = fVar5;
            auVar214._20_4_ = fVar5;
            auVar214._24_4_ = fVar5;
            auVar214._28_4_ = fVar5;
            fVar5 = pfVar83[2];
            fVar4 = pfVar83[3];
            auVar224._4_4_ = fVar4;
            auVar224._0_4_ = fVar4;
            auVar224._8_4_ = fVar4;
            auVar224._12_4_ = fVar4;
            auVar224._16_4_ = fVar4;
            auVar224._20_4_ = fVar4;
            auVar224._24_4_ = fVar4;
            auVar224._28_4_ = fVar4;
            auVar141 = vinsertf64x4_avx512f
                                 (ZEXT3264(CONCAT428(fVar193,CONCAT424(fVar193,CONCAT420(fVar193,
                                                  CONCAT416(fVar193,CONCAT412(fVar193,CONCAT48(
                                                  fVar193,CONCAT44(fVar193,fVar193)))))))),auVar214,
                                  1);
            auVar142 = vinsertf64x4_avx512f
                                 (ZEXT3264(CONCAT428(fVar5,CONCAT424(fVar5,CONCAT420(fVar5,CONCAT416
                                                  (fVar5,CONCAT412(fVar5,CONCAT48(fVar5,CONCAT44(
                                                  fVar5,fVar5)))))))),auVar224,1);
            fVar193 = pfVar83[4];
            fVar5 = pfVar83[5];
            auVar225._4_4_ = fVar5;
            auVar225._0_4_ = fVar5;
            auVar225._8_4_ = fVar5;
            auVar225._12_4_ = fVar5;
            auVar225._16_4_ = fVar5;
            auVar225._20_4_ = fVar5;
            auVar225._24_4_ = fVar5;
            auVar225._28_4_ = fVar5;
            fVar5 = pfVar83[6];
            auVar143 = vinsertf64x4_avx512f
                                 (ZEXT3264(CONCAT428(fVar193,CONCAT424(fVar193,CONCAT420(fVar193,
                                                  CONCAT416(fVar193,CONCAT412(fVar193,CONCAT48(
                                                  fVar193,CONCAT44(fVar193,fVar193)))))))),auVar225,
                                  1);
            fVar193 = pfVar83[7];
            auVar226._4_4_ = fVar193;
            auVar226._0_4_ = fVar193;
            auVar226._8_4_ = fVar193;
            auVar226._12_4_ = fVar193;
            auVar226._16_4_ = fVar193;
            auVar226._20_4_ = fVar193;
            auVar226._24_4_ = fVar193;
            auVar226._28_4_ = fVar193;
            auVar144 = vinsertf64x4_avx512f
                                 (ZEXT3264(CONCAT428(fVar5,CONCAT424(fVar5,CONCAT420(fVar5,CONCAT416
                                                  (fVar5,CONCAT412(fVar5,CONCAT48(fVar5,CONCAT44(
                                                  fVar5,fVar5)))))))),auVar226,1);
            fVar193 = pfVar83[8];
            fVar5 = pfVar83[9];
            auVar230._4_4_ = fVar5;
            auVar230._0_4_ = fVar5;
            auVar230._8_4_ = fVar5;
            auVar230._12_4_ = fVar5;
            auVar230._16_4_ = fVar5;
            auVar230._20_4_ = fVar5;
            auVar230._24_4_ = fVar5;
            auVar230._28_4_ = fVar5;
            fVar5 = pfVar83[10];
            fVar4 = pfVar83[0xb];
            auVar238._4_4_ = fVar4;
            auVar238._0_4_ = fVar4;
            auVar238._8_4_ = fVar4;
            auVar238._12_4_ = fVar4;
            auVar238._16_4_ = fVar4;
            auVar238._20_4_ = fVar4;
            auVar238._24_4_ = fVar4;
            auVar238._28_4_ = fVar4;
            auVar145 = vinsertf64x4_avx512f
                                 (ZEXT3264(CONCAT428(fVar193,CONCAT424(fVar193,CONCAT420(fVar193,
                                                  CONCAT416(fVar193,CONCAT412(fVar193,CONCAT48(
                                                  fVar193,CONCAT44(fVar193,fVar193)))))))),auVar230,
                                  1);
            auVar146 = vinsertf64x4_avx512f
                                 (ZEXT3264(CONCAT428(fVar5,CONCAT424(fVar5,CONCAT420(fVar5,CONCAT416
                                                  (fVar5,CONCAT412(fVar5,CONCAT48(fVar5,CONCAT44(
                                                  fVar5,fVar5)))))))),auVar238,1);
            fVar193 = pfVar83[0xc];
            fVar5 = pfVar83[0xd];
            auVar239._4_4_ = fVar5;
            auVar239._0_4_ = fVar5;
            auVar239._8_4_ = fVar5;
            auVar239._12_4_ = fVar5;
            auVar239._16_4_ = fVar5;
            auVar239._20_4_ = fVar5;
            auVar239._24_4_ = fVar5;
            auVar239._28_4_ = fVar5;
            fVar5 = pfVar83[0xe];
            auVar189 = vinsertf64x4_avx512f
                                 (ZEXT3264(CONCAT428(fVar193,CONCAT424(fVar193,CONCAT420(fVar193,
                                                  CONCAT416(fVar193,CONCAT412(fVar193,CONCAT48(
                                                  fVar193,CONCAT44(fVar193,fVar193)))))))),auVar239,
                                  1);
            fVar193 = pfVar83[0xf];
            auVar240._4_4_ = fVar193;
            auVar240._0_4_ = fVar193;
            auVar240._8_4_ = fVar193;
            auVar240._12_4_ = fVar193;
            auVar240._16_4_ = fVar193;
            auVar240._20_4_ = fVar193;
            auVar240._24_4_ = fVar193;
            auVar240._28_4_ = fVar193;
            auVar190 = vinsertf64x4_avx512f
                                 (ZEXT3264(CONCAT428(fVar5,CONCAT424(fVar5,CONCAT420(fVar5,CONCAT416
                                                  (fVar5,CONCAT412(fVar5,CONCAT48(fVar5,CONCAT44(
                                                  fVar5,fVar5)))))))),auVar240,1);
            auVar141 = vmulps_avx512f(auVar141,*pauVar76);
            auVar142 = vmulps_avx512f(auVar142,pauVar76[1]);
            auVar143 = vmulps_avx512f(auVar143,pauVar76[2]);
            auVar144 = vmulps_avx512f(auVar144,pauVar76[3]);
            auVar145 = vmulps_avx512f(auVar145,pauVar76[4]);
            auVar146 = vmulps_avx512f(auVar146,pauVar76[5]);
            auVar189 = vmulps_avx512f(auVar189,pauVar76[6]);
            auVar190 = vmulps_avx512f(auVar190,pauVar76[7]);
            *pauVar76 = auVar141;
            pauVar76[1] = auVar142;
            pauVar76[2] = auVar143;
            pauVar76[3] = auVar144;
            pauVar76[4] = auVar145;
            pauVar76[5] = auVar146;
            pauVar76[6] = auVar189;
            pauVar76[7] = auVar190;
            pauVar76 = pauVar76 + 8;
            pfVar83 = pfVar83 + 0x10;
            iVar79 = iVar79 + 0x10;
            uVar77 = size1 & 0xfffffff0;
          } while (iVar79 < size1);
        }
        uVar81 = uVar77 | 3;
        while ((int)uVar81 < size1) {
          fVar193 = *pfVar83;
          auVar70._4_4_ = fVar193 * *(float *)(*pauVar76 + 4);
          auVar70._0_4_ = fVar193 * *(float *)*pauVar76;
          auVar70._8_4_ = fVar193 * *(float *)(*pauVar76 + 8);
          auVar70._12_4_ = fVar193 * *(float *)(*pauVar76 + 0xc);
          auVar70._16_4_ = fVar193 * *(float *)(*pauVar76 + 0x10);
          auVar70._20_4_ = fVar193 * *(float *)(*pauVar76 + 0x14);
          auVar70._24_4_ = fVar193 * *(float *)(*pauVar76 + 0x18);
          auVar70._28_4_ = fVar193;
          fVar193 = pfVar83[1];
          auVar71._4_4_ = fVar193 * *(float *)(*pauVar76 + 0x24);
          auVar71._0_4_ = fVar193 * *(float *)(*pauVar76 + 0x20);
          auVar71._8_4_ = fVar193 * *(float *)(*pauVar76 + 0x28);
          auVar71._12_4_ = fVar193 * *(float *)(*pauVar76 + 0x2c);
          auVar71._16_4_ = fVar193 * *(float *)(*pauVar76 + 0x30);
          auVar71._20_4_ = fVar193 * *(float *)(*pauVar76 + 0x34);
          auVar71._24_4_ = fVar193 * *(float *)(*pauVar76 + 0x38);
          auVar71._28_4_ = fVar193;
          fVar193 = pfVar83[2];
          auVar72._4_4_ = fVar193 * *(float *)(pauVar76[1] + 4);
          auVar72._0_4_ = fVar193 * *(float *)pauVar76[1];
          auVar72._8_4_ = fVar193 * *(float *)(pauVar76[1] + 8);
          auVar72._12_4_ = fVar193 * *(float *)(pauVar76[1] + 0xc);
          auVar72._16_4_ = fVar193 * *(float *)(pauVar76[1] + 0x10);
          auVar72._20_4_ = fVar193 * *(float *)(pauVar76[1] + 0x14);
          auVar72._24_4_ = fVar193 * *(float *)(pauVar76[1] + 0x18);
          auVar72._28_4_ = fVar193;
          fVar193 = pfVar83[3];
          auVar73._4_4_ = fVar193 * *(float *)(pauVar76[1] + 0x24);
          auVar73._0_4_ = fVar193 * *(float *)(pauVar76[1] + 0x20);
          auVar73._8_4_ = fVar193 * *(float *)(pauVar76[1] + 0x28);
          auVar73._12_4_ = fVar193 * *(float *)(pauVar76[1] + 0x2c);
          auVar73._16_4_ = fVar193 * *(float *)(pauVar76[1] + 0x30);
          auVar73._20_4_ = fVar193 * *(float *)(pauVar76[1] + 0x34);
          auVar73._24_4_ = fVar193 * *(float *)(pauVar76[1] + 0x38);
          auVar73._28_4_ = fVar193;
          *(undefined1 (*) [32])*pauVar76 = auVar70;
          *(undefined1 (*) [32])(*pauVar76 + 0x20) = auVar71;
          *(undefined1 (*) [32])pauVar76[1] = auVar72;
          *(undefined1 (*) [32])(pauVar76[1] + 0x20) = auVar73;
          pauVar76 = pauVar76 + 2;
          pfVar83 = pfVar83 + 4;
          uVar81 = uVar77 + 7;
          uVar77 = uVar77 + 4;
        }
        if ((int)uVar77 < size1) {
          lVar84 = 0;
          do {
            fVar193 = pfVar83[lVar84];
            auVar74._4_4_ = fVar193 * *(float *)(*pauVar76 + 4);
            auVar74._0_4_ = fVar193 * *(float *)*pauVar76;
            auVar74._8_4_ = fVar193 * *(float *)(*pauVar76 + 8);
            auVar74._12_4_ = fVar193 * *(float *)(*pauVar76 + 0xc);
            auVar74._16_4_ = fVar193 * *(float *)(*pauVar76 + 0x10);
            auVar74._20_4_ = fVar193 * *(float *)(*pauVar76 + 0x14);
            auVar74._24_4_ = fVar193 * *(float *)(*pauVar76 + 0x18);
            auVar74._28_4_ = fVar193;
            *(undefined1 (*) [32])*pauVar76 = auVar74;
            pauVar76 = (undefined1 (*) [64])(*pauVar76 + 0x20);
            lVar84 = lVar84 + 1;
          } while (size1 - uVar77 != (int)lVar84);
        }
        uVar78 = uVar78 + 1;
      } while (uVar78 != (uint)elemcount);
    }
  }
  else if (elempack == 0x10) {
    lVar84 = (long)stride;
    uVar78 = (ulong)(uint)elemcount;
    if (0 < elemcount) {
      uVar82 = 0;
      do {
        pauVar76 = (undefined1 (*) [64])(_ptr + uVar82 * lVar84);
        pauVar80 = (undefined1 (*) [64])_maxptr;
        if (size1 < 0x10) {
          uVar77 = 0;
        }
        else {
          iVar79 = 0xf;
          do {
            auVar141 = vunpcklps_avx512f(*pauVar76,pauVar76[1]);
            auVar142 = vunpckhps_avx512f(*pauVar76,pauVar76[1]);
            auVar141 = vmaxps_avx512f(auVar141,auVar142);
            auVar142 = vunpcklps_avx512f(pauVar76[2],pauVar76[3]);
            auVar143 = vunpckhps_avx512f(pauVar76[2],pauVar76[3]);
            auVar142 = vmaxps_avx512f(auVar142,auVar143);
            auVar143 = vunpcklps_avx512f(pauVar76[4],pauVar76[5]);
            auVar144 = vunpckhps_avx512f(pauVar76[4],pauVar76[5]);
            auVar143 = vmaxps_avx512f(auVar143,auVar144);
            auVar144 = vunpcklps_avx512f(pauVar76[6],pauVar76[7]);
            auVar145 = vunpckhps_avx512f(pauVar76[6],pauVar76[7]);
            auVar144 = vmaxps_avx512f(auVar144,auVar145);
            auVar145 = vunpcklps_avx512f(pauVar76[8],pauVar76[9]);
            auVar146 = vunpckhps_avx512f(pauVar76[8],pauVar76[9]);
            auVar145 = vmaxps_avx512f(auVar145,auVar146);
            auVar146 = vunpcklps_avx512f(pauVar76[10],pauVar76[0xb]);
            auVar189 = vunpckhps_avx512f(pauVar76[10],pauVar76[0xb]);
            auVar146 = vmaxps_avx512f(auVar146,auVar189);
            auVar189 = vunpcklps_avx512f(pauVar76[0xc],pauVar76[0xd]);
            auVar190 = vunpckhps_avx512f(pauVar76[0xc],pauVar76[0xd]);
            auVar189 = vmaxps_avx512f(auVar189,auVar190);
            auVar190 = vunpcklps_avx512f(pauVar76[0xe],pauVar76[0xf]);
            auVar157 = vunpckhps_avx512f(pauVar76[0xe],pauVar76[0xf]);
            auVar190 = vmaxps_avx512f(auVar190,auVar157);
            auVar157 = vunpcklpd_avx512f(auVar141,auVar142);
            auVar141 = vunpckhpd_avx512f(auVar141,auVar142);
            auVar141 = vmaxps_avx512f(auVar157,auVar141);
            auVar142 = vunpcklpd_avx512f(auVar143,auVar144);
            auVar143 = vunpckhpd_avx512f(auVar143,auVar144);
            auVar142 = vmaxps_avx512f(auVar142,auVar143);
            auVar143 = vunpcklpd_avx512f(auVar145,auVar146);
            auVar144 = vunpckhpd_avx512f(auVar145,auVar146);
            auVar143 = vmaxps_avx512f(auVar143,auVar144);
            auVar144 = vunpcklpd_avx512f(auVar189,auVar190);
            auVar145 = vunpckhpd_avx512f(auVar189,auVar190);
            auVar144 = vmaxps_avx512f(auVar144,auVar145);
            auVar145 = vinsertf64x4_avx512f(auVar141,auVar142._0_32_,1);
            auVar141 = vshuff64x2_avx512f(auVar141,auVar142,0xee);
            auVar141 = vmaxps_avx512f(auVar145,auVar141);
            auVar142 = vinsertf64x4_avx512f(auVar143,auVar144._0_32_,1);
            auVar143 = vshuff64x2_avx512f(auVar143,auVar144,0xee);
            auVar142 = vmaxps_avx512f(auVar142,auVar143);
            auVar143 = vshuff64x2_avx512f(auVar141,auVar142,0x88);
            auVar141 = vshuff64x2_avx512f(auVar141,auVar142,0xdd);
            auVar141 = vmaxps_avx512f(auVar143,auVar141);
            auVar141 = vmaxps_avx512f(auVar141,*pauVar80);
            *pauVar80 = auVar141;
            pauVar76 = pauVar76 + 0x10;
            pauVar80 = pauVar80 + 1;
            iVar79 = iVar79 + 0x10;
            uVar77 = size1 & 0xfffffff0U;
          } while (iVar79 < size1);
        }
        if ((int)uVar77 < size1) {
          lVar86 = 0;
          do {
            auVar104 = vmaxps_avx(*(undefined1 (*) [32])*pauVar76,
                                  *(undefined1 (*) [32])(*pauVar76 + 0x20));
            auVar88 = vmaxps_avx(auVar104._0_16_,auVar104._16_16_);
            auVar89 = vshufpd_avx(auVar88,auVar88,3);
            auVar88 = vmaxps_avx(auVar88,auVar89);
            auVar89 = vmovshdup_avx(auVar88);
            auVar88 = vmaxss_avx(auVar88,auVar89);
            auVar88 = vmaxss_avx(auVar88,ZEXT416(*(uint *)(*pauVar80 + lVar86 * 4)));
            *(int *)(*pauVar80 + lVar86 * 4) = auVar88._0_4_;
            pauVar76 = pauVar76 + 1;
            lVar86 = lVar86 + 1;
          } while (size1 - uVar77 != (int)lVar86);
        }
        afVar75 = ::_ps512_1;
        uVar82 = uVar82 + 1;
      } while (uVar82 != uVar78);
      auVar141 = vbroadcastss_avx512f(ZEXT416(0x80000000));
      auVar142 = vxorps_avx512dq(auVar141,(undefined1  [64])::_ps512_cephes_exp_C1);
      auVar141 = vxorps_avx512dq(auVar141,(undefined1  [64])::_ps512_cephes_exp_C2);
      auVar143 = vmovdqa64_avx512f((undefined1  [64])::_pi32_512_0x7f);
      uVar82 = 0;
      afVar232 = ::_ps512_cephes_LOG2EF;
      afVar231 = ::_ps512_cephes_exp_p0;
      afVar245 = ::_ps512_cephes_exp_p1;
      afVar249 = ::_ps512_cephes_exp_p2;
      afVar252 = ::_ps512_cephes_exp_p3;
      afVar257 = ::_ps512_cephes_exp_p4;
      afVar270 = ::_ps512_exp_lo;
      afVar271 = ::_ps512_exp_hi;
      afVar272 = ::_ps512_cephes_exp_p5;
      do {
        pauVar76 = (undefined1 (*) [64])(_ptr + uVar82 * lVar84);
        pauVar80 = (undefined1 (*) [64])_sumptr;
        pfVar83 = _maxptr;
        if (size1 < 0x10) {
          uVar77 = 0;
        }
        else {
          iVar79 = 0xf;
          afVar231 = afVar232;
          afVar245 = afVar271;
          afVar249 = afVar272;
          do {
            afVar272 = ::_ps512_cephes_exp_p5;
            afVar232 = ::_ps512_cephes_LOG2EF;
            afVar271 = ::_ps512_exp_hi;
            fVar193 = *pfVar83;
            auVar143._4_4_ = fVar193;
            auVar143._0_4_ = fVar193;
            auVar143._8_4_ = fVar193;
            auVar143._12_4_ = fVar193;
            auVar143._16_4_ = fVar193;
            auVar143._20_4_ = fVar193;
            auVar143._24_4_ = fVar193;
            auVar143._28_4_ = fVar193;
            auVar143._32_4_ = fVar193;
            auVar143._36_4_ = fVar193;
            auVar143._40_4_ = fVar193;
            auVar143._44_4_ = fVar193;
            auVar143._48_4_ = fVar193;
            auVar143._52_4_ = fVar193;
            auVar143._56_4_ = fVar193;
            auVar143._60_4_ = fVar193;
            auVar143 = vsubps_avx512f(*pauVar76,auVar143);
            auVar143 = vminps_avx512f(auVar143,(undefined1  [64])afVar245);
            auVar143 = vmaxps_avx512f(auVar143,(undefined1  [64])afVar270);
            auVar145 = vfmadd213ps_avx512f((undefined1  [64])afVar231,auVar143,
                                           (undefined1  [64])afVar249);
            auVar146 = vrndscaleps_avx512f(auVar145,1);
            fVar193 = pfVar83[1];
            auVar144._4_4_ = fVar193;
            auVar144._0_4_ = fVar193;
            auVar144._8_4_ = fVar193;
            auVar144._12_4_ = fVar193;
            auVar144._16_4_ = fVar193;
            auVar144._20_4_ = fVar193;
            auVar144._24_4_ = fVar193;
            auVar144._28_4_ = fVar193;
            auVar144._32_4_ = fVar193;
            auVar144._36_4_ = fVar193;
            auVar144._40_4_ = fVar193;
            auVar144._44_4_ = fVar193;
            auVar144._48_4_ = fVar193;
            auVar144._52_4_ = fVar193;
            auVar144._56_4_ = fVar193;
            auVar144._60_4_ = fVar193;
            auVar144 = vsubps_avx512f(pauVar76[1],auVar144);
            uVar20 = vcmpps_avx512f(auVar145,auVar146,1);
            auVar145 = vsubps_avx512f(auVar146,(undefined1  [64])afVar75);
            bVar6 = (bool)((byte)uVar20 & 1);
            auVar183._0_4_ = (uint)bVar6 * auVar145._0_4_ | (uint)!bVar6 * auVar146._0_4_;
            bVar6 = (bool)((byte)(uVar20 >> 1) & 1);
            auVar183._4_4_ = (uint)bVar6 * auVar145._4_4_ | (uint)!bVar6 * auVar146._4_4_;
            bVar6 = (bool)((byte)(uVar20 >> 2) & 1);
            auVar183._8_4_ = (uint)bVar6 * auVar145._8_4_ | (uint)!bVar6 * auVar146._8_4_;
            bVar6 = (bool)((byte)(uVar20 >> 3) & 1);
            auVar183._12_4_ = (uint)bVar6 * auVar145._12_4_ | (uint)!bVar6 * auVar146._12_4_;
            bVar6 = (bool)((byte)(uVar20 >> 4) & 1);
            auVar183._16_4_ = (uint)bVar6 * auVar145._16_4_ | (uint)!bVar6 * auVar146._16_4_;
            bVar6 = (bool)((byte)(uVar20 >> 5) & 1);
            auVar183._20_4_ = (uint)bVar6 * auVar145._20_4_ | (uint)!bVar6 * auVar146._20_4_;
            bVar6 = (bool)((byte)(uVar20 >> 6) & 1);
            auVar183._24_4_ = (uint)bVar6 * auVar145._24_4_ | (uint)!bVar6 * auVar146._24_4_;
            bVar6 = (bool)((byte)(uVar20 >> 7) & 1);
            auVar183._28_4_ = (uint)bVar6 * auVar145._28_4_ | (uint)!bVar6 * auVar146._28_4_;
            bVar6 = (bool)((byte)(uVar20 >> 8) & 1);
            auVar183._32_4_ = (uint)bVar6 * auVar145._32_4_ | (uint)!bVar6 * auVar146._32_4_;
            bVar6 = (bool)((byte)(uVar20 >> 9) & 1);
            auVar183._36_4_ = (uint)bVar6 * auVar145._36_4_ | (uint)!bVar6 * auVar146._36_4_;
            bVar6 = (bool)((byte)(uVar20 >> 10) & 1);
            auVar183._40_4_ = (uint)bVar6 * auVar145._40_4_ | (uint)!bVar6 * auVar146._40_4_;
            bVar6 = (bool)((byte)(uVar20 >> 0xb) & 1);
            auVar183._44_4_ = (uint)bVar6 * auVar145._44_4_ | (uint)!bVar6 * auVar146._44_4_;
            bVar6 = (bool)((byte)(uVar20 >> 0xc) & 1);
            auVar183._48_4_ = (uint)bVar6 * auVar145._48_4_ | (uint)!bVar6 * auVar146._48_4_;
            bVar6 = (bool)((byte)(uVar20 >> 0xd) & 1);
            auVar183._52_4_ = (uint)bVar6 * auVar145._52_4_ | (uint)!bVar6 * auVar146._52_4_;
            bVar6 = (bool)((byte)(uVar20 >> 0xe) & 1);
            auVar183._56_4_ = (uint)bVar6 * auVar145._56_4_ | (uint)!bVar6 * auVar146._56_4_;
            bVar6 = SUB81(uVar20 >> 0xf,0);
            auVar183._60_4_ = (uint)bVar6 * auVar145._60_4_ | (uint)!bVar6 * auVar146._60_4_;
            auVar144 = vminps_avx512f(auVar144,(undefined1  [64])afVar245);
            auVar144 = vmaxps_avx512f(auVar144,(undefined1  [64])afVar270);
            auVar143 = vfmadd231ps_avx512f(auVar143,auVar183,auVar142);
            auVar145 = vfmadd213ps_avx512f((undefined1  [64])afVar231,auVar144,
                                           (undefined1  [64])afVar249);
            auVar146 = vrndscaleps_avx512f(auVar145,1);
            auVar143 = vfmadd231ps_avx512f(auVar143,auVar183,auVar141);
            uVar20 = vcmpps_avx512f(auVar145,auVar146,1);
            auVar145 = vsubps_avx512f(auVar146,(undefined1  [64])afVar75);
            bVar6 = (bool)((byte)uVar20 & 1);
            auVar184._0_4_ = (uint)bVar6 * auVar145._0_4_ | (uint)!bVar6 * auVar146._0_4_;
            bVar6 = (bool)((byte)(uVar20 >> 1) & 1);
            auVar184._4_4_ = (uint)bVar6 * auVar145._4_4_ | (uint)!bVar6 * auVar146._4_4_;
            bVar6 = (bool)((byte)(uVar20 >> 2) & 1);
            auVar184._8_4_ = (uint)bVar6 * auVar145._8_4_ | (uint)!bVar6 * auVar146._8_4_;
            bVar6 = (bool)((byte)(uVar20 >> 3) & 1);
            auVar184._12_4_ = (uint)bVar6 * auVar145._12_4_ | (uint)!bVar6 * auVar146._12_4_;
            bVar6 = (bool)((byte)(uVar20 >> 4) & 1);
            auVar184._16_4_ = (uint)bVar6 * auVar145._16_4_ | (uint)!bVar6 * auVar146._16_4_;
            bVar6 = (bool)((byte)(uVar20 >> 5) & 1);
            auVar184._20_4_ = (uint)bVar6 * auVar145._20_4_ | (uint)!bVar6 * auVar146._20_4_;
            bVar6 = (bool)((byte)(uVar20 >> 6) & 1);
            auVar184._24_4_ = (uint)bVar6 * auVar145._24_4_ | (uint)!bVar6 * auVar146._24_4_;
            bVar6 = (bool)((byte)(uVar20 >> 7) & 1);
            auVar184._28_4_ = (uint)bVar6 * auVar145._28_4_ | (uint)!bVar6 * auVar146._28_4_;
            bVar6 = (bool)((byte)(uVar20 >> 8) & 1);
            auVar184._32_4_ = (uint)bVar6 * auVar145._32_4_ | (uint)!bVar6 * auVar146._32_4_;
            bVar6 = (bool)((byte)(uVar20 >> 9) & 1);
            auVar184._36_4_ = (uint)bVar6 * auVar145._36_4_ | (uint)!bVar6 * auVar146._36_4_;
            bVar6 = (bool)((byte)(uVar20 >> 10) & 1);
            auVar184._40_4_ = (uint)bVar6 * auVar145._40_4_ | (uint)!bVar6 * auVar146._40_4_;
            bVar6 = (bool)((byte)(uVar20 >> 0xb) & 1);
            auVar184._44_4_ = (uint)bVar6 * auVar145._44_4_ | (uint)!bVar6 * auVar146._44_4_;
            bVar6 = (bool)((byte)(uVar20 >> 0xc) & 1);
            auVar184._48_4_ = (uint)bVar6 * auVar145._48_4_ | (uint)!bVar6 * auVar146._48_4_;
            bVar6 = (bool)((byte)(uVar20 >> 0xd) & 1);
            auVar184._52_4_ = (uint)bVar6 * auVar145._52_4_ | (uint)!bVar6 * auVar146._52_4_;
            bVar6 = (bool)((byte)(uVar20 >> 0xe) & 1);
            auVar184._56_4_ = (uint)bVar6 * auVar145._56_4_ | (uint)!bVar6 * auVar146._56_4_;
            bVar6 = SUB81(uVar20 >> 0xf,0);
            auVar184._60_4_ = (uint)bVar6 * auVar145._60_4_ | (uint)!bVar6 * auVar146._60_4_;
            auVar144 = vfmadd231ps_avx512f(auVar144,auVar184,auVar142);
            auVar145 = vmulps_avx512f(auVar143,auVar143);
            auVar144 = vfmadd231ps_avx512f(auVar144,auVar184,auVar141);
            fVar193 = pfVar83[2];
            auVar146._4_4_ = fVar193;
            auVar146._0_4_ = fVar193;
            auVar146._8_4_ = fVar193;
            auVar146._12_4_ = fVar193;
            auVar146._16_4_ = fVar193;
            auVar146._20_4_ = fVar193;
            auVar146._24_4_ = fVar193;
            auVar146._28_4_ = fVar193;
            auVar146._32_4_ = fVar193;
            auVar146._36_4_ = fVar193;
            auVar146._40_4_ = fVar193;
            auVar146._44_4_ = fVar193;
            auVar146._48_4_ = fVar193;
            auVar146._52_4_ = fVar193;
            auVar146._56_4_ = fVar193;
            auVar146._60_4_ = fVar193;
            auVar146 = vsubps_avx512f(pauVar76[2],auVar146);
            auVar146 = vminps_avx512f(auVar146,(undefined1  [64])afVar245);
            auVar146 = vmaxps_avx512f(auVar146,(undefined1  [64])afVar270);
            auVar157 = vmulps_avx512f(auVar144,auVar144);
            auVar189 = vfmadd213ps_avx512f((undefined1  [64])afVar231,auVar146,
                                           (undefined1  [64])afVar249);
            auVar190 = vrndscaleps_avx512f(auVar189,1);
            uVar20 = vcmpps_avx512f(auVar189,auVar190,1);
            auVar189 = vsubps_avx512f(auVar190,(undefined1  [64])afVar75);
            bVar6 = (bool)((byte)uVar20 & 1);
            auVar186._0_4_ = (uint)bVar6 * auVar189._0_4_ | (uint)!bVar6 * auVar190._0_4_;
            bVar6 = (bool)((byte)(uVar20 >> 1) & 1);
            auVar186._4_4_ = (uint)bVar6 * auVar189._4_4_ | (uint)!bVar6 * auVar190._4_4_;
            bVar6 = (bool)((byte)(uVar20 >> 2) & 1);
            auVar186._8_4_ = (uint)bVar6 * auVar189._8_4_ | (uint)!bVar6 * auVar190._8_4_;
            bVar6 = (bool)((byte)(uVar20 >> 3) & 1);
            auVar186._12_4_ = (uint)bVar6 * auVar189._12_4_ | (uint)!bVar6 * auVar190._12_4_;
            bVar6 = (bool)((byte)(uVar20 >> 4) & 1);
            auVar186._16_4_ = (uint)bVar6 * auVar189._16_4_ | (uint)!bVar6 * auVar190._16_4_;
            bVar6 = (bool)((byte)(uVar20 >> 5) & 1);
            auVar186._20_4_ = (uint)bVar6 * auVar189._20_4_ | (uint)!bVar6 * auVar190._20_4_;
            bVar6 = (bool)((byte)(uVar20 >> 6) & 1);
            auVar186._24_4_ = (uint)bVar6 * auVar189._24_4_ | (uint)!bVar6 * auVar190._24_4_;
            bVar6 = (bool)((byte)(uVar20 >> 7) & 1);
            auVar186._28_4_ = (uint)bVar6 * auVar189._28_4_ | (uint)!bVar6 * auVar190._28_4_;
            bVar6 = (bool)((byte)(uVar20 >> 8) & 1);
            auVar186._32_4_ = (uint)bVar6 * auVar189._32_4_ | (uint)!bVar6 * auVar190._32_4_;
            bVar6 = (bool)((byte)(uVar20 >> 9) & 1);
            auVar186._36_4_ = (uint)bVar6 * auVar189._36_4_ | (uint)!bVar6 * auVar190._36_4_;
            bVar6 = (bool)((byte)(uVar20 >> 10) & 1);
            auVar186._40_4_ = (uint)bVar6 * auVar189._40_4_ | (uint)!bVar6 * auVar190._40_4_;
            bVar6 = (bool)((byte)(uVar20 >> 0xb) & 1);
            auVar186._44_4_ = (uint)bVar6 * auVar189._44_4_ | (uint)!bVar6 * auVar190._44_4_;
            bVar6 = (bool)((byte)(uVar20 >> 0xc) & 1);
            auVar186._48_4_ = (uint)bVar6 * auVar189._48_4_ | (uint)!bVar6 * auVar190._48_4_;
            bVar6 = (bool)((byte)(uVar20 >> 0xd) & 1);
            auVar186._52_4_ = (uint)bVar6 * auVar189._52_4_ | (uint)!bVar6 * auVar190._52_4_;
            bVar6 = (bool)((byte)(uVar20 >> 0xe) & 1);
            auVar186._56_4_ = (uint)bVar6 * auVar189._56_4_ | (uint)!bVar6 * auVar190._56_4_;
            bVar6 = SUB81(uVar20 >> 0xf,0);
            auVar186._60_4_ = (uint)bVar6 * auVar189._60_4_ | (uint)!bVar6 * auVar190._60_4_;
            auVar146 = vfmadd231ps_avx512f(auVar146,auVar186,auVar142);
            auVar146 = vfmadd231ps_avx512f(auVar146,auVar186,auVar141);
            auVar150 = vmulps_avx512f(auVar146,auVar146);
            fVar193 = pfVar83[3];
            auVar189._4_4_ = fVar193;
            auVar189._0_4_ = fVar193;
            auVar189._8_4_ = fVar193;
            auVar189._12_4_ = fVar193;
            auVar189._16_4_ = fVar193;
            auVar189._20_4_ = fVar193;
            auVar189._24_4_ = fVar193;
            auVar189._28_4_ = fVar193;
            auVar189._32_4_ = fVar193;
            auVar189._36_4_ = fVar193;
            auVar189._40_4_ = fVar193;
            auVar189._44_4_ = fVar193;
            auVar189._48_4_ = fVar193;
            auVar189._52_4_ = fVar193;
            auVar189._56_4_ = fVar193;
            auVar189._60_4_ = fVar193;
            auVar189 = vsubps_avx512f(pauVar76[3],auVar189);
            auVar190 = vfmadd213ps_avx512f(auVar143,(undefined1  [64])::_ps512_cephes_exp_p0,
                                           (undefined1  [64])::_ps512_cephes_exp_p1);
            auVar189 = vminps_avx512f(auVar189,(undefined1  [64])afVar245);
            auVar189 = vmaxps_avx512f(auVar189,(undefined1  [64])afVar270);
            auVar147 = vfmadd213ps_avx512f(auVar144,(undefined1  [64])::_ps512_cephes_exp_p0,
                                           (undefined1  [64])::_ps512_cephes_exp_p1);
            auVar148 = vfmadd213ps_avx512f((undefined1  [64])afVar231,auVar189,
                                           (undefined1  [64])afVar249);
            auVar149 = vrndscaleps_avx512f(auVar148,1);
            uVar20 = vcmpps_avx512f(auVar148,auVar149,1);
            auVar148 = vfmadd213ps_avx512f(auVar146,(undefined1  [64])::_ps512_cephes_exp_p0,
                                           (undefined1  [64])::_ps512_cephes_exp_p1);
            auVar151 = vsubps_avx512f(auVar149,(undefined1  [64])afVar75);
            bVar6 = (bool)((byte)uVar20 & 1);
            auVar187._0_4_ = (uint)bVar6 * auVar151._0_4_ | (uint)!bVar6 * auVar149._0_4_;
            bVar6 = (bool)((byte)(uVar20 >> 1) & 1);
            auVar187._4_4_ = (uint)bVar6 * auVar151._4_4_ | (uint)!bVar6 * auVar149._4_4_;
            bVar6 = (bool)((byte)(uVar20 >> 2) & 1);
            auVar187._8_4_ = (uint)bVar6 * auVar151._8_4_ | (uint)!bVar6 * auVar149._8_4_;
            bVar6 = (bool)((byte)(uVar20 >> 3) & 1);
            auVar187._12_4_ = (uint)bVar6 * auVar151._12_4_ | (uint)!bVar6 * auVar149._12_4_;
            bVar6 = (bool)((byte)(uVar20 >> 4) & 1);
            auVar187._16_4_ = (uint)bVar6 * auVar151._16_4_ | (uint)!bVar6 * auVar149._16_4_;
            bVar6 = (bool)((byte)(uVar20 >> 5) & 1);
            auVar187._20_4_ = (uint)bVar6 * auVar151._20_4_ | (uint)!bVar6 * auVar149._20_4_;
            bVar6 = (bool)((byte)(uVar20 >> 6) & 1);
            auVar187._24_4_ = (uint)bVar6 * auVar151._24_4_ | (uint)!bVar6 * auVar149._24_4_;
            bVar6 = (bool)((byte)(uVar20 >> 7) & 1);
            auVar187._28_4_ = (uint)bVar6 * auVar151._28_4_ | (uint)!bVar6 * auVar149._28_4_;
            bVar6 = (bool)((byte)(uVar20 >> 8) & 1);
            auVar187._32_4_ = (uint)bVar6 * auVar151._32_4_ | (uint)!bVar6 * auVar149._32_4_;
            bVar6 = (bool)((byte)(uVar20 >> 9) & 1);
            auVar187._36_4_ = (uint)bVar6 * auVar151._36_4_ | (uint)!bVar6 * auVar149._36_4_;
            bVar6 = (bool)((byte)(uVar20 >> 10) & 1);
            auVar187._40_4_ = (uint)bVar6 * auVar151._40_4_ | (uint)!bVar6 * auVar149._40_4_;
            bVar6 = (bool)((byte)(uVar20 >> 0xb) & 1);
            auVar187._44_4_ = (uint)bVar6 * auVar151._44_4_ | (uint)!bVar6 * auVar149._44_4_;
            bVar6 = (bool)((byte)(uVar20 >> 0xc) & 1);
            auVar187._48_4_ = (uint)bVar6 * auVar151._48_4_ | (uint)!bVar6 * auVar149._48_4_;
            bVar6 = (bool)((byte)(uVar20 >> 0xd) & 1);
            auVar187._52_4_ = (uint)bVar6 * auVar151._52_4_ | (uint)!bVar6 * auVar149._52_4_;
            bVar6 = (bool)((byte)(uVar20 >> 0xe) & 1);
            auVar187._56_4_ = (uint)bVar6 * auVar151._56_4_ | (uint)!bVar6 * auVar149._56_4_;
            bVar6 = SUB81(uVar20 >> 0xf,0);
            auVar187._60_4_ = (uint)bVar6 * auVar151._60_4_ | (uint)!bVar6 * auVar149._60_4_;
            auVar189 = vfmadd231ps_avx512f(auVar189,auVar187,auVar142);
            auVar189 = vfmadd231ps_avx512f(auVar189,auVar187,auVar141);
            auVar149 = vfmadd213ps_avx512f(auVar190,auVar143,
                                           (undefined1  [64])::_ps512_cephes_exp_p2);
            auVar152 = vmulps_avx512f(auVar189,auVar189);
            auVar151 = vfmadd213ps_avx512f(auVar189,(undefined1  [64])::_ps512_cephes_exp_p0,
                                           (undefined1  [64])::_ps512_cephes_exp_p1);
            auVar147 = vfmadd213ps_avx512f(auVar147,auVar144,
                                           (undefined1  [64])::_ps512_cephes_exp_p2);
            fVar193 = pfVar83[4];
            auVar190._4_4_ = fVar193;
            auVar190._0_4_ = fVar193;
            auVar190._8_4_ = fVar193;
            auVar190._12_4_ = fVar193;
            auVar190._16_4_ = fVar193;
            auVar190._20_4_ = fVar193;
            auVar190._24_4_ = fVar193;
            auVar190._28_4_ = fVar193;
            auVar190._32_4_ = fVar193;
            auVar190._36_4_ = fVar193;
            auVar190._40_4_ = fVar193;
            auVar190._44_4_ = fVar193;
            auVar190._48_4_ = fVar193;
            auVar190._52_4_ = fVar193;
            auVar190._56_4_ = fVar193;
            auVar190._60_4_ = fVar193;
            auVar190 = vsubps_avx512f(pauVar76[4],auVar190);
            auVar190 = vminps_avx512f(auVar190,(undefined1  [64])afVar245);
            auVar148 = vfmadd213ps_avx512f(auVar148,auVar146,
                                           (undefined1  [64])::_ps512_cephes_exp_p2);
            auVar190 = vmaxps_avx512f(auVar190,(undefined1  [64])afVar270);
            auVar158 = vfmadd213ps_avx512f((undefined1  [64])afVar231,auVar190,
                                           (undefined1  [64])afVar249);
            auVar151 = vfmadd213ps_avx512f(auVar151,auVar189,
                                           (undefined1  [64])::_ps512_cephes_exp_p2);
            auVar159 = vrndscaleps_avx512f(auVar158,1);
            uVar20 = vcmpps_avx512f(auVar158,auVar159,1);
            auVar158 = vsubps_avx512f(auVar159,(undefined1  [64])afVar75);
            bVar6 = (bool)((byte)uVar20 & 1);
            auVar160._0_4_ = (uint)bVar6 * auVar158._0_4_ | (uint)!bVar6 * auVar159._0_4_;
            bVar6 = (bool)((byte)(uVar20 >> 1) & 1);
            auVar160._4_4_ = (uint)bVar6 * auVar158._4_4_ | (uint)!bVar6 * auVar159._4_4_;
            bVar6 = (bool)((byte)(uVar20 >> 2) & 1);
            auVar160._8_4_ = (uint)bVar6 * auVar158._8_4_ | (uint)!bVar6 * auVar159._8_4_;
            bVar6 = (bool)((byte)(uVar20 >> 3) & 1);
            auVar160._12_4_ = (uint)bVar6 * auVar158._12_4_ | (uint)!bVar6 * auVar159._12_4_;
            bVar6 = (bool)((byte)(uVar20 >> 4) & 1);
            auVar160._16_4_ = (uint)bVar6 * auVar158._16_4_ | (uint)!bVar6 * auVar159._16_4_;
            bVar6 = (bool)((byte)(uVar20 >> 5) & 1);
            auVar160._20_4_ = (uint)bVar6 * auVar158._20_4_ | (uint)!bVar6 * auVar159._20_4_;
            bVar6 = (bool)((byte)(uVar20 >> 6) & 1);
            auVar160._24_4_ = (uint)bVar6 * auVar158._24_4_ | (uint)!bVar6 * auVar159._24_4_;
            bVar6 = (bool)((byte)(uVar20 >> 7) & 1);
            auVar160._28_4_ = (uint)bVar6 * auVar158._28_4_ | (uint)!bVar6 * auVar159._28_4_;
            bVar6 = (bool)((byte)(uVar20 >> 8) & 1);
            auVar160._32_4_ = (uint)bVar6 * auVar158._32_4_ | (uint)!bVar6 * auVar159._32_4_;
            bVar6 = (bool)((byte)(uVar20 >> 9) & 1);
            auVar160._36_4_ = (uint)bVar6 * auVar158._36_4_ | (uint)!bVar6 * auVar159._36_4_;
            bVar6 = (bool)((byte)(uVar20 >> 10) & 1);
            auVar160._40_4_ = (uint)bVar6 * auVar158._40_4_ | (uint)!bVar6 * auVar159._40_4_;
            bVar6 = (bool)((byte)(uVar20 >> 0xb) & 1);
            auVar160._44_4_ = (uint)bVar6 * auVar158._44_4_ | (uint)!bVar6 * auVar159._44_4_;
            bVar6 = (bool)((byte)(uVar20 >> 0xc) & 1);
            auVar160._48_4_ = (uint)bVar6 * auVar158._48_4_ | (uint)!bVar6 * auVar159._48_4_;
            bVar6 = (bool)((byte)(uVar20 >> 0xd) & 1);
            auVar160._52_4_ = (uint)bVar6 * auVar158._52_4_ | (uint)!bVar6 * auVar159._52_4_;
            bVar6 = (bool)((byte)(uVar20 >> 0xe) & 1);
            auVar160._56_4_ = (uint)bVar6 * auVar158._56_4_ | (uint)!bVar6 * auVar159._56_4_;
            bVar6 = SUB81(uVar20 >> 0xf,0);
            auVar160._60_4_ = (uint)bVar6 * auVar158._60_4_ | (uint)!bVar6 * auVar159._60_4_;
            auVar149 = vfmadd213ps_avx512f(auVar149,auVar143,
                                           (undefined1  [64])::_ps512_cephes_exp_p3);
            auVar190 = vfmadd231ps_avx512f(auVar190,auVar160,auVar142);
            auVar190 = vfmadd231ps_avx512f(auVar190,auVar160,auVar141);
            auVar158 = vmulps_avx512f(auVar190,auVar190);
            auVar159 = vfmadd213ps_avx512f(auVar147,auVar144,
                                           (undefined1  [64])::_ps512_cephes_exp_p3);
            auVar147 = vfmadd213ps_avx512f(auVar190,(undefined1  [64])::_ps512_cephes_exp_p0,
                                           (undefined1  [64])::_ps512_cephes_exp_p1);
            auVar161 = vfmadd213ps_avx512f(auVar147,auVar190,
                                           (undefined1  [64])::_ps512_cephes_exp_p2);
            auVar162 = vfmadd213ps_avx512f(auVar148,auVar146,
                                           (undefined1  [64])::_ps512_cephes_exp_p3);
            fVar193 = pfVar83[5];
            auVar147._4_4_ = fVar193;
            auVar147._0_4_ = fVar193;
            auVar147._8_4_ = fVar193;
            auVar147._12_4_ = fVar193;
            auVar147._16_4_ = fVar193;
            auVar147._20_4_ = fVar193;
            auVar147._24_4_ = fVar193;
            auVar147._28_4_ = fVar193;
            auVar147._32_4_ = fVar193;
            auVar147._36_4_ = fVar193;
            auVar147._40_4_ = fVar193;
            auVar147._44_4_ = fVar193;
            auVar147._48_4_ = fVar193;
            auVar147._52_4_ = fVar193;
            auVar147._56_4_ = fVar193;
            auVar147._60_4_ = fVar193;
            auVar147 = vsubps_avx512f(pauVar76[5],auVar147);
            auVar147 = vminps_avx512f(auVar147,(undefined1  [64])afVar245);
            auVar151 = vfmadd213ps_avx512f(auVar151,auVar189,
                                           (undefined1  [64])::_ps512_cephes_exp_p3);
            auVar147 = vmaxps_avx512f(auVar147,(undefined1  [64])afVar270);
            auVar148 = vfmadd213ps_avx512f((undefined1  [64])afVar231,auVar147,
                                           (undefined1  [64])afVar249);
            auVar161 = vfmadd213ps_avx512f(auVar161,auVar190,
                                           (undefined1  [64])::_ps512_cephes_exp_p3);
            auVar163 = vrndscaleps_avx512f(auVar148,1);
            uVar20 = vcmpps_avx512f(auVar148,auVar163,1);
            auVar148 = vsubps_avx512f(auVar163,(undefined1  [64])afVar75);
            bVar6 = (bool)((byte)uVar20 & 1);
            auVar164._0_4_ = (uint)bVar6 * auVar148._0_4_ | (uint)!bVar6 * auVar163._0_4_;
            bVar6 = (bool)((byte)(uVar20 >> 1) & 1);
            auVar164._4_4_ = (uint)bVar6 * auVar148._4_4_ | (uint)!bVar6 * auVar163._4_4_;
            bVar6 = (bool)((byte)(uVar20 >> 2) & 1);
            auVar164._8_4_ = (uint)bVar6 * auVar148._8_4_ | (uint)!bVar6 * auVar163._8_4_;
            bVar6 = (bool)((byte)(uVar20 >> 3) & 1);
            auVar164._12_4_ = (uint)bVar6 * auVar148._12_4_ | (uint)!bVar6 * auVar163._12_4_;
            bVar6 = (bool)((byte)(uVar20 >> 4) & 1);
            auVar164._16_4_ = (uint)bVar6 * auVar148._16_4_ | (uint)!bVar6 * auVar163._16_4_;
            bVar6 = (bool)((byte)(uVar20 >> 5) & 1);
            auVar164._20_4_ = (uint)bVar6 * auVar148._20_4_ | (uint)!bVar6 * auVar163._20_4_;
            bVar6 = (bool)((byte)(uVar20 >> 6) & 1);
            auVar164._24_4_ = (uint)bVar6 * auVar148._24_4_ | (uint)!bVar6 * auVar163._24_4_;
            bVar6 = (bool)((byte)(uVar20 >> 7) & 1);
            auVar164._28_4_ = (uint)bVar6 * auVar148._28_4_ | (uint)!bVar6 * auVar163._28_4_;
            bVar6 = (bool)((byte)(uVar20 >> 8) & 1);
            auVar164._32_4_ = (uint)bVar6 * auVar148._32_4_ | (uint)!bVar6 * auVar163._32_4_;
            bVar6 = (bool)((byte)(uVar20 >> 9) & 1);
            auVar164._36_4_ = (uint)bVar6 * auVar148._36_4_ | (uint)!bVar6 * auVar163._36_4_;
            bVar6 = (bool)((byte)(uVar20 >> 10) & 1);
            auVar164._40_4_ = (uint)bVar6 * auVar148._40_4_ | (uint)!bVar6 * auVar163._40_4_;
            bVar6 = (bool)((byte)(uVar20 >> 0xb) & 1);
            auVar164._44_4_ = (uint)bVar6 * auVar148._44_4_ | (uint)!bVar6 * auVar163._44_4_;
            bVar6 = (bool)((byte)(uVar20 >> 0xc) & 1);
            auVar164._48_4_ = (uint)bVar6 * auVar148._48_4_ | (uint)!bVar6 * auVar163._48_4_;
            bVar6 = (bool)((byte)(uVar20 >> 0xd) & 1);
            auVar164._52_4_ = (uint)bVar6 * auVar148._52_4_ | (uint)!bVar6 * auVar163._52_4_;
            bVar6 = (bool)((byte)(uVar20 >> 0xe) & 1);
            auVar164._56_4_ = (uint)bVar6 * auVar148._56_4_ | (uint)!bVar6 * auVar163._56_4_;
            bVar6 = SUB81(uVar20 >> 0xf,0);
            auVar164._60_4_ = (uint)bVar6 * auVar148._60_4_ | (uint)!bVar6 * auVar163._60_4_;
            auVar148 = vfmadd213ps_avx512f(auVar149,auVar143,
                                           (undefined1  [64])::_ps512_cephes_exp_p4);
            auVar147 = vfmadd231ps_avx512f(auVar147,auVar164,auVar142);
            auVar147 = vfmadd231ps_avx512f(auVar147,auVar164,auVar141);
            auVar163 = vmulps_avx512f(auVar147,auVar147);
            auVar149 = vfmadd213ps_avx512f(auVar148,auVar143,(undefined1  [64])afVar249);
            fVar193 = pfVar83[6];
            auVar148._4_4_ = fVar193;
            auVar148._0_4_ = fVar193;
            auVar148._8_4_ = fVar193;
            auVar148._12_4_ = fVar193;
            auVar148._16_4_ = fVar193;
            auVar148._20_4_ = fVar193;
            auVar148._24_4_ = fVar193;
            auVar148._28_4_ = fVar193;
            auVar148._32_4_ = fVar193;
            auVar148._36_4_ = fVar193;
            auVar148._40_4_ = fVar193;
            auVar148._44_4_ = fVar193;
            auVar148._48_4_ = fVar193;
            auVar148._52_4_ = fVar193;
            auVar148._56_4_ = fVar193;
            auVar148._60_4_ = fVar193;
            auVar148 = vsubps_avx512f(pauVar76[6],auVar148);
            auVar148 = vminps_avx512f(auVar148,(undefined1  [64])afVar245);
            auVar143 = vfmadd213ps_avx512f(auVar149,auVar145,auVar143);
            auVar145 = vmaxps_avx512f(auVar148,(undefined1  [64])afVar270);
            auVar148 = vfmadd213ps_avx512f((undefined1  [64])afVar231,auVar145,
                                           (undefined1  [64])afVar249);
            auVar149 = vfmadd213ps_avx512f(auVar159,auVar144,
                                           (undefined1  [64])::_ps512_cephes_exp_p4);
            auVar159 = vrndscaleps_avx512f(auVar148,1);
            uVar20 = vcmpps_avx512f(auVar148,auVar159,1);
            auVar148 = vfmadd213ps_avx512f(auVar162,auVar146,
                                           (undefined1  [64])::_ps512_cephes_exp_p4);
            auVar162 = vfmadd213ps_avx512f(auVar147,(undefined1  [64])::_ps512_cephes_exp_p0,
                                           (undefined1  [64])::_ps512_cephes_exp_p1);
            auVar162 = vfmadd213ps_avx512f(auVar162,auVar147,
                                           (undefined1  [64])::_ps512_cephes_exp_p2);
            auVar162 = vfmadd213ps_avx512f(auVar162,auVar147,
                                           (undefined1  [64])::_ps512_cephes_exp_p3);
            auVar149 = vfmadd213ps_avx512f(auVar149,auVar144,(undefined1  [64])afVar249);
            auVar165 = vsubps_avx512f(auVar159,(undefined1  [64])afVar75);
            bVar6 = (bool)((byte)uVar20 & 1);
            auVar166._0_4_ = (uint)bVar6 * auVar165._0_4_ | (uint)!bVar6 * auVar159._0_4_;
            bVar6 = (bool)((byte)(uVar20 >> 1) & 1);
            auVar166._4_4_ = (uint)bVar6 * auVar165._4_4_ | (uint)!bVar6 * auVar159._4_4_;
            bVar6 = (bool)((byte)(uVar20 >> 2) & 1);
            auVar166._8_4_ = (uint)bVar6 * auVar165._8_4_ | (uint)!bVar6 * auVar159._8_4_;
            bVar6 = (bool)((byte)(uVar20 >> 3) & 1);
            auVar166._12_4_ = (uint)bVar6 * auVar165._12_4_ | (uint)!bVar6 * auVar159._12_4_;
            bVar6 = (bool)((byte)(uVar20 >> 4) & 1);
            auVar166._16_4_ = (uint)bVar6 * auVar165._16_4_ | (uint)!bVar6 * auVar159._16_4_;
            bVar6 = (bool)((byte)(uVar20 >> 5) & 1);
            auVar166._20_4_ = (uint)bVar6 * auVar165._20_4_ | (uint)!bVar6 * auVar159._20_4_;
            bVar6 = (bool)((byte)(uVar20 >> 6) & 1);
            auVar166._24_4_ = (uint)bVar6 * auVar165._24_4_ | (uint)!bVar6 * auVar159._24_4_;
            bVar6 = (bool)((byte)(uVar20 >> 7) & 1);
            auVar166._28_4_ = (uint)bVar6 * auVar165._28_4_ | (uint)!bVar6 * auVar159._28_4_;
            bVar6 = (bool)((byte)(uVar20 >> 8) & 1);
            auVar166._32_4_ = (uint)bVar6 * auVar165._32_4_ | (uint)!bVar6 * auVar159._32_4_;
            bVar6 = (bool)((byte)(uVar20 >> 9) & 1);
            auVar166._36_4_ = (uint)bVar6 * auVar165._36_4_ | (uint)!bVar6 * auVar159._36_4_;
            bVar6 = (bool)((byte)(uVar20 >> 10) & 1);
            auVar166._40_4_ = (uint)bVar6 * auVar165._40_4_ | (uint)!bVar6 * auVar159._40_4_;
            bVar6 = (bool)((byte)(uVar20 >> 0xb) & 1);
            auVar166._44_4_ = (uint)bVar6 * auVar165._44_4_ | (uint)!bVar6 * auVar159._44_4_;
            bVar6 = (bool)((byte)(uVar20 >> 0xc) & 1);
            auVar166._48_4_ = (uint)bVar6 * auVar165._48_4_ | (uint)!bVar6 * auVar159._48_4_;
            bVar6 = (bool)((byte)(uVar20 >> 0xd) & 1);
            auVar166._52_4_ = (uint)bVar6 * auVar165._52_4_ | (uint)!bVar6 * auVar159._52_4_;
            bVar6 = (bool)((byte)(uVar20 >> 0xe) & 1);
            auVar166._56_4_ = (uint)bVar6 * auVar165._56_4_ | (uint)!bVar6 * auVar159._56_4_;
            bVar6 = SUB81(uVar20 >> 0xf,0);
            auVar166._60_4_ = (uint)bVar6 * auVar165._60_4_ | (uint)!bVar6 * auVar159._60_4_;
            auVar145 = vfmadd231ps_avx512f(auVar145,auVar166,auVar142);
            auVar145 = vfmadd231ps_avx512f(auVar145,auVar166,auVar141);
            auVar144 = vfmadd213ps_avx512f(auVar149,auVar157,auVar144);
            auVar157 = vmulps_avx512f(auVar145,auVar145);
            auVar149 = vfmadd213ps_avx512f(auVar145,(undefined1  [64])::_ps512_cephes_exp_p0,
                                           (undefined1  [64])::_ps512_cephes_exp_p1);
            auVar148 = vfmadd213ps_avx512f(auVar148,auVar146,(undefined1  [64])afVar249);
            auVar159 = vfmadd213ps_avx512f(auVar149,auVar145,
                                           (undefined1  [64])::_ps512_cephes_exp_p2);
            fVar193 = pfVar83[7];
            auVar149._4_4_ = fVar193;
            auVar149._0_4_ = fVar193;
            auVar149._8_4_ = fVar193;
            auVar149._12_4_ = fVar193;
            auVar149._16_4_ = fVar193;
            auVar149._20_4_ = fVar193;
            auVar149._24_4_ = fVar193;
            auVar149._28_4_ = fVar193;
            auVar149._32_4_ = fVar193;
            auVar149._36_4_ = fVar193;
            auVar149._40_4_ = fVar193;
            auVar149._44_4_ = fVar193;
            auVar149._48_4_ = fVar193;
            auVar149._52_4_ = fVar193;
            auVar149._56_4_ = fVar193;
            auVar149._60_4_ = fVar193;
            auVar149 = vsubps_avx512f(pauVar76[7],auVar149);
            auVar146 = vfmadd213ps_avx512f(auVar148,auVar150,auVar146);
            auVar150 = vminps_avx512f(auVar149,(undefined1  [64])afVar245);
            auVar150 = vmaxps_avx512f(auVar150,(undefined1  [64])afVar270);
            auVar148 = vfmadd213ps_avx512f(auVar159,auVar145,
                                           (undefined1  [64])::_ps512_cephes_exp_p3);
            auVar149 = vfmadd213ps_avx512f((undefined1  [64])afVar231,auVar150,
                                           (undefined1  [64])afVar249);
            auVar159 = vrndscaleps_avx512f(auVar149,1);
            uVar20 = vcmpps_avx512f(auVar149,auVar159,1);
            auVar149 = vfmadd213ps_avx512f(auVar151,auVar189,
                                           (undefined1  [64])::_ps512_cephes_exp_p4);
            auVar151 = vsubps_avx512f(auVar159,(undefined1  [64])afVar75);
            bVar6 = (bool)((byte)uVar20 & 1);
            auVar167._0_4_ = (uint)bVar6 * auVar151._0_4_ | (uint)!bVar6 * auVar159._0_4_;
            bVar6 = (bool)((byte)(uVar20 >> 1) & 1);
            auVar167._4_4_ = (uint)bVar6 * auVar151._4_4_ | (uint)!bVar6 * auVar159._4_4_;
            bVar6 = (bool)((byte)(uVar20 >> 2) & 1);
            auVar167._8_4_ = (uint)bVar6 * auVar151._8_4_ | (uint)!bVar6 * auVar159._8_4_;
            bVar6 = (bool)((byte)(uVar20 >> 3) & 1);
            auVar167._12_4_ = (uint)bVar6 * auVar151._12_4_ | (uint)!bVar6 * auVar159._12_4_;
            bVar6 = (bool)((byte)(uVar20 >> 4) & 1);
            auVar167._16_4_ = (uint)bVar6 * auVar151._16_4_ | (uint)!bVar6 * auVar159._16_4_;
            bVar6 = (bool)((byte)(uVar20 >> 5) & 1);
            auVar167._20_4_ = (uint)bVar6 * auVar151._20_4_ | (uint)!bVar6 * auVar159._20_4_;
            bVar6 = (bool)((byte)(uVar20 >> 6) & 1);
            auVar167._24_4_ = (uint)bVar6 * auVar151._24_4_ | (uint)!bVar6 * auVar159._24_4_;
            bVar6 = (bool)((byte)(uVar20 >> 7) & 1);
            auVar167._28_4_ = (uint)bVar6 * auVar151._28_4_ | (uint)!bVar6 * auVar159._28_4_;
            bVar6 = (bool)((byte)(uVar20 >> 8) & 1);
            auVar167._32_4_ = (uint)bVar6 * auVar151._32_4_ | (uint)!bVar6 * auVar159._32_4_;
            bVar6 = (bool)((byte)(uVar20 >> 9) & 1);
            auVar167._36_4_ = (uint)bVar6 * auVar151._36_4_ | (uint)!bVar6 * auVar159._36_4_;
            bVar6 = (bool)((byte)(uVar20 >> 10) & 1);
            auVar167._40_4_ = (uint)bVar6 * auVar151._40_4_ | (uint)!bVar6 * auVar159._40_4_;
            bVar6 = (bool)((byte)(uVar20 >> 0xb) & 1);
            auVar167._44_4_ = (uint)bVar6 * auVar151._44_4_ | (uint)!bVar6 * auVar159._44_4_;
            bVar6 = (bool)((byte)(uVar20 >> 0xc) & 1);
            auVar167._48_4_ = (uint)bVar6 * auVar151._48_4_ | (uint)!bVar6 * auVar159._48_4_;
            bVar6 = (bool)((byte)(uVar20 >> 0xd) & 1);
            auVar167._52_4_ = (uint)bVar6 * auVar151._52_4_ | (uint)!bVar6 * auVar159._52_4_;
            bVar6 = (bool)((byte)(uVar20 >> 0xe) & 1);
            auVar167._56_4_ = (uint)bVar6 * auVar151._56_4_ | (uint)!bVar6 * auVar159._56_4_;
            bVar6 = SUB81(uVar20 >> 0xf,0);
            auVar167._60_4_ = (uint)bVar6 * auVar151._60_4_ | (uint)!bVar6 * auVar159._60_4_;
            auVar150 = vfmadd231ps_avx512f(auVar150,auVar167,auVar142);
            auVar150 = vfmadd231ps_avx512f(auVar150,auVar167,auVar141);
            auVar149 = vfmadd213ps_avx512f(auVar149,auVar189,(undefined1  [64])afVar249);
            auVar159 = vmulps_avx512f(auVar150,auVar150);
            fVar193 = pfVar83[8];
            auVar151._4_4_ = fVar193;
            auVar151._0_4_ = fVar193;
            auVar151._8_4_ = fVar193;
            auVar151._12_4_ = fVar193;
            auVar151._16_4_ = fVar193;
            auVar151._20_4_ = fVar193;
            auVar151._24_4_ = fVar193;
            auVar151._28_4_ = fVar193;
            auVar151._32_4_ = fVar193;
            auVar151._36_4_ = fVar193;
            auVar151._40_4_ = fVar193;
            auVar151._44_4_ = fVar193;
            auVar151._48_4_ = fVar193;
            auVar151._52_4_ = fVar193;
            auVar151._56_4_ = fVar193;
            auVar151._60_4_ = fVar193;
            auVar151 = vsubps_avx512f(pauVar76[8],auVar151);
            auVar189 = vfmadd213ps_avx512f(auVar149,auVar152,auVar189);
            auVar149 = vminps_avx512f(auVar151,(undefined1  [64])afVar245);
            auVar149 = vmaxps_avx512f(auVar149,(undefined1  [64])afVar270);
            auVar151 = vfmadd213ps_avx512f(auVar161,auVar190,
                                           (undefined1  [64])::_ps512_cephes_exp_p4);
            auVar152 = vfmadd213ps_avx512f((undefined1  [64])afVar231,auVar149,
                                           (undefined1  [64])afVar249);
            auVar161 = vrndscaleps_avx512f(auVar152,1);
            uVar20 = vcmpps_avx512f(auVar152,auVar161,1);
            auVar152 = vfmadd213ps_avx512f(auVar162,auVar147,
                                           (undefined1  [64])::_ps512_cephes_exp_p4);
            auVar162 = vfmadd213ps_avx512f(auVar150,(undefined1  [64])::_ps512_cephes_exp_p0,
                                           (undefined1  [64])::_ps512_cephes_exp_p1);
            auVar162 = vfmadd213ps_avx512f(auVar162,auVar150,
                                           (undefined1  [64])::_ps512_cephes_exp_p2);
            auVar151 = vfmadd213ps_avx512f(auVar151,auVar190,(undefined1  [64])afVar249);
            auVar165 = vsubps_avx512f(auVar161,(undefined1  [64])afVar75);
            bVar6 = (bool)((byte)uVar20 & 1);
            auVar168._0_4_ = (uint)bVar6 * auVar165._0_4_ | (uint)!bVar6 * auVar161._0_4_;
            bVar6 = (bool)((byte)(uVar20 >> 1) & 1);
            auVar168._4_4_ = (uint)bVar6 * auVar165._4_4_ | (uint)!bVar6 * auVar161._4_4_;
            bVar6 = (bool)((byte)(uVar20 >> 2) & 1);
            auVar168._8_4_ = (uint)bVar6 * auVar165._8_4_ | (uint)!bVar6 * auVar161._8_4_;
            bVar6 = (bool)((byte)(uVar20 >> 3) & 1);
            auVar168._12_4_ = (uint)bVar6 * auVar165._12_4_ | (uint)!bVar6 * auVar161._12_4_;
            bVar6 = (bool)((byte)(uVar20 >> 4) & 1);
            auVar168._16_4_ = (uint)bVar6 * auVar165._16_4_ | (uint)!bVar6 * auVar161._16_4_;
            bVar6 = (bool)((byte)(uVar20 >> 5) & 1);
            auVar168._20_4_ = (uint)bVar6 * auVar165._20_4_ | (uint)!bVar6 * auVar161._20_4_;
            bVar6 = (bool)((byte)(uVar20 >> 6) & 1);
            auVar168._24_4_ = (uint)bVar6 * auVar165._24_4_ | (uint)!bVar6 * auVar161._24_4_;
            bVar6 = (bool)((byte)(uVar20 >> 7) & 1);
            auVar168._28_4_ = (uint)bVar6 * auVar165._28_4_ | (uint)!bVar6 * auVar161._28_4_;
            bVar6 = (bool)((byte)(uVar20 >> 8) & 1);
            auVar168._32_4_ = (uint)bVar6 * auVar165._32_4_ | (uint)!bVar6 * auVar161._32_4_;
            bVar6 = (bool)((byte)(uVar20 >> 9) & 1);
            auVar168._36_4_ = (uint)bVar6 * auVar165._36_4_ | (uint)!bVar6 * auVar161._36_4_;
            bVar6 = (bool)((byte)(uVar20 >> 10) & 1);
            auVar168._40_4_ = (uint)bVar6 * auVar165._40_4_ | (uint)!bVar6 * auVar161._40_4_;
            bVar6 = (bool)((byte)(uVar20 >> 0xb) & 1);
            auVar168._44_4_ = (uint)bVar6 * auVar165._44_4_ | (uint)!bVar6 * auVar161._44_4_;
            bVar6 = (bool)((byte)(uVar20 >> 0xc) & 1);
            auVar168._48_4_ = (uint)bVar6 * auVar165._48_4_ | (uint)!bVar6 * auVar161._48_4_;
            bVar6 = (bool)((byte)(uVar20 >> 0xd) & 1);
            auVar168._52_4_ = (uint)bVar6 * auVar165._52_4_ | (uint)!bVar6 * auVar161._52_4_;
            bVar6 = (bool)((byte)(uVar20 >> 0xe) & 1);
            auVar168._56_4_ = (uint)bVar6 * auVar165._56_4_ | (uint)!bVar6 * auVar161._56_4_;
            bVar6 = SUB81(uVar20 >> 0xf,0);
            auVar168._60_4_ = (uint)bVar6 * auVar165._60_4_ | (uint)!bVar6 * auVar161._60_4_;
            auVar149 = vfmadd231ps_avx512f(auVar149,auVar168,auVar142);
            auVar149 = vfmadd231ps_avx512f(auVar149,auVar168,auVar141);
            auVar190 = vfmadd213ps_avx512f(auVar151,auVar158,auVar190);
            auVar151 = vmulps_avx512f(auVar149,auVar149);
            auVar158 = vfmadd213ps_avx512f(auVar149,(undefined1  [64])::_ps512_cephes_exp_p0,
                                           (undefined1  [64])::_ps512_cephes_exp_p1);
            auVar161 = vfmadd213ps_avx512f(auVar152,auVar147,(undefined1  [64])afVar249);
            auVar165 = vfmadd213ps_avx512f(auVar158,auVar149,
                                           (undefined1  [64])::_ps512_cephes_exp_p2);
            fVar193 = pfVar83[9];
            auVar152._4_4_ = fVar193;
            auVar152._0_4_ = fVar193;
            auVar152._8_4_ = fVar193;
            auVar152._12_4_ = fVar193;
            auVar152._16_4_ = fVar193;
            auVar152._20_4_ = fVar193;
            auVar152._24_4_ = fVar193;
            auVar152._28_4_ = fVar193;
            auVar152._32_4_ = fVar193;
            auVar152._36_4_ = fVar193;
            auVar152._40_4_ = fVar193;
            auVar152._44_4_ = fVar193;
            auVar152._48_4_ = fVar193;
            auVar152._52_4_ = fVar193;
            auVar152._56_4_ = fVar193;
            auVar152._60_4_ = fVar193;
            auVar152 = vsubps_avx512f(pauVar76[9],auVar152);
            auVar147 = vfmadd213ps_avx512f(auVar161,auVar163,auVar147);
            auVar152 = vminps_avx512f(auVar152,(undefined1  [64])afVar245);
            auVar152 = vmaxps_avx512f(auVar152,(undefined1  [64])afVar270);
            auVar161 = vfmadd213ps_avx512f(auVar162,auVar150,
                                           (undefined1  [64])::_ps512_cephes_exp_p3);
            auVar158 = vfmadd213ps_avx512f((undefined1  [64])afVar231,auVar152,
                                           (undefined1  [64])afVar249);
            auVar162 = vrndscaleps_avx512f(auVar158,1);
            uVar20 = vcmpps_avx512f(auVar158,auVar162,1);
            auVar148 = vfmadd213ps_avx512f(auVar148,auVar145,
                                           (undefined1  [64])::_ps512_cephes_exp_p4);
            auVar158 = vsubps_avx512f(auVar162,(undefined1  [64])afVar75);
            bVar6 = (bool)((byte)uVar20 & 1);
            auVar169._0_4_ = (uint)bVar6 * auVar158._0_4_ | (uint)!bVar6 * auVar162._0_4_;
            bVar6 = (bool)((byte)(uVar20 >> 1) & 1);
            auVar169._4_4_ = (uint)bVar6 * auVar158._4_4_ | (uint)!bVar6 * auVar162._4_4_;
            bVar6 = (bool)((byte)(uVar20 >> 2) & 1);
            auVar169._8_4_ = (uint)bVar6 * auVar158._8_4_ | (uint)!bVar6 * auVar162._8_4_;
            bVar6 = (bool)((byte)(uVar20 >> 3) & 1);
            auVar169._12_4_ = (uint)bVar6 * auVar158._12_4_ | (uint)!bVar6 * auVar162._12_4_;
            bVar6 = (bool)((byte)(uVar20 >> 4) & 1);
            auVar169._16_4_ = (uint)bVar6 * auVar158._16_4_ | (uint)!bVar6 * auVar162._16_4_;
            bVar6 = (bool)((byte)(uVar20 >> 5) & 1);
            auVar169._20_4_ = (uint)bVar6 * auVar158._20_4_ | (uint)!bVar6 * auVar162._20_4_;
            bVar6 = (bool)((byte)(uVar20 >> 6) & 1);
            auVar169._24_4_ = (uint)bVar6 * auVar158._24_4_ | (uint)!bVar6 * auVar162._24_4_;
            bVar6 = (bool)((byte)(uVar20 >> 7) & 1);
            auVar169._28_4_ = (uint)bVar6 * auVar158._28_4_ | (uint)!bVar6 * auVar162._28_4_;
            bVar6 = (bool)((byte)(uVar20 >> 8) & 1);
            auVar169._32_4_ = (uint)bVar6 * auVar158._32_4_ | (uint)!bVar6 * auVar162._32_4_;
            bVar6 = (bool)((byte)(uVar20 >> 9) & 1);
            auVar169._36_4_ = (uint)bVar6 * auVar158._36_4_ | (uint)!bVar6 * auVar162._36_4_;
            bVar6 = (bool)((byte)(uVar20 >> 10) & 1);
            auVar169._40_4_ = (uint)bVar6 * auVar158._40_4_ | (uint)!bVar6 * auVar162._40_4_;
            bVar6 = (bool)((byte)(uVar20 >> 0xb) & 1);
            auVar169._44_4_ = (uint)bVar6 * auVar158._44_4_ | (uint)!bVar6 * auVar162._44_4_;
            bVar6 = (bool)((byte)(uVar20 >> 0xc) & 1);
            auVar169._48_4_ = (uint)bVar6 * auVar158._48_4_ | (uint)!bVar6 * auVar162._48_4_;
            bVar6 = (bool)((byte)(uVar20 >> 0xd) & 1);
            auVar169._52_4_ = (uint)bVar6 * auVar158._52_4_ | (uint)!bVar6 * auVar162._52_4_;
            bVar6 = (bool)((byte)(uVar20 >> 0xe) & 1);
            auVar169._56_4_ = (uint)bVar6 * auVar158._56_4_ | (uint)!bVar6 * auVar162._56_4_;
            bVar6 = SUB81(uVar20 >> 0xf,0);
            auVar169._60_4_ = (uint)bVar6 * auVar158._60_4_ | (uint)!bVar6 * auVar162._60_4_;
            auVar152 = vfmadd231ps_avx512f(auVar152,auVar169,auVar142);
            auVar152 = vfmadd231ps_avx512f(auVar152,auVar169,auVar141);
            auVar148 = vfmadd213ps_avx512f(auVar148,auVar145,(undefined1  [64])afVar249);
            auVar162 = vmulps_avx512f(auVar152,auVar152);
            fVar193 = pfVar83[10];
            auVar158._4_4_ = fVar193;
            auVar158._0_4_ = fVar193;
            auVar158._8_4_ = fVar193;
            auVar158._12_4_ = fVar193;
            auVar158._16_4_ = fVar193;
            auVar158._20_4_ = fVar193;
            auVar158._24_4_ = fVar193;
            auVar158._28_4_ = fVar193;
            auVar158._32_4_ = fVar193;
            auVar158._36_4_ = fVar193;
            auVar158._40_4_ = fVar193;
            auVar158._44_4_ = fVar193;
            auVar158._48_4_ = fVar193;
            auVar158._52_4_ = fVar193;
            auVar158._56_4_ = fVar193;
            auVar158._60_4_ = fVar193;
            auVar158 = vsubps_avx512f(pauVar76[10],auVar158);
            auVar145 = vfmadd213ps_avx512f(auVar148,auVar157,auVar145);
            auVar157 = vminps_avx512f(auVar158,(undefined1  [64])afVar245);
            auVar157 = vmaxps_avx512f(auVar157,(undefined1  [64])afVar270);
            auVar148 = vfmadd213ps_avx512f(auVar165,auVar149,
                                           (undefined1  [64])::_ps512_cephes_exp_p3);
            auVar158 = vfmadd213ps_avx512f((undefined1  [64])afVar231,auVar157,
                                           (undefined1  [64])afVar249);
            auVar163 = vrndscaleps_avx512f(auVar158,1);
            uVar20 = vcmpps_avx512f(auVar158,auVar163,1);
            auVar158 = vfmadd213ps_avx512f(auVar161,auVar150,
                                           (undefined1  [64])::_ps512_cephes_exp_p4);
            auVar161 = vfmadd213ps_avx512f(auVar152,(undefined1  [64])::_ps512_cephes_exp_p0,
                                           (undefined1  [64])::_ps512_cephes_exp_p1);
            auVar161 = vfmadd213ps_avx512f(auVar161,auVar152,
                                           (undefined1  [64])::_ps512_cephes_exp_p2);
            auVar158 = vfmadd213ps_avx512f(auVar158,auVar150,(undefined1  [64])afVar249);
            auVar165 = vfmadd213ps_avx512f(auVar161,auVar152,
                                           (undefined1  [64])::_ps512_cephes_exp_p3);
            auVar161 = vsubps_avx512f(auVar163,(undefined1  [64])afVar75);
            bVar6 = (bool)((byte)uVar20 & 1);
            auVar170._0_4_ = (uint)bVar6 * auVar161._0_4_ | (uint)!bVar6 * auVar163._0_4_;
            bVar6 = (bool)((byte)(uVar20 >> 1) & 1);
            auVar170._4_4_ = (uint)bVar6 * auVar161._4_4_ | (uint)!bVar6 * auVar163._4_4_;
            bVar6 = (bool)((byte)(uVar20 >> 2) & 1);
            auVar170._8_4_ = (uint)bVar6 * auVar161._8_4_ | (uint)!bVar6 * auVar163._8_4_;
            bVar6 = (bool)((byte)(uVar20 >> 3) & 1);
            auVar170._12_4_ = (uint)bVar6 * auVar161._12_4_ | (uint)!bVar6 * auVar163._12_4_;
            bVar6 = (bool)((byte)(uVar20 >> 4) & 1);
            auVar170._16_4_ = (uint)bVar6 * auVar161._16_4_ | (uint)!bVar6 * auVar163._16_4_;
            bVar6 = (bool)((byte)(uVar20 >> 5) & 1);
            auVar170._20_4_ = (uint)bVar6 * auVar161._20_4_ | (uint)!bVar6 * auVar163._20_4_;
            bVar6 = (bool)((byte)(uVar20 >> 6) & 1);
            auVar170._24_4_ = (uint)bVar6 * auVar161._24_4_ | (uint)!bVar6 * auVar163._24_4_;
            bVar6 = (bool)((byte)(uVar20 >> 7) & 1);
            auVar170._28_4_ = (uint)bVar6 * auVar161._28_4_ | (uint)!bVar6 * auVar163._28_4_;
            bVar6 = (bool)((byte)(uVar20 >> 8) & 1);
            auVar170._32_4_ = (uint)bVar6 * auVar161._32_4_ | (uint)!bVar6 * auVar163._32_4_;
            bVar6 = (bool)((byte)(uVar20 >> 9) & 1);
            auVar170._36_4_ = (uint)bVar6 * auVar161._36_4_ | (uint)!bVar6 * auVar163._36_4_;
            bVar6 = (bool)((byte)(uVar20 >> 10) & 1);
            auVar170._40_4_ = (uint)bVar6 * auVar161._40_4_ | (uint)!bVar6 * auVar163._40_4_;
            bVar6 = (bool)((byte)(uVar20 >> 0xb) & 1);
            auVar170._44_4_ = (uint)bVar6 * auVar161._44_4_ | (uint)!bVar6 * auVar163._44_4_;
            bVar6 = (bool)((byte)(uVar20 >> 0xc) & 1);
            auVar170._48_4_ = (uint)bVar6 * auVar161._48_4_ | (uint)!bVar6 * auVar163._48_4_;
            bVar6 = (bool)((byte)(uVar20 >> 0xd) & 1);
            auVar170._52_4_ = (uint)bVar6 * auVar161._52_4_ | (uint)!bVar6 * auVar163._52_4_;
            bVar6 = (bool)((byte)(uVar20 >> 0xe) & 1);
            auVar170._56_4_ = (uint)bVar6 * auVar161._56_4_ | (uint)!bVar6 * auVar163._56_4_;
            bVar6 = SUB81(uVar20 >> 0xf,0);
            auVar170._60_4_ = (uint)bVar6 * auVar161._60_4_ | (uint)!bVar6 * auVar163._60_4_;
            auVar157 = vfmadd231ps_avx512f(auVar157,auVar170,auVar142);
            auVar150 = vfmadd213ps_avx512f(auVar158,auVar159,auVar150);
            auVar157 = vfmadd231ps_avx512f(auVar157,auVar170,auVar141);
            auVar158 = vmulps_avx512f(auVar157,auVar157);
            auVar148 = vfmadd213ps_avx512f(auVar148,auVar149,
                                           (undefined1  [64])::_ps512_cephes_exp_p4);
            auVar159 = vfmadd213ps_avx512f(auVar157,(undefined1  [64])::_ps512_cephes_exp_p0,
                                           (undefined1  [64])::_ps512_cephes_exp_p1);
            fVar193 = pfVar83[0xb];
            auVar161._4_4_ = fVar193;
            auVar161._0_4_ = fVar193;
            auVar161._8_4_ = fVar193;
            auVar161._12_4_ = fVar193;
            auVar161._16_4_ = fVar193;
            auVar161._20_4_ = fVar193;
            auVar161._24_4_ = fVar193;
            auVar161._28_4_ = fVar193;
            auVar161._32_4_ = fVar193;
            auVar161._36_4_ = fVar193;
            auVar161._40_4_ = fVar193;
            auVar161._44_4_ = fVar193;
            auVar161._48_4_ = fVar193;
            auVar161._52_4_ = fVar193;
            auVar161._56_4_ = fVar193;
            auVar161._60_4_ = fVar193;
            auVar161 = vsubps_avx512f(pauVar76[0xb],auVar161);
            auVar148 = vfmadd213ps_avx512f(auVar148,auVar149,(undefined1  [64])afVar249);
            auVar159 = vfmadd213ps_avx512f(auVar159,auVar157,
                                           (undefined1  [64])::_ps512_cephes_exp_p2);
            auVar161 = vminps_avx512f(auVar161,(undefined1  [64])afVar245);
            auVar161 = vmaxps_avx512f(auVar161,(undefined1  [64])afVar270);
            auVar148 = vfmadd213ps_avx512f(auVar148,auVar151,auVar149);
            auVar149 = vfmadd213ps_avx512f((undefined1  [64])afVar231,auVar161,
                                           (undefined1  [64])afVar249);
            auVar151 = vrndscaleps_avx512f(auVar149,1);
            auVar159 = vfmadd213ps_avx512f(auVar159,auVar157,
                                           (undefined1  [64])::_ps512_cephes_exp_p3);
            uVar20 = vcmpps_avx512f(auVar149,auVar151,1);
            auVar149 = vsubps_avx512f(auVar151,(undefined1  [64])afVar75);
            bVar6 = (bool)((byte)uVar20 & 1);
            auVar171._0_4_ = (uint)bVar6 * auVar149._0_4_ | (uint)!bVar6 * auVar151._0_4_;
            bVar6 = (bool)((byte)(uVar20 >> 1) & 1);
            auVar171._4_4_ = (uint)bVar6 * auVar149._4_4_ | (uint)!bVar6 * auVar151._4_4_;
            bVar6 = (bool)((byte)(uVar20 >> 2) & 1);
            auVar171._8_4_ = (uint)bVar6 * auVar149._8_4_ | (uint)!bVar6 * auVar151._8_4_;
            bVar6 = (bool)((byte)(uVar20 >> 3) & 1);
            auVar171._12_4_ = (uint)bVar6 * auVar149._12_4_ | (uint)!bVar6 * auVar151._12_4_;
            bVar6 = (bool)((byte)(uVar20 >> 4) & 1);
            auVar171._16_4_ = (uint)bVar6 * auVar149._16_4_ | (uint)!bVar6 * auVar151._16_4_;
            bVar6 = (bool)((byte)(uVar20 >> 5) & 1);
            auVar171._20_4_ = (uint)bVar6 * auVar149._20_4_ | (uint)!bVar6 * auVar151._20_4_;
            bVar6 = (bool)((byte)(uVar20 >> 6) & 1);
            auVar171._24_4_ = (uint)bVar6 * auVar149._24_4_ | (uint)!bVar6 * auVar151._24_4_;
            bVar6 = (bool)((byte)(uVar20 >> 7) & 1);
            auVar171._28_4_ = (uint)bVar6 * auVar149._28_4_ | (uint)!bVar6 * auVar151._28_4_;
            bVar6 = (bool)((byte)(uVar20 >> 8) & 1);
            auVar171._32_4_ = (uint)bVar6 * auVar149._32_4_ | (uint)!bVar6 * auVar151._32_4_;
            bVar6 = (bool)((byte)(uVar20 >> 9) & 1);
            auVar171._36_4_ = (uint)bVar6 * auVar149._36_4_ | (uint)!bVar6 * auVar151._36_4_;
            bVar6 = (bool)((byte)(uVar20 >> 10) & 1);
            auVar171._40_4_ = (uint)bVar6 * auVar149._40_4_ | (uint)!bVar6 * auVar151._40_4_;
            bVar6 = (bool)((byte)(uVar20 >> 0xb) & 1);
            auVar171._44_4_ = (uint)bVar6 * auVar149._44_4_ | (uint)!bVar6 * auVar151._44_4_;
            bVar6 = (bool)((byte)(uVar20 >> 0xc) & 1);
            auVar171._48_4_ = (uint)bVar6 * auVar149._48_4_ | (uint)!bVar6 * auVar151._48_4_;
            bVar6 = (bool)((byte)(uVar20 >> 0xd) & 1);
            auVar171._52_4_ = (uint)bVar6 * auVar149._52_4_ | (uint)!bVar6 * auVar151._52_4_;
            bVar6 = (bool)((byte)(uVar20 >> 0xe) & 1);
            auVar171._56_4_ = (uint)bVar6 * auVar149._56_4_ | (uint)!bVar6 * auVar151._56_4_;
            bVar6 = SUB81(uVar20 >> 0xf,0);
            auVar171._60_4_ = (uint)bVar6 * auVar149._60_4_ | (uint)!bVar6 * auVar151._60_4_;
            auVar149 = vfmadd231ps_avx512f(auVar161,auVar171,auVar142);
            auVar151 = vfmadd213ps_avx512f(auVar165,auVar152,
                                           (undefined1  [64])::_ps512_cephes_exp_p4);
            auVar149 = vfmadd231ps_avx512f(auVar149,auVar171,auVar141);
            fVar193 = pfVar83[0xc];
            auVar165._4_4_ = fVar193;
            auVar165._0_4_ = fVar193;
            auVar165._8_4_ = fVar193;
            auVar165._12_4_ = fVar193;
            auVar165._16_4_ = fVar193;
            auVar165._20_4_ = fVar193;
            auVar165._24_4_ = fVar193;
            auVar165._28_4_ = fVar193;
            auVar165._32_4_ = fVar193;
            auVar165._36_4_ = fVar193;
            auVar165._40_4_ = fVar193;
            auVar165._44_4_ = fVar193;
            auVar165._48_4_ = fVar193;
            auVar165._52_4_ = fVar193;
            auVar165._56_4_ = fVar193;
            auVar165._60_4_ = fVar193;
            auVar161 = vsubps_avx512f(pauVar76[0xc],auVar165);
            auVar151 = vfmadd213ps_avx512f(auVar151,auVar152,(undefined1  [64])afVar249);
            auVar163 = vmulps_avx512f(auVar149,auVar149);
            auVar161 = vminps_avx512f(auVar161,(undefined1  [64])afVar245);
            auVar161 = vmaxps_avx512f(auVar161,(undefined1  [64])afVar270);
            auVar151 = vfmadd213ps_avx512f(auVar151,auVar162,auVar152);
            auVar152 = vfmadd213ps_avx512f((undefined1  [64])afVar231,auVar161,
                                           (undefined1  [64])afVar249);
            auVar162 = vrndscaleps_avx512f(auVar152,1);
            auVar159 = vfmadd213ps_avx512f(auVar159,auVar157,
                                           (undefined1  [64])::_ps512_cephes_exp_p4);
            uVar20 = vcmpps_avx512f(auVar152,auVar162,1);
            auVar152 = vfmadd213ps_avx512f(auVar149,(undefined1  [64])::_ps512_cephes_exp_p0,
                                           (undefined1  [64])::_ps512_cephes_exp_p1);
            auVar159 = vfmadd213ps_avx512f(auVar159,auVar157,(undefined1  [64])afVar249);
            auVar152 = vfmadd213ps_avx512f(auVar152,auVar149,
                                           (undefined1  [64])::_ps512_cephes_exp_p2);
            auVar152 = vfmadd213ps_avx512f(auVar152,auVar149,
                                           (undefined1  [64])::_ps512_cephes_exp_p3);
            auVar165 = vsubps_avx512f(auVar162,(undefined1  [64])afVar75);
            bVar6 = (bool)((byte)uVar20 & 1);
            auVar172._0_4_ = (uint)bVar6 * auVar165._0_4_ | (uint)!bVar6 * auVar162._0_4_;
            bVar6 = (bool)((byte)(uVar20 >> 1) & 1);
            auVar172._4_4_ = (uint)bVar6 * auVar165._4_4_ | (uint)!bVar6 * auVar162._4_4_;
            bVar6 = (bool)((byte)(uVar20 >> 2) & 1);
            auVar172._8_4_ = (uint)bVar6 * auVar165._8_4_ | (uint)!bVar6 * auVar162._8_4_;
            bVar6 = (bool)((byte)(uVar20 >> 3) & 1);
            auVar172._12_4_ = (uint)bVar6 * auVar165._12_4_ | (uint)!bVar6 * auVar162._12_4_;
            bVar6 = (bool)((byte)(uVar20 >> 4) & 1);
            auVar172._16_4_ = (uint)bVar6 * auVar165._16_4_ | (uint)!bVar6 * auVar162._16_4_;
            bVar6 = (bool)((byte)(uVar20 >> 5) & 1);
            auVar172._20_4_ = (uint)bVar6 * auVar165._20_4_ | (uint)!bVar6 * auVar162._20_4_;
            bVar6 = (bool)((byte)(uVar20 >> 6) & 1);
            auVar172._24_4_ = (uint)bVar6 * auVar165._24_4_ | (uint)!bVar6 * auVar162._24_4_;
            bVar6 = (bool)((byte)(uVar20 >> 7) & 1);
            auVar172._28_4_ = (uint)bVar6 * auVar165._28_4_ | (uint)!bVar6 * auVar162._28_4_;
            bVar6 = (bool)((byte)(uVar20 >> 8) & 1);
            auVar172._32_4_ = (uint)bVar6 * auVar165._32_4_ | (uint)!bVar6 * auVar162._32_4_;
            bVar6 = (bool)((byte)(uVar20 >> 9) & 1);
            auVar172._36_4_ = (uint)bVar6 * auVar165._36_4_ | (uint)!bVar6 * auVar162._36_4_;
            bVar6 = (bool)((byte)(uVar20 >> 10) & 1);
            auVar172._40_4_ = (uint)bVar6 * auVar165._40_4_ | (uint)!bVar6 * auVar162._40_4_;
            bVar6 = (bool)((byte)(uVar20 >> 0xb) & 1);
            auVar172._44_4_ = (uint)bVar6 * auVar165._44_4_ | (uint)!bVar6 * auVar162._44_4_;
            bVar6 = (bool)((byte)(uVar20 >> 0xc) & 1);
            auVar172._48_4_ = (uint)bVar6 * auVar165._48_4_ | (uint)!bVar6 * auVar162._48_4_;
            bVar6 = (bool)((byte)(uVar20 >> 0xd) & 1);
            auVar172._52_4_ = (uint)bVar6 * auVar165._52_4_ | (uint)!bVar6 * auVar162._52_4_;
            bVar6 = (bool)((byte)(uVar20 >> 0xe) & 1);
            auVar172._56_4_ = (uint)bVar6 * auVar165._56_4_ | (uint)!bVar6 * auVar162._56_4_;
            bVar6 = SUB81(uVar20 >> 0xf,0);
            auVar172._60_4_ = (uint)bVar6 * auVar165._60_4_ | (uint)!bVar6 * auVar162._60_4_;
            auVar157 = vfmadd213ps_avx512f(auVar159,auVar158,auVar157);
            auVar158 = vfmadd231ps_avx512f(auVar161,auVar172,auVar142);
            auVar158 = vfmadd231ps_avx512f(auVar158,auVar172,auVar141);
            auVar159 = vmulps_avx512f(auVar158,auVar158);
            auVar152 = vfmadd213ps_avx512f(auVar152,auVar149,
                                           (undefined1  [64])::_ps512_cephes_exp_p4);
            auVar161 = vfmadd213ps_avx512f(auVar158,(undefined1  [64])::_ps512_cephes_exp_p0,
                                           (undefined1  [64])::_ps512_cephes_exp_p1);
            auVar161 = vfmadd213ps_avx512f(auVar161,auVar158,
                                           (undefined1  [64])::_ps512_cephes_exp_p2);
            auVar152 = vfmadd213ps_avx512f(auVar152,auVar149,(undefined1  [64])afVar249);
            fVar193 = pfVar83[0xd];
            auVar176._4_4_ = fVar193;
            auVar176._0_4_ = fVar193;
            auVar176._8_4_ = fVar193;
            auVar176._12_4_ = fVar193;
            auVar176._16_4_ = fVar193;
            auVar176._20_4_ = fVar193;
            auVar176._24_4_ = fVar193;
            auVar176._28_4_ = fVar193;
            auVar176._32_4_ = fVar193;
            auVar176._36_4_ = fVar193;
            auVar176._40_4_ = fVar193;
            auVar176._44_4_ = fVar193;
            auVar176._48_4_ = fVar193;
            auVar176._52_4_ = fVar193;
            auVar176._56_4_ = fVar193;
            auVar176._60_4_ = fVar193;
            auVar162 = vsubps_avx512f(pauVar76[0xd],auVar176);
            auVar162 = vminps_avx512f(auVar162,(undefined1  [64])afVar245);
            auVar149 = vfmadd213ps_avx512f(auVar152,auVar163,auVar149);
            auVar152 = vmaxps_avx512f(auVar162,(undefined1  [64])afVar270);
            auVar162 = vfmadd213ps_avx512f((undefined1  [64])afVar231,auVar152,
                                           (undefined1  [64])afVar249);
            auVar161 = vfmadd213ps_avx512f(auVar161,auVar158,
                                           (undefined1  [64])::_ps512_cephes_exp_p3);
            auVar163 = vrndscaleps_avx512f(auVar162,1);
            uVar20 = vcmpps_avx512f(auVar162,auVar163,1);
            auVar162 = vsubps_avx512f(auVar163,(undefined1  [64])afVar75);
            bVar6 = (bool)((byte)uVar20 & 1);
            auVar173._0_4_ = (uint)bVar6 * auVar162._0_4_ | (uint)!bVar6 * auVar163._0_4_;
            bVar6 = (bool)((byte)(uVar20 >> 1) & 1);
            auVar173._4_4_ = (uint)bVar6 * auVar162._4_4_ | (uint)!bVar6 * auVar163._4_4_;
            bVar6 = (bool)((byte)(uVar20 >> 2) & 1);
            auVar173._8_4_ = (uint)bVar6 * auVar162._8_4_ | (uint)!bVar6 * auVar163._8_4_;
            bVar6 = (bool)((byte)(uVar20 >> 3) & 1);
            auVar173._12_4_ = (uint)bVar6 * auVar162._12_4_ | (uint)!bVar6 * auVar163._12_4_;
            bVar6 = (bool)((byte)(uVar20 >> 4) & 1);
            auVar173._16_4_ = (uint)bVar6 * auVar162._16_4_ | (uint)!bVar6 * auVar163._16_4_;
            bVar6 = (bool)((byte)(uVar20 >> 5) & 1);
            auVar173._20_4_ = (uint)bVar6 * auVar162._20_4_ | (uint)!bVar6 * auVar163._20_4_;
            bVar6 = (bool)((byte)(uVar20 >> 6) & 1);
            auVar173._24_4_ = (uint)bVar6 * auVar162._24_4_ | (uint)!bVar6 * auVar163._24_4_;
            bVar6 = (bool)((byte)(uVar20 >> 7) & 1);
            auVar173._28_4_ = (uint)bVar6 * auVar162._28_4_ | (uint)!bVar6 * auVar163._28_4_;
            bVar6 = (bool)((byte)(uVar20 >> 8) & 1);
            auVar173._32_4_ = (uint)bVar6 * auVar162._32_4_ | (uint)!bVar6 * auVar163._32_4_;
            bVar6 = (bool)((byte)(uVar20 >> 9) & 1);
            auVar173._36_4_ = (uint)bVar6 * auVar162._36_4_ | (uint)!bVar6 * auVar163._36_4_;
            bVar6 = (bool)((byte)(uVar20 >> 10) & 1);
            auVar173._40_4_ = (uint)bVar6 * auVar162._40_4_ | (uint)!bVar6 * auVar163._40_4_;
            bVar6 = (bool)((byte)(uVar20 >> 0xb) & 1);
            auVar173._44_4_ = (uint)bVar6 * auVar162._44_4_ | (uint)!bVar6 * auVar163._44_4_;
            bVar6 = (bool)((byte)(uVar20 >> 0xc) & 1);
            auVar173._48_4_ = (uint)bVar6 * auVar162._48_4_ | (uint)!bVar6 * auVar163._48_4_;
            bVar6 = (bool)((byte)(uVar20 >> 0xd) & 1);
            auVar173._52_4_ = (uint)bVar6 * auVar162._52_4_ | (uint)!bVar6 * auVar163._52_4_;
            bVar6 = (bool)((byte)(uVar20 >> 0xe) & 1);
            auVar173._56_4_ = (uint)bVar6 * auVar162._56_4_ | (uint)!bVar6 * auVar163._56_4_;
            bVar6 = SUB81(uVar20 >> 0xf,0);
            auVar173._60_4_ = (uint)bVar6 * auVar162._60_4_ | (uint)!bVar6 * auVar163._60_4_;
            auVar161 = vfmadd213ps_avx512f(auVar161,auVar158,
                                           (undefined1  [64])::_ps512_cephes_exp_p4);
            auVar152 = vfmadd231ps_avx512f(auVar152,auVar173,auVar142);
            fVar193 = pfVar83[0xe];
            auVar177._4_4_ = fVar193;
            auVar177._0_4_ = fVar193;
            auVar177._8_4_ = fVar193;
            auVar177._12_4_ = fVar193;
            auVar177._16_4_ = fVar193;
            auVar177._20_4_ = fVar193;
            auVar177._24_4_ = fVar193;
            auVar177._28_4_ = fVar193;
            auVar177._32_4_ = fVar193;
            auVar177._36_4_ = fVar193;
            auVar177._40_4_ = fVar193;
            auVar177._44_4_ = fVar193;
            auVar177._48_4_ = fVar193;
            auVar177._52_4_ = fVar193;
            auVar177._56_4_ = fVar193;
            auVar177._60_4_ = fVar193;
            auVar162 = vsubps_avx512f(pauVar76[0xe],auVar177);
            auVar161 = vfmadd213ps_avx512f(auVar161,auVar158,(undefined1  [64])afVar249);
            auVar152 = vfmadd231ps_avx512f(auVar152,auVar173,auVar141);
            auVar162 = vminps_avx512f(auVar162,(undefined1  [64])afVar245);
            auVar162 = vmaxps_avx512f(auVar162,(undefined1  [64])afVar270);
            auVar158 = vfmadd213ps_avx512f(auVar161,auVar159,auVar158);
            auVar159 = vfmadd213ps_avx512f((undefined1  [64])afVar231,auVar162,
                                           (undefined1  [64])afVar249);
            auVar161 = vrndscaleps_avx512f(auVar159,1);
            auVar163 = vmulps_avx512f(auVar152,auVar152);
            uVar20 = vcmpps_avx512f(auVar159,auVar161,1);
            auVar159 = vfmadd213ps_avx512f(auVar152,(undefined1  [64])::_ps512_cephes_exp_p0,
                                           (undefined1  [64])::_ps512_cephes_exp_p1);
            auVar159 = vfmadd213ps_avx512f(auVar159,auVar152,
                                           (undefined1  [64])::_ps512_cephes_exp_p2);
            auVar159 = vfmadd213ps_avx512f(auVar159,auVar152,
                                           (undefined1  [64])::_ps512_cephes_exp_p3);
            auVar159 = vfmadd213ps_avx512f(auVar159,auVar152,
                                           (undefined1  [64])::_ps512_cephes_exp_p4);
            auVar159 = vfmadd213ps_avx512f(auVar159,auVar152,(undefined1  [64])afVar249);
            auVar152 = vfmadd213ps_avx512f(auVar159,auVar163,auVar152);
            auVar159 = vsubps_avx512f(auVar161,(undefined1  [64])afVar75);
            bVar6 = (bool)((byte)uVar20 & 1);
            auVar174._0_4_ = (uint)bVar6 * auVar159._0_4_ | (uint)!bVar6 * auVar161._0_4_;
            bVar6 = (bool)((byte)(uVar20 >> 1) & 1);
            auVar174._4_4_ = (uint)bVar6 * auVar159._4_4_ | (uint)!bVar6 * auVar161._4_4_;
            bVar6 = (bool)((byte)(uVar20 >> 2) & 1);
            auVar174._8_4_ = (uint)bVar6 * auVar159._8_4_ | (uint)!bVar6 * auVar161._8_4_;
            bVar6 = (bool)((byte)(uVar20 >> 3) & 1);
            auVar174._12_4_ = (uint)bVar6 * auVar159._12_4_ | (uint)!bVar6 * auVar161._12_4_;
            bVar6 = (bool)((byte)(uVar20 >> 4) & 1);
            auVar174._16_4_ = (uint)bVar6 * auVar159._16_4_ | (uint)!bVar6 * auVar161._16_4_;
            bVar6 = (bool)((byte)(uVar20 >> 5) & 1);
            auVar174._20_4_ = (uint)bVar6 * auVar159._20_4_ | (uint)!bVar6 * auVar161._20_4_;
            bVar6 = (bool)((byte)(uVar20 >> 6) & 1);
            auVar174._24_4_ = (uint)bVar6 * auVar159._24_4_ | (uint)!bVar6 * auVar161._24_4_;
            bVar6 = (bool)((byte)(uVar20 >> 7) & 1);
            auVar174._28_4_ = (uint)bVar6 * auVar159._28_4_ | (uint)!bVar6 * auVar161._28_4_;
            bVar6 = (bool)((byte)(uVar20 >> 8) & 1);
            auVar174._32_4_ = (uint)bVar6 * auVar159._32_4_ | (uint)!bVar6 * auVar161._32_4_;
            bVar6 = (bool)((byte)(uVar20 >> 9) & 1);
            auVar174._36_4_ = (uint)bVar6 * auVar159._36_4_ | (uint)!bVar6 * auVar161._36_4_;
            bVar6 = (bool)((byte)(uVar20 >> 10) & 1);
            auVar174._40_4_ = (uint)bVar6 * auVar159._40_4_ | (uint)!bVar6 * auVar161._40_4_;
            bVar6 = (bool)((byte)(uVar20 >> 0xb) & 1);
            auVar174._44_4_ = (uint)bVar6 * auVar159._44_4_ | (uint)!bVar6 * auVar161._44_4_;
            bVar6 = (bool)((byte)(uVar20 >> 0xc) & 1);
            auVar174._48_4_ = (uint)bVar6 * auVar159._48_4_ | (uint)!bVar6 * auVar161._48_4_;
            bVar6 = (bool)((byte)(uVar20 >> 0xd) & 1);
            auVar174._52_4_ = (uint)bVar6 * auVar159._52_4_ | (uint)!bVar6 * auVar161._52_4_;
            bVar6 = (bool)((byte)(uVar20 >> 0xe) & 1);
            auVar174._56_4_ = (uint)bVar6 * auVar159._56_4_ | (uint)!bVar6 * auVar161._56_4_;
            bVar6 = SUB81(uVar20 >> 0xf,0);
            auVar174._60_4_ = (uint)bVar6 * auVar159._60_4_ | (uint)!bVar6 * auVar161._60_4_;
            auVar159 = vfmadd231ps_avx512f(auVar162,auVar174,auVar142);
            auVar159 = vfmadd231ps_avx512f(auVar159,auVar174,auVar141);
            auVar161 = vmulps_avx512f(auVar159,auVar159);
            auVar162 = vfmadd213ps_avx512f(auVar159,(undefined1  [64])::_ps512_cephes_exp_p0,
                                           (undefined1  [64])::_ps512_cephes_exp_p1);
            auVar162 = vfmadd213ps_avx512f(auVar162,auVar159,
                                           (undefined1  [64])::_ps512_cephes_exp_p2);
            auVar162 = vfmadd213ps_avx512f(auVar162,auVar159,
                                           (undefined1  [64])::_ps512_cephes_exp_p3);
            auVar162 = vfmadd213ps_avx512f(auVar162,auVar159,
                                           (undefined1  [64])::_ps512_cephes_exp_p4);
            auVar162 = vfmadd213ps_avx512f(auVar162,auVar159,(undefined1  [64])afVar249);
            auVar159 = vfmadd213ps_avx512f(auVar162,auVar161,auVar159);
            fVar193 = pfVar83[0xf];
            auVar178._4_4_ = fVar193;
            auVar178._0_4_ = fVar193;
            auVar178._8_4_ = fVar193;
            auVar178._12_4_ = fVar193;
            auVar178._16_4_ = fVar193;
            auVar178._20_4_ = fVar193;
            auVar178._24_4_ = fVar193;
            auVar178._28_4_ = fVar193;
            auVar178._32_4_ = fVar193;
            auVar178._36_4_ = fVar193;
            auVar178._40_4_ = fVar193;
            auVar178._44_4_ = fVar193;
            auVar178._48_4_ = fVar193;
            auVar178._52_4_ = fVar193;
            auVar178._56_4_ = fVar193;
            auVar178._60_4_ = fVar193;
            auVar161 = vsubps_avx512f(pauVar76[0xf],auVar178);
            auVar161 = vminps_avx512f(auVar161,(undefined1  [64])afVar245);
            auVar161 = vmaxps_avx512f(auVar161,(undefined1  [64])afVar270);
            auVar162 = vfmadd213ps_avx512f((undefined1  [64])afVar231,auVar161,
                                           (undefined1  [64])afVar249);
            auVar163 = vrndscaleps_avx512f(auVar162,1);
            uVar20 = vcmpps_avx512f(auVar162,auVar163,1);
            auVar162 = vsubps_avx512f(auVar163,(undefined1  [64])afVar75);
            bVar6 = (bool)((byte)uVar20 & 1);
            auVar175._0_4_ = (uint)bVar6 * auVar162._0_4_ | (uint)!bVar6 * auVar163._0_4_;
            bVar6 = (bool)((byte)(uVar20 >> 1) & 1);
            auVar175._4_4_ = (uint)bVar6 * auVar162._4_4_ | (uint)!bVar6 * auVar163._4_4_;
            bVar6 = (bool)((byte)(uVar20 >> 2) & 1);
            auVar175._8_4_ = (uint)bVar6 * auVar162._8_4_ | (uint)!bVar6 * auVar163._8_4_;
            bVar6 = (bool)((byte)(uVar20 >> 3) & 1);
            auVar175._12_4_ = (uint)bVar6 * auVar162._12_4_ | (uint)!bVar6 * auVar163._12_4_;
            bVar6 = (bool)((byte)(uVar20 >> 4) & 1);
            auVar175._16_4_ = (uint)bVar6 * auVar162._16_4_ | (uint)!bVar6 * auVar163._16_4_;
            bVar6 = (bool)((byte)(uVar20 >> 5) & 1);
            auVar175._20_4_ = (uint)bVar6 * auVar162._20_4_ | (uint)!bVar6 * auVar163._20_4_;
            bVar6 = (bool)((byte)(uVar20 >> 6) & 1);
            auVar175._24_4_ = (uint)bVar6 * auVar162._24_4_ | (uint)!bVar6 * auVar163._24_4_;
            bVar6 = (bool)((byte)(uVar20 >> 7) & 1);
            auVar175._28_4_ = (uint)bVar6 * auVar162._28_4_ | (uint)!bVar6 * auVar163._28_4_;
            bVar6 = (bool)((byte)(uVar20 >> 8) & 1);
            auVar175._32_4_ = (uint)bVar6 * auVar162._32_4_ | (uint)!bVar6 * auVar163._32_4_;
            bVar6 = (bool)((byte)(uVar20 >> 9) & 1);
            auVar175._36_4_ = (uint)bVar6 * auVar162._36_4_ | (uint)!bVar6 * auVar163._36_4_;
            bVar6 = (bool)((byte)(uVar20 >> 10) & 1);
            auVar175._40_4_ = (uint)bVar6 * auVar162._40_4_ | (uint)!bVar6 * auVar163._40_4_;
            bVar6 = (bool)((byte)(uVar20 >> 0xb) & 1);
            auVar175._44_4_ = (uint)bVar6 * auVar162._44_4_ | (uint)!bVar6 * auVar163._44_4_;
            bVar6 = (bool)((byte)(uVar20 >> 0xc) & 1);
            auVar175._48_4_ = (uint)bVar6 * auVar162._48_4_ | (uint)!bVar6 * auVar163._48_4_;
            bVar6 = (bool)((byte)(uVar20 >> 0xd) & 1);
            auVar175._52_4_ = (uint)bVar6 * auVar162._52_4_ | (uint)!bVar6 * auVar163._52_4_;
            bVar6 = (bool)((byte)(uVar20 >> 0xe) & 1);
            auVar175._56_4_ = (uint)bVar6 * auVar162._56_4_ | (uint)!bVar6 * auVar163._56_4_;
            bVar6 = SUB81(uVar20 >> 0xf,0);
            auVar175._60_4_ = (uint)bVar6 * auVar162._60_4_ | (uint)!bVar6 * auVar163._60_4_;
            auVar161 = vfmadd231ps_avx512f(auVar161,auVar175,auVar142);
            auVar161 = vfmadd231ps_avx512f(auVar161,auVar175,auVar141);
            auVar162 = vfmadd213ps_avx512f(auVar161,(undefined1  [64])::_ps512_cephes_exp_p0,
                                           (undefined1  [64])::_ps512_cephes_exp_p1);
            auVar162 = vfmadd213ps_avx512f(auVar162,auVar161,
                                           (undefined1  [64])::_ps512_cephes_exp_p2);
            auVar162 = vfmadd213ps_avx512f(auVar162,auVar161,
                                           (undefined1  [64])::_ps512_cephes_exp_p3);
            auVar162 = vfmadd213ps_avx512f(auVar162,auVar161,
                                           (undefined1  [64])::_ps512_cephes_exp_p4);
            auVar162 = vfmadd213ps_avx512f(auVar162,auVar161,(undefined1  [64])afVar249);
            auVar163 = vmulps_avx512f(auVar161,auVar161);
            auVar161 = vfmadd213ps_avx512f(auVar162,auVar163,auVar161);
            auVar143 = vaddps_avx512f((undefined1  [64])afVar75,auVar143);
            auVar162 = vcvttps2dq_avx512f(auVar183);
            auVar163 = vmovdqa64_avx512f((undefined1  [64])::_pi32_512_0x7f);
            auVar162 = vpaddd_avx512f(auVar162,auVar163);
            auVar162 = vpslld_avx512f(auVar162,0x17);
            auVar144 = vaddps_avx512f((undefined1  [64])afVar75,auVar144);
            auVar165 = vcvttps2dq_avx512f(auVar184);
            auVar165 = vpaddd_avx512f(auVar165,auVar163);
            auVar165 = vpslld_avx512f(auVar165,0x17);
            auVar146 = vaddps_avx512f((undefined1  [64])afVar75,auVar146);
            auVar176 = vcvttps2dq_avx512f(auVar186);
            auVar176 = vpaddd_avx512f(auVar176,auVar163);
            auVar176 = vpslld_avx512f(auVar176,0x17);
            auVar189 = vaddps_avx512f(auVar189,(undefined1  [64])afVar75);
            auVar177 = vcvttps2dq_avx512f(auVar187);
            auVar177 = vpaddd_avx512f(auVar177,auVar163);
            auVar177 = vpslld_avx512f(auVar177,0x17);
            auVar190 = vaddps_avx512f(auVar190,(undefined1  [64])afVar75);
            auVar178 = vcvttps2dq_avx512f(auVar160);
            auVar178 = vpaddd_avx512f(auVar178,auVar163);
            auVar178 = vpslld_avx512f(auVar178,0x17);
            auVar143 = vmulps_avx512f(auVar143,auVar162);
            auVar147 = vaddps_avx512f(auVar147,(undefined1  [64])afVar75);
            auVar162 = vcvttps2dq_avx512f(auVar164);
            auVar162 = vpaddd_avx512f(auVar162,auVar163);
            auVar144 = vmulps_avx512f(auVar144,auVar165);
            auVar162 = vpslld_avx512f(auVar162,0x17);
            auVar145 = vaddps_avx512f(auVar145,(undefined1  [64])afVar75);
            auVar165 = vcvttps2dq_avx512f(auVar166);
            auVar146 = vmulps_avx512f(auVar146,auVar176);
            auVar165 = vpaddd_avx512f(auVar165,auVar163);
            auVar165 = vpslld_avx512f(auVar165,0x17);
            auVar150 = vaddps_avx512f(auVar150,(undefined1  [64])afVar75);
            auVar189 = vmulps_avx512f(auVar189,auVar177);
            auVar176 = vcvttps2dq_avx512f(auVar167);
            auVar176 = vpaddd_avx512f(auVar176,auVar163);
            auVar176 = vpslld_avx512f(auVar176,0x17);
            auVar190 = vmulps_avx512f(auVar190,auVar178);
            auVar148 = vaddps_avx512f(auVar148,(undefined1  [64])afVar75);
            auVar177 = vcvttps2dq_avx512f(auVar168);
            auVar177 = vpaddd_avx512f(auVar177,auVar163);
            auVar147 = vmulps_avx512f(auVar147,auVar162);
            auVar162 = vpslld_avx512f(auVar177,0x17);
            auVar151 = vaddps_avx512f(auVar151,(undefined1  [64])afVar75);
            auVar177 = vcvttps2dq_avx512f(auVar169);
            auVar145 = vmulps_avx512f(auVar145,auVar165);
            auVar165 = vpaddd_avx512f(auVar177,auVar163);
            auVar165 = vpslld_avx512f(auVar165,0x17);
            auVar157 = vaddps_avx512f(auVar157,(undefined1  [64])afVar75);
            auVar150 = vmulps_avx512f(auVar150,auVar176);
            auVar176 = vcvttps2dq_avx512f(auVar170);
            auVar176 = vpaddd_avx512f(auVar176,auVar163);
            auVar176 = vpslld_avx512f(auVar176,0x17);
            auVar148 = vmulps_avx512f(auVar148,auVar162);
            auVar149 = vaddps_avx512f(auVar149,(undefined1  [64])afVar75);
            auVar162 = vcvttps2dq_avx512f(auVar171);
            auVar162 = vpaddd_avx512f(auVar162,auVar163);
            auVar151 = vmulps_avx512f(auVar151,auVar165);
            auVar162 = vpslld_avx512f(auVar162,0x17);
            auVar158 = vaddps_avx512f(auVar158,(undefined1  [64])afVar75);
            auVar165 = vcvttps2dq_avx512f(auVar172);
            auVar157 = vmulps_avx512f(auVar157,auVar176);
            auVar165 = vpaddd_avx512f(auVar165,auVar163);
            auVar165 = vpslld_avx512f(auVar165,0x17);
            auVar152 = vaddps_avx512f(auVar152,(undefined1  [64])afVar75);
            auVar149 = vmulps_avx512f(auVar149,auVar162);
            auVar162 = vcvttps2dq_avx512f(auVar173);
            auVar162 = vpaddd_avx512f(auVar162,auVar163);
            auVar162 = vpslld_avx512f(auVar162,0x17);
            auVar158 = vmulps_avx512f(auVar158,auVar165);
            auVar159 = vaddps_avx512f(auVar159,(undefined1  [64])afVar75);
            auVar165 = vcvttps2dq_avx512f(auVar174);
            auVar165 = vpaddd_avx512f(auVar165,auVar163);
            auVar152 = vmulps_avx512f(auVar152,auVar162);
            auVar162 = vpslld_avx512f(auVar165,0x17);
            auVar161 = vaddps_avx512f(auVar161,(undefined1  [64])afVar75);
            auVar165 = vcvttps2dq_avx512f(auVar175);
            auVar159 = vmulps_avx512f(auVar159,auVar162);
            auVar162 = vpaddd_avx512f(auVar165,auVar163);
            auVar162 = vpslld_avx512f(auVar162,0x17);
            auVar161 = vmulps_avx512f(auVar161,auVar162);
            *pauVar76 = auVar143;
            pauVar76[1] = auVar144;
            pauVar76[2] = auVar146;
            pauVar76[3] = auVar189;
            pauVar76[4] = auVar190;
            pauVar76[5] = auVar147;
            pauVar76[6] = auVar145;
            pauVar76[7] = auVar150;
            pauVar76[8] = auVar148;
            pauVar76[9] = auVar151;
            pauVar76[10] = auVar157;
            pauVar76[0xb] = auVar149;
            pauVar76[0xc] = auVar158;
            pauVar76[0xd] = auVar152;
            pauVar76[0xe] = auVar159;
            pauVar76[0xf] = auVar161;
            afVar270 = ::_ps512_exp_lo;
            auVar162 = vunpcklps_avx512f(auVar143,auVar144);
            auVar143 = vunpckhps_avx512f(auVar143,auVar144);
            auVar144 = vunpcklps_avx512f(auVar146,auVar189);
            auVar146 = vunpckhps_avx512f(auVar146,auVar189);
            auVar143 = vaddps_avx512f(auVar162,auVar143);
            auVar144 = vaddps_avx512f(auVar144,auVar146);
            auVar146 = vunpcklps_avx512f(auVar190,auVar147);
            auVar189 = vunpckhps_avx512f(auVar190,auVar147);
            auVar146 = vaddps_avx512f(auVar146,auVar189);
            auVar189 = vunpcklps_avx512f(auVar145,auVar150);
            auVar145 = vunpckhps_avx512f(auVar145,auVar150);
            auVar190 = vunpcklps_avx512f(auVar148,auVar151);
            auVar145 = vaddps_avx512f(auVar189,auVar145);
            auVar189 = vunpckhps_avx512f(auVar148,auVar151);
            auVar150 = vunpcklps_avx512f(auVar157,auVar149);
            auVar157 = vunpckhps_avx512f(auVar157,auVar149);
            auVar189 = vaddps_avx512f(auVar190,auVar189);
            auVar190 = vaddps_avx512f(auVar150,auVar157);
            auVar157 = vunpcklps_avx512f(auVar158,auVar152);
            auVar150 = vunpckhps_avx512f(auVar158,auVar152);
            auVar157 = vaddps_avx512f(auVar157,auVar150);
            auVar150 = vunpcklps_avx512f(auVar159,auVar161);
            auVar147 = vunpckhps_avx512f(auVar159,auVar161);
            auVar150 = vaddps_avx512f(auVar150,auVar147);
            auVar147 = vunpcklpd_avx512f(auVar143,auVar144);
            auVar143 = vunpckhpd_avx512f(auVar143,auVar144);
            auVar144 = vunpcklpd_avx512f(auVar146,auVar145);
            auVar145 = vunpckhpd_avx512f(auVar146,auVar145);
            auVar143 = vaddps_avx512f(auVar147,auVar143);
            auVar144 = vaddps_avx512f(auVar144,auVar145);
            auVar145 = vunpcklpd_avx512f(auVar189,auVar190);
            auVar146 = vunpckhpd_avx512f(auVar189,auVar190);
            auVar145 = vaddps_avx512f(auVar145,auVar146);
            auVar146 = vunpcklpd_avx512f(auVar157,auVar150);
            auVar189 = vunpckhpd_avx512f(auVar157,auVar150);
            auVar146 = vaddps_avx512f(auVar146,auVar189);
            auVar189 = vinsertf64x4_avx512f(auVar143,auVar144._0_32_,1);
            auVar143 = vshuff64x2_avx512f(auVar143,auVar144,0xee);
            auVar144 = vinsertf64x4_avx512f(auVar145,auVar146._0_32_,1);
            auVar145 = vshuff64x2_avx512f(auVar145,auVar146,0xee);
            auVar143 = vaddps_avx512f(auVar189,auVar143);
            auVar144 = vaddps_avx512f(auVar144,auVar145);
            auVar145 = vshuff64x2_avx512f(auVar143,auVar144,0xdd);
            auVar145 = vaddps_avx512f(auVar145,*pauVar80);
            auVar143 = vshuff64x2_avx512f(auVar143,auVar144,0x88);
            auVar143 = vaddps_avx512f(auVar145,auVar143);
            pauVar76 = pauVar76 + 0x10;
            *pauVar80 = auVar143;
            pfVar83 = pfVar83 + 0x10;
            pauVar80 = pauVar80 + 1;
            iVar79 = iVar79 + 0x10;
            afVar231 = afVar232;
            afVar245 = afVar271;
            afVar249 = afVar272;
          } while (iVar79 < size1);
          auVar143 = vmovdqa64_avx512f((undefined1  [64])::_pi32_512_0x7f);
          afVar231 = ::_ps512_cephes_exp_p0;
          afVar245 = ::_ps512_cephes_exp_p1;
          afVar249 = ::_ps512_cephes_exp_p2;
          afVar252 = ::_ps512_cephes_exp_p3;
          afVar257 = ::_ps512_cephes_exp_p4;
          uVar77 = size1 & 0xfffffff0U;
        }
        if ((int)uVar77 < size1) {
          lVar86 = 0;
          do {
            fVar193 = pfVar83[lVar86];
            auVar60._4_4_ = fVar193;
            auVar60._0_4_ = fVar193;
            auVar60._8_4_ = fVar193;
            auVar60._12_4_ = fVar193;
            auVar60._16_4_ = fVar193;
            auVar60._20_4_ = fVar193;
            auVar60._24_4_ = fVar193;
            auVar60._28_4_ = fVar193;
            auVar60._32_4_ = fVar193;
            auVar60._36_4_ = fVar193;
            auVar60._40_4_ = fVar193;
            auVar60._44_4_ = fVar193;
            auVar60._48_4_ = fVar193;
            auVar60._52_4_ = fVar193;
            auVar60._56_4_ = fVar193;
            auVar60._60_4_ = fVar193;
            auVar144 = vsubps_avx512f(*pauVar76,auVar60);
            auVar144 = vminps_avx512f(auVar144,(undefined1  [64])afVar271);
            auVar144 = vmaxps_avx512f(auVar144,(undefined1  [64])afVar270);
            auVar145 = vfmadd213ps_avx512f((undefined1  [64])afVar232,auVar144,
                                           (undefined1  [64])afVar272);
            auVar146 = vrndscaleps_avx512f(auVar145,1);
            uVar20 = vcmpps_avx512f(auVar145,auVar146,1);
            auVar145 = vsubps_avx512f(auVar146,(undefined1  [64])afVar75);
            bVar6 = (bool)((byte)uVar20 & 1);
            auVar179._0_4_ = (uint)bVar6 * auVar145._0_4_ | (uint)!bVar6 * auVar146._0_4_;
            bVar6 = (bool)((byte)(uVar20 >> 1) & 1);
            auVar179._4_4_ = (uint)bVar6 * auVar145._4_4_ | (uint)!bVar6 * auVar146._4_4_;
            bVar6 = (bool)((byte)(uVar20 >> 2) & 1);
            auVar179._8_4_ = (uint)bVar6 * auVar145._8_4_ | (uint)!bVar6 * auVar146._8_4_;
            bVar6 = (bool)((byte)(uVar20 >> 3) & 1);
            auVar179._12_4_ = (uint)bVar6 * auVar145._12_4_ | (uint)!bVar6 * auVar146._12_4_;
            bVar6 = (bool)((byte)(uVar20 >> 4) & 1);
            auVar179._16_4_ = (uint)bVar6 * auVar145._16_4_ | (uint)!bVar6 * auVar146._16_4_;
            bVar6 = (bool)((byte)(uVar20 >> 5) & 1);
            auVar179._20_4_ = (uint)bVar6 * auVar145._20_4_ | (uint)!bVar6 * auVar146._20_4_;
            bVar6 = (bool)((byte)(uVar20 >> 6) & 1);
            auVar179._24_4_ = (uint)bVar6 * auVar145._24_4_ | (uint)!bVar6 * auVar146._24_4_;
            bVar6 = (bool)((byte)(uVar20 >> 7) & 1);
            auVar179._28_4_ = (uint)bVar6 * auVar145._28_4_ | (uint)!bVar6 * auVar146._28_4_;
            bVar6 = (bool)((byte)(uVar20 >> 8) & 1);
            auVar179._32_4_ = (uint)bVar6 * auVar145._32_4_ | (uint)!bVar6 * auVar146._32_4_;
            bVar6 = (bool)((byte)(uVar20 >> 9) & 1);
            auVar179._36_4_ = (uint)bVar6 * auVar145._36_4_ | (uint)!bVar6 * auVar146._36_4_;
            bVar6 = (bool)((byte)(uVar20 >> 10) & 1);
            auVar179._40_4_ = (uint)bVar6 * auVar145._40_4_ | (uint)!bVar6 * auVar146._40_4_;
            bVar6 = (bool)((byte)(uVar20 >> 0xb) & 1);
            auVar179._44_4_ = (uint)bVar6 * auVar145._44_4_ | (uint)!bVar6 * auVar146._44_4_;
            bVar6 = (bool)((byte)(uVar20 >> 0xc) & 1);
            auVar179._48_4_ = (uint)bVar6 * auVar145._48_4_ | (uint)!bVar6 * auVar146._48_4_;
            bVar6 = (bool)((byte)(uVar20 >> 0xd) & 1);
            auVar179._52_4_ = (uint)bVar6 * auVar145._52_4_ | (uint)!bVar6 * auVar146._52_4_;
            bVar6 = (bool)((byte)(uVar20 >> 0xe) & 1);
            auVar179._56_4_ = (uint)bVar6 * auVar145._56_4_ | (uint)!bVar6 * auVar146._56_4_;
            bVar6 = SUB81(uVar20 >> 0xf,0);
            auVar179._60_4_ = (uint)bVar6 * auVar145._60_4_ | (uint)!bVar6 * auVar146._60_4_;
            auVar144 = vfmadd231ps_avx512f(auVar144,auVar179,auVar142);
            auVar144 = vfmadd231ps_avx512f(auVar144,auVar179,auVar141);
            auVar145 = vmulps_avx512f(auVar144,auVar144);
            auVar146 = vfmadd213ps_avx512f(auVar144,(undefined1  [64])afVar231,
                                           (undefined1  [64])afVar245);
            auVar146 = vfmadd213ps_avx512f(auVar146,auVar144,(undefined1  [64])afVar249);
            auVar146 = vfmadd213ps_avx512f(auVar146,auVar144,(undefined1  [64])afVar252);
            auVar146 = vfmadd213ps_avx512f(auVar146,auVar144,(undefined1  [64])afVar257);
            auVar146 = vfmadd213ps_avx512f(auVar146,auVar144,(undefined1  [64])afVar272);
            auVar144 = vfmadd213ps_avx512f(auVar146,auVar145,auVar144);
            auVar144 = vaddps_avx512f(auVar144,(undefined1  [64])afVar75);
            auVar145 = vcvttps2dq_avx512f(auVar179);
            auVar145 = vpaddd_avx512f(auVar145,auVar143);
            auVar145 = vpslld_avx512f(auVar145,0x17);
            auVar144 = vmulps_avx512f(auVar144,auVar145);
            *pauVar76 = auVar144;
            auVar104 = vextractf64x4_avx512f(auVar144,1);
            fVar193 = auVar144._4_4_ + auVar104._4_4_;
            auVar92._0_4_ = auVar144._0_4_ + auVar104._0_4_ + auVar144._16_4_ + auVar104._16_4_;
            auVar92._4_4_ = fVar193 + fVar193;
            auVar92._8_4_ = auVar144._8_4_ + auVar104._8_4_ + auVar144._24_4_ + auVar104._24_4_;
            auVar92._12_4_ = auVar144._12_4_ + auVar104._12_4_ + auVar144._28_4_ + auVar104._28_4_;
            auVar88 = vshufpd_avx(auVar92,auVar92,1);
            auVar93._0_4_ = auVar88._0_4_ + auVar92._0_4_;
            auVar93._4_4_ = auVar88._4_4_ + auVar92._4_4_;
            auVar93._8_4_ = auVar88._8_4_ + auVar92._8_4_;
            auVar93._12_4_ = auVar88._12_4_ + auVar92._12_4_;
            auVar88 = vmovshdup_avx(auVar93);
            *(float *)(*pauVar80 + lVar86 * 4) =
                 auVar88._0_4_ + *(float *)(*pauVar80 + lVar86 * 4) + auVar93._0_4_;
            pauVar76 = pauVar76 + 1;
            lVar86 = lVar86 + 1;
          } while (size1 - uVar77 != (int)lVar86);
        }
        uVar82 = uVar82 + 1;
      } while (uVar82 != uVar78);
    }
    uVar77 = 0;
    pauVar76 = (undefined1 (*) [64])_sumptr;
    if (0xf < size1) {
      iVar79 = 0xf;
      auVar141 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
      do {
        auVar142 = vdivps_avx512f(auVar141,*pauVar76);
        *pauVar76 = auVar142;
        pauVar76 = pauVar76 + 1;
        iVar79 = iVar79 + 0x10;
      } while (iVar79 < size1);
      uVar77 = size1 & 0x7ffffff0;
    }
    if ((int)(uVar77 | 7) < size1) {
      auVar199._8_4_ = 0x3f800000;
      auVar199._0_8_ = 0x3f8000003f800000;
      auVar199._12_4_ = 0x3f800000;
      auVar199._16_4_ = 0x3f800000;
      auVar199._20_4_ = 0x3f800000;
      auVar199._24_4_ = 0x3f800000;
      auVar199._28_4_ = 0x3f800000;
      uVar81 = uVar77;
      do {
        auVar104 = vdivps_avx(auVar199,*(undefined1 (*) [32])*pauVar76);
        *(undefined1 (*) [32])*pauVar76 = auVar104;
        pauVar76 = (undefined1 (*) [64])(*pauVar76 + 0x20);
        uVar77 = uVar81 + 8;
        iVar79 = uVar81 + 0xf;
        uVar81 = uVar77;
      } while (iVar79 < size1);
    }
    if ((int)(uVar77 | 3) < size1) {
      auVar95._8_4_ = 0x3f800000;
      auVar95._0_8_ = 0x3f8000003f800000;
      auVar95._12_4_ = 0x3f800000;
      uVar81 = uVar77;
      do {
        auVar88 = vdivps_avx(auVar95,*(undefined1 (*) [16])*pauVar76);
        *(undefined1 (*) [16])*pauVar76 = auVar88;
        pauVar76 = (undefined1 (*) [64])(*pauVar76 + 0x10);
        uVar77 = uVar81 + 4;
        iVar79 = uVar81 + 7;
        uVar81 = uVar77;
      } while (iVar79 < size1);
    }
    if ((int)uVar77 < size1) {
      auVar141 = vpbroadcastq_avx512f();
      uVar82 = 0;
      auVar142 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar143 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      auVar144 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
      do {
        auVar145 = vpbroadcastq_avx512f();
        auVar146 = vporq_avx512f(auVar145,auVar142);
        auVar145 = vporq_avx512f(auVar145,auVar143);
        uVar21 = vpcmpuq_avx512f(auVar145,auVar141,2);
        bVar61 = (byte)uVar21;
        uVar21 = vpcmpuq_avx512f(auVar146,auVar141,2);
        bVar64 = (byte)uVar21;
        uVar87 = CONCAT11(bVar64,bVar61);
        piVar2 = (int *)(*pauVar76 + uVar82 * 4);
        auVar191._4_4_ = (uint)((byte)(uVar87 >> 1) & 1) * piVar2[1];
        auVar191._0_4_ = (uint)(bVar61 & 1) * *piVar2;
        auVar191._8_4_ = (uint)((byte)(uVar87 >> 2) & 1) * piVar2[2];
        auVar191._12_4_ = (uint)((byte)(uVar87 >> 3) & 1) * piVar2[3];
        auVar191._16_4_ = (uint)((byte)(uVar87 >> 4) & 1) * piVar2[4];
        auVar191._20_4_ = (uint)((byte)(uVar87 >> 5) & 1) * piVar2[5];
        auVar191._24_4_ = (uint)((byte)(uVar87 >> 6) & 1) * piVar2[6];
        auVar191._28_4_ = (uint)((byte)(uVar87 >> 7) & 1) * piVar2[7];
        auVar191._32_4_ = (uint)(bVar64 & 1) * piVar2[8];
        auVar191._36_4_ = (uint)(bVar64 >> 1 & 1) * piVar2[9];
        auVar191._40_4_ = (uint)(bVar64 >> 2 & 1) * piVar2[10];
        auVar191._44_4_ = (uint)(bVar64 >> 3 & 1) * piVar2[0xb];
        auVar191._48_4_ = (uint)(bVar64 >> 4 & 1) * piVar2[0xc];
        auVar191._52_4_ = (uint)(bVar64 >> 5 & 1) * piVar2[0xd];
        auVar191._56_4_ = (uint)(bVar64 >> 6 & 1) * piVar2[0xe];
        auVar191._60_4_ = (uint)(bVar64 >> 7) * piVar2[0xf];
        auVar145 = vdivps_avx512f(auVar144,auVar191);
        puVar1 = (uint *)(*pauVar76 + uVar82 * 4);
        bVar6 = (bool)((byte)(uVar87 >> 1) & 1);
        bVar7 = (bool)((byte)(uVar87 >> 2) & 1);
        bVar8 = (bool)((byte)(uVar87 >> 3) & 1);
        bVar9 = (bool)((byte)(uVar87 >> 4) & 1);
        bVar10 = (bool)((byte)(uVar87 >> 5) & 1);
        bVar11 = (bool)((byte)(uVar87 >> 6) & 1);
        bVar12 = (bool)((byte)(uVar87 >> 7) & 1);
        bVar13 = (bool)(bVar64 >> 1 & 1);
        bVar14 = (bool)(bVar64 >> 2 & 1);
        bVar15 = (bool)(bVar64 >> 3 & 1);
        bVar16 = (bool)(bVar64 >> 4 & 1);
        bVar17 = (bool)(bVar64 >> 5 & 1);
        bVar18 = (bool)(bVar64 >> 6 & 1);
        *puVar1 = (uint)(bVar61 & 1) * auVar145._0_4_ | (uint)!(bool)(bVar61 & 1) * *puVar1;
        puVar1[1] = (uint)bVar6 * auVar145._4_4_ | (uint)!bVar6 * puVar1[1];
        puVar1[2] = (uint)bVar7 * auVar145._8_4_ | (uint)!bVar7 * puVar1[2];
        puVar1[3] = (uint)bVar8 * auVar145._12_4_ | (uint)!bVar8 * puVar1[3];
        puVar1[4] = (uint)bVar9 * auVar145._16_4_ | (uint)!bVar9 * puVar1[4];
        puVar1[5] = (uint)bVar10 * auVar145._20_4_ | (uint)!bVar10 * puVar1[5];
        puVar1[6] = (uint)bVar11 * auVar145._24_4_ | (uint)!bVar11 * puVar1[6];
        puVar1[7] = (uint)bVar12 * auVar145._28_4_ | (uint)!bVar12 * puVar1[7];
        puVar1[8] = (uint)(bVar64 & 1) * auVar145._32_4_ | (uint)!(bool)(bVar64 & 1) * puVar1[8];
        puVar1[9] = (uint)bVar13 * auVar145._36_4_ | (uint)!bVar13 * puVar1[9];
        puVar1[10] = (uint)bVar14 * auVar145._40_4_ | (uint)!bVar14 * puVar1[10];
        puVar1[0xb] = (uint)bVar15 * auVar145._44_4_ | (uint)!bVar15 * puVar1[0xb];
        puVar1[0xc] = (uint)bVar16 * auVar145._48_4_ | (uint)!bVar16 * puVar1[0xc];
        puVar1[0xd] = (uint)bVar17 * auVar145._52_4_ | (uint)!bVar17 * puVar1[0xd];
        puVar1[0xe] = (uint)bVar18 * auVar145._56_4_ | (uint)!bVar18 * puVar1[0xe];
        puVar1[0xf] = (uint)(bVar64 >> 7) * auVar145._60_4_ |
                      (uint)!(bool)(bVar64 >> 7) * puVar1[0xf];
        uVar82 = uVar82 + 0x10;
      } while (((ulong)(~uVar77 + size1) + 0x10 & 0xfffffffffffffff0) != uVar82);
    }
    if (0 < elemcount) {
      uVar82 = 0;
      do {
        pauVar76 = (undefined1 (*) [64])(_ptr + uVar82 * lVar84);
        pfVar83 = _sumptr;
        if (size1 < 4) {
          uVar77 = 0;
        }
        else {
          iVar79 = 3;
          do {
            auVar141 = vbroadcastss_avx512f(ZEXT416((uint)*pfVar83));
            auVar141 = vmulps_avx512f(auVar141,*pauVar76);
            auVar142 = vbroadcastss_avx512f(ZEXT416((uint)pfVar83[1]));
            auVar142 = vmulps_avx512f(auVar142,pauVar76[1]);
            auVar143 = vbroadcastss_avx512f(ZEXT416((uint)pfVar83[2]));
            auVar143 = vmulps_avx512f(auVar143,pauVar76[2]);
            auVar144 = vbroadcastss_avx512f(ZEXT416((uint)pfVar83[3]));
            auVar144 = vmulps_avx512f(auVar144,pauVar76[3]);
            *pauVar76 = auVar141;
            pauVar76[1] = auVar142;
            pauVar76[2] = auVar143;
            pauVar76[3] = auVar144;
            pauVar76 = pauVar76 + 4;
            pfVar83 = pfVar83 + 4;
            iVar79 = iVar79 + 4;
            uVar77 = size1 & 0xfffffffc;
          } while (iVar79 < size1);
        }
        if ((int)uVar77 < size1) {
          lVar86 = 0;
          do {
            auVar141 = vbroadcastss_avx512f(ZEXT416((uint)pfVar83[lVar86]));
            auVar141 = vmulps_avx512f(auVar141,*pauVar76);
            *pauVar76 = auVar141;
            pauVar76 = pauVar76 + 1;
            lVar86 = lVar86 + 1;
          } while (size1 - uVar77 != (int)lVar86);
        }
        uVar82 = uVar82 + 1;
      } while (uVar82 != uVar78);
    }
  }
  return;
}

Assistant:

static void softmax(float* _ptr, int elemcount, int elempack, int stride, int size1, float* _maxptr, float* _sumptr)
{
    // reduce max
    {
        float* maxptr = _maxptr;

        int j = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        __m512 _negmax_avx512 = _mm512_set1_ps(-FLT_MAX);
        for (; j + 15 < size1; j += 16)
        {
            _mm512_storeu_ps(maxptr, _negmax_avx512);
            maxptr += 16;
        }
#endif // __AVX512F__
        __m256 _negmax_avx = _mm256_set1_ps(-FLT_MAX);
        for (; j + 7 < size1; j += 8)
        {
            _mm256_storeu_ps(maxptr, _negmax_avx);
            maxptr += 8;
        }
#endif // __AVX__
        __m128 _negmax = _mm_set1_ps(-FLT_MAX);
        for (; j + 3 < size1; j += 4)
        {
            _mm_storeu_ps(maxptr, _negmax);
            maxptr += 4;
        }
#endif // __SSE2__
        for (; j < size1; j++)
        {
            *maxptr++ = -FLT_MAX;
        }
    }

    // reduce exp(x - max)
    {
        float* sumptr = _sumptr;

        int j = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        __m512 _zero_avx512 = _mm512_set1_ps(0.f);
        for (; j + 15 < size1; j += 16)
        {
            _mm512_storeu_ps(sumptr, _zero_avx512);
            sumptr += 16;
        }
#endif // __AVX512F__
        __m256 _zero_avx = _mm256_set1_ps(0.f);
        for (; j + 7 < size1; j += 8)
        {
            _mm256_storeu_ps(sumptr, _zero_avx);
            sumptr += 8;
        }
#endif // __AVX__
        __m128 _zero = _mm_set1_ps(0.f);
        for (; j + 3 < size1; j += 4)
        {
            _mm_storeu_ps(sumptr, _zero);
            sumptr += 4;
        }
#endif // __SSE2__
        for (; j < size1; j++)
        {
            *sumptr++ = 0.f;
        }
    }

#if __SSE2__
#if __AVX__
#if __AVX512F__
    if (elempack == 16)
    {
        softmax_pack16(_ptr, elemcount, stride, size1, _maxptr, _sumptr);
    }
#endif // __AVX512F__
    if (elempack == 8)
    {
        softmax_pack8(_ptr, elemcount, stride, size1, _maxptr, _sumptr);
    }
#endif // __AVX__
    if (elempack == 4)
    {
        softmax_pack4(_ptr, elemcount, stride, size1, _maxptr, _sumptr);
    }
#endif // __SSE2__
    if (elempack == 1)
    {
        softmax_pack1(_ptr, elemcount, stride, size1, _maxptr, _sumptr);
    }
}